

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_sse2.c
# Opt level: O0

void aom_lpf_horizontal_8_quad_sse2(uchar *s,int p,uchar *_blimit0,uchar *_limit0,uchar *_thresh0)

{
  ushort uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined6 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined6 uVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  undefined6 uVar10;
  undefined8 uVar11;
  undefined4 uVar12;
  undefined6 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined8 uVar71;
  longlong lVar72;
  longlong lVar73;
  undefined8 uVar74;
  undefined8 uVar75;
  undefined8 uVar76;
  undefined8 uVar77;
  undefined8 uVar78;
  longlong lVar79;
  longlong lVar80;
  longlong lVar81;
  longlong lVar82;
  undefined8 uVar83;
  undefined8 uVar84;
  undefined8 uVar85;
  undefined8 uVar86;
  undefined8 uVar87;
  undefined8 uVar88;
  undefined8 uVar89;
  longlong lVar90;
  ulong uVar91;
  ulong uVar92;
  ulong uVar93;
  ulong uVar94;
  longlong lVar95;
  undefined8 uVar96;
  undefined8 *puVar97;
  ulong *puVar98;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  ulong in_RSI;
  ulong *in_RDI;
  undefined8 *in_R8;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  ulong extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_11;
  undefined8 extraout_XMM0_Qa_12;
  undefined8 extraout_XMM0_Qa_13;
  ulong extraout_XMM0_Qa_14;
  undefined8 extraout_XMM0_Qa_15;
  undefined8 extraout_XMM0_Qa_16;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  ulong extraout_XMM0_Qb_02;
  ulong uVar103;
  undefined1 auVar101 [16];
  ulong uVar100;
  undefined8 extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  undefined8 extraout_XMM0_Qa_05;
  undefined8 extraout_XMM0_Qa_06;
  undefined8 extraout_XMM0_Qa_07;
  undefined8 extraout_XMM0_Qa_08;
  undefined8 extraout_XMM0_Qa_09;
  undefined8 extraout_XMM0_Qa_10;
  ulong uVar104;
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  undefined8 extraout_XMM0_Qb_05;
  undefined8 extraout_XMM0_Qb_06;
  undefined8 extraout_XMM0_Qb_07;
  undefined8 extraout_XMM0_Qb_08;
  undefined8 extraout_XMM0_Qb_09;
  undefined8 extraout_XMM0_Qb_10;
  undefined1 auVar102 [16];
  undefined8 extraout_XMM0_Qb_11;
  undefined8 extraout_XMM0_Qb_12;
  undefined8 extraout_XMM0_Qb_13;
  ulong extraout_XMM0_Qb_14;
  undefined8 extraout_XMM0_Qb_15;
  undefined8 extraout_XMM0_Qb_16;
  __m128i b;
  __m128i b_00;
  __m128i b_01;
  __m128i b_02;
  __m128i b_03;
  __m128i b_04;
  __m128i b_05;
  __m128i b_06;
  __m128i b_07;
  __m128i b_08;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i a_06;
  __m128i a_07;
  __m128i a_08;
  __m128i a_09;
  __m128i a_10;
  __m128i alVar105;
  __m128i alVar106;
  __m128i f8_hi;
  __m128i f8_lo;
  __m128i q3_hi;
  __m128i q2_hi;
  __m128i q1_hi;
  __m128i q0_hi;
  __m128i p0_hi;
  __m128i p1_hi;
  __m128i p2_hi;
  __m128i p3_hi;
  __m128i q3_lo;
  __m128i q2_lo;
  __m128i q1_lo;
  __m128i q0_lo;
  __m128i p0_lo;
  __m128i p1_lo;
  __m128i p2_lo;
  __m128i p3_lo;
  __m128i four;
  __m128i filter2;
  __m128i filter1;
  __m128i work_a;
  __m128i filt;
  __m128i ff_1;
  __m128i t7f;
  __m128i t1;
  __m128i t1f;
  __m128i te0;
  __m128i t80;
  __m128i t3;
  __m128i t4;
  __m128i work_1;
  __m128i work;
  __m128i abs_p1q1;
  __m128i abs_p0q0;
  __m128i ff;
  __m128i fe;
  __m128i abs_q1q0;
  __m128i abs_p1p0;
  __m128i max_abs_p1p0q1q0;
  __m128i oq2;
  __m128i oq1;
  __m128i oq0;
  __m128i op0;
  __m128i op1;
  __m128i op2;
  __m128i q3;
  __m128i q2;
  __m128i q1;
  __m128i q0;
  __m128i p0;
  __m128i p1;
  __m128i p2;
  __m128i p3;
  __m128i flat;
  __m128i hev;
  __m128i mask;
  __m128i thresh_v;
  __m128i limit_v;
  __m128i blimit_v;
  __m128i one;
  __m128i zero;
  undefined8 local_13a8;
  undefined8 uStack_13a0;
  undefined8 local_1398;
  undefined8 uStack_1390;
  undefined1 local_1388;
  char cStack_1387;
  undefined1 uStack_1386;
  char cStack_1385;
  undefined1 uStack_1384;
  char cStack_1383;
  undefined1 uStack_1382;
  char cStack_1381;
  undefined1 uStack_1380;
  char cStack_137f;
  undefined1 uStack_137e;
  char cStack_137d;
  undefined1 uStack_137c;
  char cStack_137b;
  undefined1 uStack_137a;
  char cStack_1379;
  undefined1 local_1378;
  char cStack_1377;
  undefined1 uStack_1376;
  char cStack_1375;
  undefined1 uStack_1374;
  char cStack_1373;
  undefined1 uStack_1372;
  char cStack_1371;
  undefined1 uStack_1370;
  char cStack_136f;
  undefined1 uStack_136e;
  char cStack_136d;
  undefined1 uStack_136c;
  char cStack_136b;
  undefined1 uStack_136a;
  char cStack_1369;
  undefined1 local_1368;
  char cStack_1367;
  undefined1 uStack_1366;
  char cStack_1365;
  undefined1 uStack_1364;
  char cStack_1363;
  undefined1 uStack_1362;
  char cStack_1361;
  undefined1 uStack_1360;
  char cStack_135f;
  undefined1 uStack_135e;
  char cStack_135d;
  undefined1 uStack_135c;
  char cStack_135b;
  undefined1 uStack_135a;
  char cStack_1359;
  undefined1 local_1358;
  char cStack_1357;
  undefined1 uStack_1356;
  char cStack_1355;
  undefined1 uStack_1354;
  char cStack_1353;
  undefined1 uStack_1352;
  char cStack_1351;
  undefined1 uStack_1350;
  char cStack_134f;
  undefined1 uStack_134e;
  char cStack_134d;
  undefined1 uStack_134c;
  char cStack_134b;
  undefined1 uStack_134a;
  char cStack_1349;
  undefined1 local_1348;
  char cStack_1347;
  undefined1 uStack_1346;
  char cStack_1345;
  undefined1 uStack_1344;
  char cStack_1343;
  undefined1 uStack_1342;
  char cStack_1341;
  undefined1 uStack_1340;
  char cStack_133f;
  undefined1 uStack_133e;
  char cStack_133d;
  undefined1 uStack_133c;
  char cStack_133b;
  undefined1 uStack_133a;
  char cStack_1339;
  undefined1 local_1338;
  char cStack_1337;
  undefined1 uStack_1336;
  char cStack_1335;
  undefined1 uStack_1334;
  char cStack_1333;
  undefined1 uStack_1332;
  char cStack_1331;
  undefined1 uStack_1330;
  char cStack_132f;
  undefined1 uStack_132e;
  char cStack_132d;
  undefined1 uStack_132c;
  char cStack_132b;
  undefined1 uStack_132a;
  char cStack_1329;
  undefined1 local_1328;
  char cStack_1327;
  undefined1 uStack_1326;
  char cStack_1325;
  undefined1 uStack_1324;
  char cStack_1323;
  undefined1 uStack_1322;
  char cStack_1321;
  undefined1 uStack_1320;
  char cStack_131f;
  undefined1 uStack_131e;
  char cStack_131d;
  undefined1 uStack_131c;
  char cStack_131b;
  undefined1 uStack_131a;
  char cStack_1319;
  undefined1 local_1318;
  char cStack_1317;
  undefined1 uStack_1316;
  char cStack_1315;
  undefined1 uStack_1314;
  char cStack_1313;
  undefined1 uStack_1312;
  char cStack_1311;
  undefined1 uStack_1310;
  char cStack_130f;
  undefined1 uStack_130e;
  char cStack_130d;
  undefined1 uStack_130c;
  char cStack_130b;
  undefined1 uStack_130a;
  char cStack_1309;
  undefined1 local_1308;
  char cStack_1307;
  undefined1 uStack_1306;
  char cStack_1305;
  undefined1 uStack_1304;
  char cStack_1303;
  undefined1 uStack_1302;
  char cStack_1301;
  undefined1 uStack_1300;
  char cStack_12ff;
  undefined1 uStack_12fe;
  char cStack_12fd;
  undefined1 uStack_12fc;
  char cStack_12fb;
  undefined1 uStack_12fa;
  char cStack_12f9;
  undefined1 local_12f8;
  char cStack_12f7;
  undefined1 uStack_12f6;
  char cStack_12f5;
  undefined1 uStack_12f4;
  char cStack_12f3;
  undefined1 uStack_12f2;
  char cStack_12f1;
  undefined1 uStack_12f0;
  char cStack_12ef;
  undefined1 uStack_12ee;
  char cStack_12ed;
  undefined1 uStack_12ec;
  char cStack_12eb;
  undefined1 uStack_12ea;
  char cStack_12e9;
  undefined1 local_12e8;
  char cStack_12e7;
  undefined1 uStack_12e6;
  char cStack_12e5;
  undefined1 uStack_12e4;
  char cStack_12e3;
  undefined1 uStack_12e2;
  char cStack_12e1;
  undefined1 uStack_12e0;
  char cStack_12df;
  undefined1 uStack_12de;
  char cStack_12dd;
  undefined1 uStack_12dc;
  char cStack_12db;
  undefined1 uStack_12da;
  char cStack_12d9;
  undefined1 local_12d8;
  char cStack_12d7;
  undefined1 uStack_12d6;
  char cStack_12d5;
  undefined1 uStack_12d4;
  char cStack_12d3;
  undefined1 uStack_12d2;
  char cStack_12d1;
  undefined1 uStack_12d0;
  char cStack_12cf;
  undefined1 uStack_12ce;
  char cStack_12cd;
  undefined1 uStack_12cc;
  char cStack_12cb;
  undefined1 uStack_12ca;
  char cStack_12c9;
  undefined1 local_12c8;
  char cStack_12c7;
  undefined1 uStack_12c6;
  char cStack_12c5;
  undefined1 uStack_12c4;
  char cStack_12c3;
  undefined1 uStack_12c2;
  char cStack_12c1;
  undefined1 uStack_12c0;
  char cStack_12bf;
  undefined1 uStack_12be;
  char cStack_12bd;
  undefined1 uStack_12bc;
  char cStack_12bb;
  undefined1 uStack_12ba;
  char cStack_12b9;
  undefined1 local_12b8;
  char cStack_12b7;
  undefined1 uStack_12b6;
  char cStack_12b5;
  undefined1 uStack_12b4;
  char cStack_12b3;
  undefined1 uStack_12b2;
  char cStack_12b1;
  undefined1 uStack_12b0;
  char cStack_12af;
  undefined1 uStack_12ae;
  char cStack_12ad;
  undefined1 uStack_12ac;
  char cStack_12ab;
  undefined1 uStack_12aa;
  char cStack_12a9;
  undefined1 local_12a8;
  char cStack_12a7;
  undefined1 uStack_12a6;
  char cStack_12a5;
  undefined1 uStack_12a4;
  char cStack_12a3;
  undefined1 uStack_12a2;
  char cStack_12a1;
  undefined1 uStack_12a0;
  char cStack_129f;
  undefined1 uStack_129e;
  char cStack_129d;
  undefined1 uStack_129c;
  char cStack_129b;
  undefined1 uStack_129a;
  char cStack_1299;
  undefined1 local_1298;
  char cStack_1297;
  undefined1 uStack_1296;
  char cStack_1295;
  undefined1 uStack_1294;
  char cStack_1293;
  undefined1 uStack_1292;
  char cStack_1291;
  undefined1 uStack_1290;
  char cStack_128f;
  undefined1 uStack_128e;
  char cStack_128d;
  undefined1 uStack_128c;
  char cStack_128b;
  undefined1 uStack_128a;
  char cStack_1289;
  undefined8 local_1288;
  undefined8 uStack_1280;
  undefined8 local_1278;
  undefined8 uStack_1270;
  undefined8 local_1268;
  undefined8 uStack_1260;
  undefined8 local_1258;
  undefined8 uStack_1250;
  undefined8 local_1248;
  undefined8 uStack_1240;
  undefined1 local_1238;
  undefined1 uStack_1237;
  undefined1 uStack_1236;
  undefined1 uStack_1235;
  undefined1 uStack_1234;
  undefined1 uStack_1233;
  undefined1 uStack_1232;
  undefined1 uStack_1231;
  undefined1 uStack_1230;
  undefined1 uStack_122f;
  undefined1 uStack_122e;
  undefined1 uStack_122d;
  undefined1 uStack_122c;
  undefined1 uStack_122b;
  undefined1 uStack_122a;
  undefined1 uStack_1229;
  undefined8 local_1228;
  undefined8 uStack_1220;
  undefined8 local_1218;
  undefined8 uStack_1210;
  undefined8 local_1208;
  undefined8 uStack_1200;
  undefined8 local_11f8;
  undefined8 uStack_11f0;
  undefined8 local_11e8;
  undefined8 uStack_11e0;
  undefined8 local_11d8;
  undefined8 uStack_11d0;
  undefined8 local_11c8;
  undefined8 uStack_11c0;
  byte local_11b8;
  byte bStack_11b7;
  byte bStack_11b6;
  byte bStack_11b5;
  byte bStack_11b4;
  byte bStack_11b3;
  byte bStack_11b2;
  byte bStack_11b1;
  byte bStack_11b0;
  byte bStack_11af;
  byte bStack_11ae;
  byte bStack_11ad;
  byte bStack_11ac;
  byte bStack_11ab;
  byte bStack_11aa;
  byte bStack_11a9;
  byte local_11a8;
  byte bStack_11a7;
  byte bStack_11a6;
  byte bStack_11a5;
  byte bStack_11a4;
  byte bStack_11a3;
  byte bStack_11a2;
  byte bStack_11a1;
  byte bStack_11a0;
  byte bStack_119f;
  byte bStack_119e;
  byte bStack_119d;
  byte bStack_119c;
  byte bStack_119b;
  byte bStack_119a;
  byte bStack_1199;
  undefined8 local_1198;
  undefined8 uStack_1190;
  undefined1 local_1188 [16];
  undefined1 local_1178;
  undefined1 uStack_1177;
  undefined1 uStack_1176;
  undefined1 uStack_1175;
  undefined1 uStack_1174;
  undefined1 uStack_1173;
  undefined1 uStack_1172;
  undefined1 uStack_1171;
  undefined1 uStack_1170;
  undefined1 uStack_116f;
  undefined1 uStack_116e;
  undefined1 uStack_116d;
  undefined1 uStack_116c;
  undefined1 uStack_116b;
  undefined1 uStack_116a;
  undefined1 uStack_1169;
  ulong local_1168;
  ulong uStack_1160;
  undefined8 local_1158;
  undefined8 uStack_1150;
  undefined8 local_1148;
  undefined8 uStack_1140;
  byte local_1138;
  byte bStack_1137;
  byte bStack_1136;
  byte bStack_1135;
  byte bStack_1134;
  byte bStack_1133;
  byte bStack_1132;
  byte bStack_1131;
  byte bStack_1130;
  byte bStack_112f;
  byte bStack_112e;
  byte bStack_112d;
  byte bStack_112c;
  byte bStack_112b;
  byte bStack_112a;
  byte bStack_1129;
  ulong local_1118;
  ulong uStack_1110;
  ulong local_1108;
  ulong uStack_1100;
  ulong local_10f8;
  ulong uStack_10f0;
  ulong local_10e8;
  ulong uStack_10e0;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  longlong local_10b8;
  longlong lStack_10b0;
  ulong local_10a8;
  ulong uStack_10a0;
  ulong local_1098;
  ulong uStack_1090;
  ulong local_1088;
  ulong uStack_1080;
  ulong local_1078;
  ulong uStack_1070;
  longlong local_1068;
  longlong lStack_1060;
  undefined8 local_1058;
  undefined8 uStack_1050;
  undefined8 local_1048;
  undefined8 uStack_1040;
  ulong local_1038;
  ulong uStack_1030;
  undefined8 local_1028;
  undefined8 uStack_1020;
  undefined8 local_1018;
  undefined8 uStack_1010;
  undefined8 local_1008;
  undefined8 uStack_1000;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  undefined8 local_fd8;
  undefined8 uStack_fd0;
  int local_fa4;
  ulong *local_fa0;
  undefined8 local_f98;
  undefined8 uStack_f90;
  undefined8 local_f88;
  undefined8 uStack_f80;
  undefined8 local_f78;
  undefined8 uStack_f70;
  undefined8 local_f68;
  undefined8 uStack_f60;
  undefined8 local_f58;
  longlong lStack_f50;
  undefined8 local_f48;
  undefined8 uStack_f40;
  undefined8 local_f38;
  ulong uStack_f30;
  undefined8 local_f28;
  undefined8 uStack_f20;
  undefined8 local_f18;
  ulong uStack_f10;
  undefined8 local_f08;
  undefined8 uStack_f00;
  undefined8 local_ef8;
  ulong uStack_ef0;
  undefined8 local_ee8;
  undefined8 uStack_ee0;
  undefined8 local_ed8;
  ulong uStack_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined8 local_eb8;
  longlong lStack_eb0;
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  undefined8 local_e98;
  undefined8 uStack_e90;
  undefined8 *local_e68;
  longlong *local_e60;
  ulong *local_e58;
  ulong *local_e48;
  ulong *local_e40;
  longlong *local_e38;
  undefined8 *local_e30;
  undefined8 *local_d70;
  ulong *local_d50;
  undefined8 *local_d30;
  undefined8 *local_d10;
  undefined8 *local_cf0;
  undefined1 local_ce1;
  undefined1 local_ce0;
  undefined1 local_cdf;
  undefined1 local_cde;
  undefined1 local_cdd;
  undefined1 local_cdc;
  undefined1 local_cdb;
  undefined1 local_cda;
  undefined1 local_cd9;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  byte local_bb8;
  byte bStack_bb7;
  byte bStack_bb6;
  byte bStack_bb5;
  byte bStack_bb4;
  byte bStack_bb3;
  byte bStack_bb2;
  byte bStack_bb1;
  byte bStack_bb0;
  byte bStack_baf;
  byte bStack_bae;
  byte bStack_bad;
  byte bStack_bac;
  byte bStack_bab;
  byte bStack_baa;
  byte bStack_ba9;
  byte local_ba8;
  byte bStack_ba7;
  byte bStack_ba6;
  byte bStack_ba5;
  byte bStack_ba4;
  byte bStack_ba3;
  byte bStack_ba2;
  byte bStack_ba1;
  byte bStack_ba0;
  byte bStack_b9f;
  byte bStack_b9e;
  byte bStack_b9d;
  byte bStack_b9c;
  byte bStack_b9b;
  byte bStack_b9a;
  byte bStack_b99;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  byte local_b78;
  byte bStack_b77;
  byte bStack_b76;
  byte bStack_b75;
  byte bStack_b74;
  byte bStack_b73;
  byte bStack_b72;
  byte bStack_b71;
  byte bStack_b70;
  byte bStack_b6f;
  byte bStack_b6e;
  byte bStack_b6d;
  byte bStack_b6c;
  byte bStack_b6b;
  byte bStack_b6a;
  byte bStack_b69;
  byte local_b68;
  byte bStack_b67;
  byte bStack_b66;
  byte bStack_b65;
  byte bStack_b64;
  byte bStack_b63;
  byte bStack_b62;
  byte bStack_b61;
  byte bStack_b60;
  byte bStack_b5f;
  byte bStack_b5e;
  byte bStack_b5d;
  byte bStack_b5c;
  byte bStack_b5b;
  byte bStack_b5a;
  byte bStack_b59;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  byte local_b38;
  byte bStack_b37;
  byte bStack_b36;
  byte bStack_b35;
  byte bStack_b34;
  byte bStack_b33;
  byte bStack_b32;
  byte bStack_b31;
  byte bStack_b30;
  byte bStack_b2f;
  byte bStack_b2e;
  byte bStack_b2d;
  byte bStack_b2c;
  byte bStack_b2b;
  byte bStack_b2a;
  byte bStack_b29;
  byte local_b28;
  byte bStack_b27;
  byte bStack_b26;
  byte bStack_b25;
  byte bStack_b24;
  byte bStack_b23;
  byte bStack_b22;
  byte bStack_b21;
  byte bStack_b20;
  byte bStack_b1f;
  byte bStack_b1e;
  byte bStack_b1d;
  byte bStack_b1c;
  byte bStack_b1b;
  byte bStack_b1a;
  byte bStack_b19;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  byte local_af8;
  byte bStack_af7;
  byte bStack_af6;
  byte bStack_af5;
  byte bStack_af4;
  byte bStack_af3;
  byte bStack_af2;
  byte bStack_af1;
  byte bStack_af0;
  byte bStack_aef;
  byte bStack_aee;
  byte bStack_aed;
  byte bStack_aec;
  byte bStack_aeb;
  byte bStack_aea;
  byte bStack_ae9;
  byte local_ae8;
  byte bStack_ae7;
  byte bStack_ae6;
  byte bStack_ae5;
  byte bStack_ae4;
  byte bStack_ae3;
  byte bStack_ae2;
  byte bStack_ae1;
  byte bStack_ae0;
  byte bStack_adf;
  byte bStack_ade;
  byte bStack_add;
  byte bStack_adc;
  byte bStack_adb;
  byte bStack_ada;
  byte bStack_ad9;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined4 local_a4c;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined4 local_a2c;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined4 local_a0c;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined4 local_9ec;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  ulong local_9c8;
  ulong uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  ulong local_9a8;
  ulong uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  ulong local_988;
  ulong uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  ulong local_968;
  ulong uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  ulong local_948;
  ulong uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  ulong local_928;
  ulong uStack_920;
  ulong local_918;
  ulong uStack_910;
  ulong local_908;
  ulong uStack_900;
  ulong local_8f8;
  ulong uStack_8f0;
  undefined1 local_8e8 [16];
  ulong local_8d8;
  ulong uStack_8d0;
  ulong local_8c8;
  ulong uStack_8c0;
  ulong local_8b8;
  ulong uStack_8b0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  longlong local_868;
  longlong lStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined1 local_828 [16];
  undefined8 local_818;
  undefined8 uStack_810;
  undefined1 local_808 [16];
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined1 local_7e8 [16];
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined1 local_7c8 [16];
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined1 local_7a8 [16];
  undefined8 local_798;
  undefined8 uStack_790;
  char local_788;
  char cStack_787;
  char cStack_786;
  char cStack_785;
  char cStack_784;
  char cStack_783;
  char cStack_782;
  char cStack_781;
  char cStack_780;
  char cStack_77f;
  char cStack_77e;
  char cStack_77d;
  char cStack_77c;
  char cStack_77b;
  char cStack_77a;
  char cStack_779;
  undefined8 local_778;
  undefined8 uStack_770;
  ulong local_768;
  ulong uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  ulong local_748;
  ulong uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  ulong local_728;
  ulong uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  ulong local_708;
  ulong uStack_700;
  ulong local_6f8;
  ulong uStack_6f0;
  char local_6e8;
  char cStack_6e7;
  char cStack_6e6;
  char cStack_6e5;
  char cStack_6e4;
  char cStack_6e3;
  char cStack_6e2;
  char cStack_6e1;
  char cStack_6e0;
  char cStack_6df;
  char cStack_6de;
  char cStack_6dd;
  char cStack_6dc;
  char cStack_6db;
  char cStack_6da;
  char cStack_6d9;
  char local_6d8;
  char cStack_6d7;
  char cStack_6d6;
  char cStack_6d5;
  char cStack_6d4;
  char cStack_6d3;
  char cStack_6d2;
  char cStack_6d1;
  char cStack_6d0;
  char cStack_6cf;
  char cStack_6ce;
  char cStack_6cd;
  char cStack_6cc;
  char cStack_6cb;
  char cStack_6ca;
  byte bStack_6c9;
  char local_6c8;
  char cStack_6c7;
  char cStack_6c6;
  char cStack_6c5;
  char cStack_6c4;
  char cStack_6c3;
  char cStack_6c2;
  char cStack_6c1;
  char cStack_6c0;
  char cStack_6bf;
  char cStack_6be;
  char cStack_6bd;
  char cStack_6bc;
  char cStack_6bb;
  char cStack_6ba;
  byte bStack_6b9;
  ulong local_6b8;
  ulong uStack_6b0;
  ulong local_6a8;
  ulong uStack_6a0;
  ulong local_698;
  ulong uStack_690;
  ulong local_688;
  ulong uStack_680;
  ulong local_678;
  ulong uStack_670;
  ulong local_668;
  ulong uStack_660;
  ulong local_658;
  ulong uStack_650;
  ulong local_648;
  ulong uStack_640;
  ulong local_638;
  ulong uStack_630;
  ulong local_628;
  ulong uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  ulong local_608;
  ulong uStack_600;
  ulong local_5f8;
  ulong uStack_5f0;
  ulong local_5e8;
  ulong uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  ulong local_5c8;
  ulong uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  ulong local_5a8;
  ulong uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  ulong local_548;
  ulong uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  ulong local_4d8;
  ulong uStack_4d0;
  ulong local_4c8;
  ulong uStack_4c0;
  ulong local_4b8;
  ulong uStack_4b0;
  ulong local_4a8;
  ulong uStack_4a0;
  ulong local_498;
  ulong uStack_490;
  ulong local_488;
  ulong uStack_480;
  ulong local_478;
  ulong uStack_470;
  ulong local_468;
  ulong uStack_460;
  undefined2 local_44a;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  longlong local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  ulong local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  ulong local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  ulong local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  ulong local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  longlong local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  longlong local_348;
  longlong lStack_340;
  short local_338;
  short sStack_336;
  short sStack_334;
  short sStack_332;
  short sStack_330;
  short sStack_32e;
  short sStack_32c;
  short sStack_32a;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  short local_308;
  short sStack_306;
  short sStack_304;
  short sStack_302;
  short sStack_300;
  short sStack_2fe;
  short sStack_2fc;
  short sStack_2fa;
  short local_2f8;
  short sStack_2f6;
  short sStack_2f4;
  short sStack_2f2;
  short sStack_2f0;
  short sStack_2ee;
  short sStack_2ec;
  short sStack_2ea;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  longlong local_2c8;
  longlong lStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  short local_2a8;
  short sStack_2a6;
  short sStack_2a4;
  short sStack_2a2;
  short sStack_2a0;
  short sStack_29e;
  short sStack_29c;
  short sStack_29a;
  short local_298;
  short sStack_296;
  short sStack_294;
  short sStack_292;
  short sStack_290;
  short sStack_28e;
  short sStack_28c;
  short sStack_28a;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  longlong local_248;
  longlong lStack_240;
  short local_238;
  short sStack_236;
  short sStack_234;
  short sStack_232;
  short sStack_230;
  short sStack_22e;
  short sStack_22c;
  short sStack_22a;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  short local_208;
  short sStack_206;
  short sStack_204;
  short sStack_202;
  short sStack_200;
  short sStack_1fe;
  short sStack_1fc;
  short sStack_1fa;
  short local_1f8;
  short sStack_1f6;
  short sStack_1f4;
  short sStack_1f2;
  short sStack_1f0;
  short sStack_1ee;
  short sStack_1ec;
  short sStack_1ea;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  longlong local_1c8;
  longlong lStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  short local_1a8;
  short sStack_1a6;
  short sStack_1a4;
  short sStack_1a2;
  short sStack_1a0;
  short sStack_19e;
  short sStack_19c;
  short sStack_19a;
  short local_198;
  short sStack_196;
  short sStack_194;
  short sStack_192;
  short sStack_190;
  short sStack_18e;
  short sStack_18c;
  short sStack_18a;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined1 local_138;
  undefined1 local_137;
  undefined1 local_136;
  undefined1 local_135;
  undefined1 local_134;
  undefined1 local_133;
  undefined1 local_132;
  undefined1 local_131;
  undefined1 local_130;
  undefined1 local_12f;
  undefined1 local_12e;
  undefined1 local_12d;
  undefined1 local_12c;
  undefined1 local_12b;
  undefined1 local_12a;
  undefined1 local_129;
  ulong local_128;
  ulong uStack_120;
  undefined1 local_118;
  undefined1 local_117;
  undefined1 local_116;
  undefined1 local_115;
  undefined1 local_114;
  undefined1 local_113;
  undefined1 local_112;
  undefined1 local_111;
  undefined1 local_110;
  undefined1 local_10f;
  undefined1 local_10e;
  undefined1 local_10d;
  undefined1 local_10c;
  undefined1 local_10b;
  undefined1 local_10a;
  undefined1 local_109;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined1 local_f8;
  undefined1 local_f7;
  undefined1 local_f6;
  undefined1 local_f5;
  undefined1 local_f4;
  undefined1 local_f3;
  undefined1 local_f2;
  undefined1 local_f1;
  undefined1 local_f0;
  undefined1 local_ef;
  undefined1 local_ee;
  undefined1 local_ed;
  undefined1 local_ec;
  undefined1 local_eb;
  undefined1 local_ea;
  undefined1 local_e9;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined1 local_d8;
  undefined1 local_d7;
  undefined1 local_d6;
  undefined1 local_d5;
  undefined1 local_d4;
  undefined1 local_d3;
  undefined1 local_d2;
  undefined1 local_d1;
  undefined1 local_d0;
  undefined1 local_cf;
  undefined1 local_ce;
  undefined1 local_cd;
  undefined1 local_cc;
  undefined1 local_cb;
  undefined1 local_ca;
  undefined1 local_c9;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined1 local_b8;
  undefined1 local_b7;
  undefined1 local_b6;
  undefined1 local_b5;
  undefined1 local_b4;
  undefined1 local_b3;
  undefined1 local_b2;
  undefined1 local_b1;
  undefined1 local_b0;
  undefined1 local_af;
  undefined1 local_ae;
  undefined1 local_ad;
  undefined1 local_ac;
  undefined1 local_ab;
  undefined1 local_aa;
  undefined1 local_a9;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined1 local_98;
  undefined1 local_97;
  undefined1 local_96;
  undefined1 local_95;
  undefined1 local_94;
  undefined1 local_93;
  undefined1 local_92;
  undefined1 local_91;
  undefined1 local_90;
  undefined1 local_8f;
  undefined1 local_8e;
  undefined1 local_8d;
  undefined1 local_8c;
  undefined1 local_8b;
  undefined1 local_8a;
  undefined1 local_89;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined1 local_78;
  undefined1 local_77;
  undefined1 local_76;
  undefined1 local_75;
  undefined1 local_74;
  undefined1 local_73;
  undefined1 local_72;
  undefined1 local_71;
  undefined1 local_70;
  undefined1 local_6f;
  undefined1 local_6e;
  undefined1 local_6d;
  undefined1 local_6c;
  undefined1 local_6b;
  undefined1 local_6a;
  undefined1 local_69;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_58;
  undefined1 local_57;
  undefined1 local_56;
  undefined1 local_55;
  undefined1 local_54;
  undefined1 local_53;
  undefined1 local_52;
  undefined1 local_51;
  undefined1 local_50;
  undefined1 local_4f;
  undefined1 local_4e;
  undefined1 local_4d;
  undefined1 local_4c;
  undefined1 local_4b;
  undefined1 local_4a;
  undefined1 local_49;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 local_38;
  undefined1 local_37;
  undefined1 local_36;
  undefined1 local_35;
  undefined1 local_34;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  undefined1 local_30;
  undefined1 local_2f;
  undefined1 local_2e;
  undefined1 local_2d;
  undefined1 local_2c;
  undefined1 local_2b;
  undefined1 local_2a;
  undefined1 local_29;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined2 local_10;
  undefined2 local_e;
  undefined2 local_c;
  undefined2 local_a;
  undefined2 local_8;
  undefined2 local_6;
  undefined2 local_4;
  undefined2 local_2;
  ulong uVar99;
  
  local_fa4 = (int)in_RSI;
  local_f98 = 0;
  uStack_f90 = 0;
  local_fd8 = 0;
  uStack_fd0 = 0;
  local_cd9 = 1;
  local_129 = 1;
  local_12a = 1;
  local_12b = 1;
  local_12c = 1;
  local_12d = 1;
  local_12e = 1;
  local_12f = 1;
  local_130 = 1;
  local_131 = 1;
  local_132 = 1;
  local_133 = 1;
  local_134 = 1;
  local_135 = 1;
  local_136 = 1;
  local_137 = 1;
  local_138 = 1;
  local_fe8 = 0x101010101010101;
  uStack_fe0 = 0x101010101010101;
  local_ff8 = *in_RDX;
  uStack_ff0 = in_RDX[1];
  local_1008 = *in_RCX;
  uStack_1000 = in_RCX[1];
  local_1018 = *in_R8;
  uStack_1010 = in_R8[1];
  local_e30 = (undefined8 *)((long)in_RDI - (long)(local_fa4 << 2));
  local_1058 = *local_e30;
  uStack_1050 = local_e30[1];
  local_e38 = (longlong *)((long)in_RDI - (long)(local_fa4 * 3));
  local_1068 = *local_e38;
  lStack_1060 = local_e38[1];
  local_e40 = (ulong *)((long)in_RDI - (long)(local_fa4 * 2));
  local_1078 = *local_e40;
  uStack_1070 = local_e40[1];
  local_e48 = (ulong *)((long)in_RDI - (long)local_fa4);
  local_1088 = *local_e48;
  uStack_1080 = local_e48[1];
  local_1098 = *in_RDI;
  uStack_1090 = in_RDI[1];
  local_e58 = (ulong *)((long)in_RDI + (long)local_fa4);
  local_10a8 = *local_e58;
  uStack_10a0 = local_e58[1];
  local_e60 = (longlong *)((long)in_RDI + (long)(local_fa4 * 2));
  local_10b8 = *local_e60;
  lStack_10b0 = local_e60[1];
  alVar106[0] = in_RSI & 0xffffffff;
  alVar106[1] = (long)(local_fa4 * 3);
  local_e68 = (undefined8 *)((long)in_RDI + alVar106[1]);
  local_10c8 = *local_e68;
  uStack_10c0 = local_e68[1];
  a[1] = in_RSI;
  a[0] = (longlong)in_RDI;
  local_fa0 = in_RDI;
  local_148 = local_fe8;
  uStack_140 = uStack_fe0;
  alVar105 = abs_diff(a,alVar106);
  alVar105[0] = alVar105[1];
  alVar105[1] = alVar106[1];
  a_00[1] = in_RSI;
  a_00[0] = (longlong)in_RDI;
  local_1148 = extraout_XMM0_Qa;
  uStack_1140 = extraout_XMM0_Qb;
  alVar105 = abs_diff(a_00,alVar105);
  b[0] = alVar105[1];
  local_cda = 0xfe;
  local_109 = 0xfe;
  local_10a = 0xfe;
  local_10b = 0xfe;
  local_10c = 0xfe;
  local_10d = 0xfe;
  local_10e = 0xfe;
  local_10f = 0xfe;
  local_110 = 0xfe;
  local_111 = 0xfe;
  local_112 = 0xfe;
  local_113 = 0xfe;
  local_114 = 0xfe;
  local_115 = 0xfe;
  local_116 = 0xfe;
  local_117 = 0xfe;
  local_118 = 0xfe;
  local_1168 = 0xfefefefefefefefe;
  uStack_1160 = 0xfefefefefefefefe;
  local_be8 = local_fd8;
  uStack_be0 = uStack_fd0;
  local_bf8 = local_fd8;
  uStack_bf0 = uStack_fd0;
  local_1178 = 0xff;
  uStack_1177 = 0xff;
  uStack_1176 = 0xff;
  uStack_1175 = 0xff;
  uStack_1174 = 0xff;
  uStack_1173 = 0xff;
  uStack_1172 = 0xff;
  uStack_1171 = 0xff;
  uStack_1170 = 0xff;
  uStack_116f = 0xff;
  uStack_116e = 0xff;
  uStack_116d = 0xff;
  uStack_116c = 0xff;
  uStack_116b = 0xff;
  uStack_116a = 0xff;
  uStack_1169 = 0xff;
  b[1] = alVar106[1];
  a_01[1] = in_RSI;
  a_01[0] = (longlong)in_RDI;
  local_1158 = extraout_XMM0_Qa_00;
  uStack_1150 = extraout_XMM0_Qb_00;
  local_128 = local_1168;
  uStack_120 = uStack_1160;
  alVar105 = abs_diff(a_01,b);
  b_00[0] = alVar105[1];
  b_00[1] = alVar106[1];
  a_02[1] = in_RSI;
  a_02[0] = (longlong)in_RDI;
  local_1188._0_8_ = extraout_XMM0_Qa_01;
  local_1188._8_8_ = extraout_XMM0_Qb_01;
  alVar105 = abs_diff(a_02,b_00);
  b_01[0] = alVar105[1];
  local_aa8 = local_1148;
  uVar85 = local_aa8;
  uStack_aa0 = uStack_1140;
  uVar86 = uStack_aa0;
  local_ab8 = local_1158;
  uVar83 = local_ab8;
  uStack_ab0 = uStack_1150;
  uVar84 = uStack_ab0;
  local_aa8._0_1_ = (byte)local_1148;
  local_aa8._1_1_ = (byte)((ulong)local_1148 >> 8);
  local_aa8._2_1_ = (byte)((ulong)local_1148 >> 0x10);
  local_aa8._3_1_ = (byte)((ulong)local_1148 >> 0x18);
  local_aa8._4_1_ = (byte)((ulong)local_1148 >> 0x20);
  local_aa8._5_1_ = (byte)((ulong)local_1148 >> 0x28);
  local_aa8._6_1_ = (byte)((ulong)local_1148 >> 0x30);
  local_aa8._7_1_ = (byte)((ulong)local_1148 >> 0x38);
  uStack_aa0._0_1_ = (byte)uStack_1140;
  uStack_aa0._1_1_ = (byte)((ulong)uStack_1140 >> 8);
  uStack_aa0._2_1_ = (byte)((ulong)uStack_1140 >> 0x10);
  uStack_aa0._3_1_ = (byte)((ulong)uStack_1140 >> 0x18);
  uStack_aa0._4_1_ = (byte)((ulong)uStack_1140 >> 0x20);
  uStack_aa0._5_1_ = (byte)((ulong)uStack_1140 >> 0x28);
  uStack_aa0._6_1_ = (byte)((ulong)uStack_1140 >> 0x30);
  uStack_aa0._7_1_ = (byte)((ulong)uStack_1140 >> 0x38);
  local_ab8._0_1_ = (byte)local_1158;
  local_ab8._1_1_ = (byte)((ulong)local_1158 >> 8);
  local_ab8._2_1_ = (byte)((ulong)local_1158 >> 0x10);
  local_ab8._3_1_ = (byte)((ulong)local_1158 >> 0x18);
  local_ab8._4_1_ = (byte)((ulong)local_1158 >> 0x20);
  local_ab8._5_1_ = (byte)((ulong)local_1158 >> 0x28);
  local_ab8._6_1_ = (byte)((ulong)local_1158 >> 0x30);
  local_ab8._7_1_ = (byte)((ulong)local_1158 >> 0x38);
  uStack_ab0._0_1_ = (byte)uStack_1150;
  uStack_ab0._1_1_ = (byte)((ulong)uStack_1150 >> 8);
  uStack_ab0._2_1_ = (byte)((ulong)uStack_1150 >> 0x10);
  uStack_ab0._3_1_ = (byte)((ulong)uStack_1150 >> 0x18);
  uStack_ab0._4_1_ = (byte)((ulong)uStack_1150 >> 0x20);
  uStack_ab0._5_1_ = (byte)((ulong)uStack_1150 >> 0x28);
  uStack_ab0._6_1_ = (byte)((ulong)uStack_1150 >> 0x30);
  uStack_ab0._7_1_ = (byte)((ulong)uStack_1150 >> 0x38);
  local_1138 = ((byte)local_aa8 < (byte)local_ab8) * (byte)local_ab8 |
               ((byte)local_aa8 >= (byte)local_ab8) * (byte)local_aa8;
  bStack_1137 = (local_aa8._1_1_ < local_ab8._1_1_) * local_ab8._1_1_ |
                (local_aa8._1_1_ >= local_ab8._1_1_) * local_aa8._1_1_;
  bStack_1136 = (local_aa8._2_1_ < local_ab8._2_1_) * local_ab8._2_1_ |
                (local_aa8._2_1_ >= local_ab8._2_1_) * local_aa8._2_1_;
  bStack_1135 = (local_aa8._3_1_ < local_ab8._3_1_) * local_ab8._3_1_ |
                (local_aa8._3_1_ >= local_ab8._3_1_) * local_aa8._3_1_;
  bStack_1134 = (local_aa8._4_1_ < local_ab8._4_1_) * local_ab8._4_1_ |
                (local_aa8._4_1_ >= local_ab8._4_1_) * local_aa8._4_1_;
  bStack_1133 = (local_aa8._5_1_ < local_ab8._5_1_) * local_ab8._5_1_ |
                (local_aa8._5_1_ >= local_ab8._5_1_) * local_aa8._5_1_;
  bStack_1132 = (local_aa8._6_1_ < local_ab8._6_1_) * local_ab8._6_1_ |
                (local_aa8._6_1_ >= local_ab8._6_1_) * local_aa8._6_1_;
  bStack_1131 = (local_aa8._7_1_ < local_ab8._7_1_) * local_ab8._7_1_ |
                (local_aa8._7_1_ >= local_ab8._7_1_) * local_aa8._7_1_;
  bStack_1130 = ((byte)uStack_aa0 < (byte)uStack_ab0) * (byte)uStack_ab0 |
                ((byte)uStack_aa0 >= (byte)uStack_ab0) * (byte)uStack_aa0;
  bStack_112f = (uStack_aa0._1_1_ < uStack_ab0._1_1_) * uStack_ab0._1_1_ |
                (uStack_aa0._1_1_ >= uStack_ab0._1_1_) * uStack_aa0._1_1_;
  bStack_112e = (uStack_aa0._2_1_ < uStack_ab0._2_1_) * uStack_ab0._2_1_ |
                (uStack_aa0._2_1_ >= uStack_ab0._2_1_) * uStack_aa0._2_1_;
  bStack_112d = (uStack_aa0._3_1_ < uStack_ab0._3_1_) * uStack_ab0._3_1_ |
                (uStack_aa0._3_1_ >= uStack_ab0._3_1_) * uStack_aa0._3_1_;
  bStack_112c = (uStack_aa0._4_1_ < uStack_ab0._4_1_) * uStack_ab0._4_1_ |
                (uStack_aa0._4_1_ >= uStack_ab0._4_1_) * uStack_aa0._4_1_;
  bStack_112b = (uStack_aa0._5_1_ < uStack_ab0._5_1_) * uStack_ab0._5_1_ |
                (uStack_aa0._5_1_ >= uStack_ab0._5_1_) * uStack_aa0._5_1_;
  bStack_112a = (uStack_aa0._6_1_ < uStack_ab0._6_1_) * uStack_ab0._6_1_ |
                (uStack_aa0._6_1_ >= uStack_ab0._6_1_) * uStack_aa0._6_1_;
  bStack_1129 = (uStack_aa0._7_1_ < uStack_ab0._7_1_) * uStack_ab0._7_1_ |
                (uStack_aa0._7_1_ >= uStack_ab0._7_1_) * uStack_aa0._7_1_;
  local_a68 = local_1188._0_8_;
  uStack_a60 = local_1188._8_8_;
  local_a78 = local_1188._0_8_;
  uStack_a70 = local_1188._8_8_;
  auVar42._8_8_ = local_1188._8_8_;
  auVar42._0_8_ = local_1188._0_8_;
  auVar102._8_8_ = local_1188._8_8_;
  auVar102._0_8_ = local_1188._0_8_;
  local_1188 = paddusb(auVar42,auVar102);
  local_8b8 = local_1168;
  uStack_8b0 = uStack_1160;
  uVar99 = extraout_XMM0_Qa_02 & local_1168;
  uVar103 = extraout_XMM0_Qb_02 & uStack_1160;
  local_9ec = 1;
  local_9e8._0_2_ = (ushort)uVar99;
  local_9e8._2_2_ = (ushort)(uVar99 >> 0x10);
  local_9e8._4_2_ = (ushort)(uVar99 >> 0x20);
  uStack_9e0._0_2_ = (ushort)uVar103;
  uStack_9e0._2_2_ = (ushort)(uVar103 >> 0x10);
  uStack_9e0._4_2_ = (ushort)(uVar103 >> 0x20);
  local_1198 = CONCAT26((ushort)(uVar99 >> 0x31),
                        CONCAT24(local_9e8._4_2_ >> 1,
                                 CONCAT22(local_9e8._2_2_ >> 1,(ushort)local_9e8 >> 1)));
  uStack_1190 = CONCAT26((ushort)(uVar103 >> 0x31),
                         CONCAT24(uStack_9e0._4_2_ >> 1,
                                  CONCAT22(uStack_9e0._2_2_ >> 1,(ushort)uStack_9e0 >> 1)));
  local_a88 = local_1188._0_8_;
  uStack_a80 = local_1188._8_8_;
  local_a98 = local_1198;
  uStack_a90 = uStack_1190;
  auVar101._8_8_ = uStack_1190;
  auVar101._0_8_ = local_1198;
  local_828 = paddusb(local_1188,auVar101);
  local_838 = local_ff8;
  uStack_830 = uStack_ff0;
  auVar49._8_8_ = uStack_ff0;
  auVar49._0_8_ = local_ff8;
  auVar101 = psubusb(local_828,auVar49);
  local_1028 = auVar101._0_8_;
  uStack_1020 = auVar101._8_8_;
  local_c08 = local_1028;
  uVar77 = local_c08;
  uStack_c00 = uStack_1020;
  uVar78 = uStack_c00;
  local_c18 = local_fd8;
  uVar75 = local_c18;
  uStack_c10 = uStack_fd0;
  uVar76 = uStack_c10;
  local_c08._0_1_ = auVar101[0];
  local_c08._1_1_ = auVar101[1];
  local_c08._2_1_ = auVar101[2];
  local_c08._3_1_ = auVar101[3];
  local_c08._4_1_ = auVar101[4];
  local_c08._5_1_ = auVar101[5];
  local_c08._6_1_ = auVar101[6];
  local_c08._7_1_ = auVar101[7];
  uStack_c00._0_1_ = auVar101[8];
  uStack_c00._1_1_ = auVar101[9];
  uStack_c00._2_1_ = auVar101[10];
  uStack_c00._3_1_ = auVar101[0xb];
  uStack_c00._4_1_ = auVar101[0xc];
  uStack_c00._5_1_ = auVar101[0xd];
  uStack_c00._6_1_ = auVar101[0xe];
  uStack_c00._7_1_ = auVar101[0xf];
  local_c18._0_1_ = (char)local_fd8;
  local_c18._1_1_ = (char)((ulong)local_fd8 >> 8);
  local_c18._2_1_ = (char)((ulong)local_fd8 >> 0x10);
  local_c18._3_1_ = (char)((ulong)local_fd8 >> 0x18);
  local_c18._4_1_ = (char)((ulong)local_fd8 >> 0x20);
  local_c18._5_1_ = (char)((ulong)local_fd8 >> 0x28);
  local_c18._6_1_ = (char)((ulong)local_fd8 >> 0x30);
  local_c18._7_1_ = (char)((ulong)local_fd8 >> 0x38);
  uStack_c10._0_1_ = (char)uStack_fd0;
  uStack_c10._1_1_ = (char)((ulong)uStack_fd0 >> 8);
  uStack_c10._2_1_ = (char)((ulong)uStack_fd0 >> 0x10);
  uStack_c10._3_1_ = (char)((ulong)uStack_fd0 >> 0x18);
  uStack_c10._4_1_ = (char)((ulong)uStack_fd0 >> 0x20);
  uStack_c10._5_1_ = (char)((ulong)uStack_fd0 >> 0x28);
  uStack_c10._6_1_ = (char)((ulong)uStack_fd0 >> 0x30);
  uStack_c10._7_1_ = (char)((ulong)uStack_fd0 >> 0x38);
  local_6e8 = -((char)local_c08 == (char)local_c18);
  cStack_6e7 = -(local_c08._1_1_ == local_c18._1_1_);
  cStack_6e6 = -(local_c08._2_1_ == local_c18._2_1_);
  cStack_6e5 = -(local_c08._3_1_ == local_c18._3_1_);
  cStack_6e4 = -(local_c08._4_1_ == local_c18._4_1_);
  cStack_6e3 = -(local_c08._5_1_ == local_c18._5_1_);
  cStack_6e2 = -(local_c08._6_1_ == local_c18._6_1_);
  cStack_6e1 = -(local_c08._7_1_ == local_c18._7_1_);
  cStack_6e0 = -((char)uStack_c00 == (char)uStack_c10);
  cStack_6df = -(uStack_c00._1_1_ == uStack_c10._1_1_);
  cStack_6de = -(uStack_c00._2_1_ == uStack_c10._2_1_);
  cStack_6dd = -(uStack_c00._3_1_ == uStack_c10._3_1_);
  cStack_6dc = -(uStack_c00._4_1_ == uStack_c10._4_1_);
  cStack_6db = -(uStack_c00._5_1_ == uStack_c10._5_1_);
  cStack_6da = -(uStack_c00._6_1_ == uStack_c10._6_1_);
  cStack_6d9 = -(uStack_c00._7_1_ == uStack_c10._7_1_);
  local_6f8 = CONCAT17(uStack_1171,
                       CONCAT16(uStack_1172,
                                CONCAT15(uStack_1173,
                                         CONCAT14(uStack_1174,
                                                  CONCAT13(uStack_1175,
                                                           CONCAT12(uStack_1176,
                                                                    CONCAT11(uStack_1177,local_1178)
                                                                   ))))));
  uStack_6f0 = CONCAT17(uStack_1169,
                        CONCAT16(uStack_116a,
                                 CONCAT15(uStack_116b,
                                          CONCAT14(uStack_116c,
                                                   CONCAT13(uStack_116d,
                                                            CONCAT12(uStack_116e,
                                                                     CONCAT11(uStack_116f,
                                                                              uStack_1170)))))));
  uVar100 = CONCAT17(cStack_6e1,
                     CONCAT16(cStack_6e2,
                              CONCAT15(cStack_6e3,
                                       CONCAT14(cStack_6e4,
                                                CONCAT13(cStack_6e5,
                                                         CONCAT12(cStack_6e6,
                                                                  CONCAT11(cStack_6e7,local_6e8)))))
                             )) ^ local_6f8;
  uVar104 = CONCAT17(cStack_6d9,
                     CONCAT16(cStack_6da,
                              CONCAT15(cStack_6db,
                                       CONCAT14(cStack_6dc,
                                                CONCAT13(cStack_6dd,
                                                         CONCAT12(cStack_6de,
                                                                  CONCAT11(cStack_6df,cStack_6e0))))
                                      ))) ^ uStack_6f0;
  local_ac8 = CONCAT17(bStack_1131,
                       CONCAT16(bStack_1132,
                                CONCAT15(bStack_1133,
                                         CONCAT14(bStack_1134,
                                                  CONCAT13(bStack_1135,
                                                           CONCAT12(bStack_1136,
                                                                    CONCAT11(bStack_1137,local_1138)
                                                                   ))))));
  uStack_ac0 = CONCAT17(bStack_1129,
                        CONCAT16(bStack_112a,
                                 CONCAT15(bStack_112b,
                                          CONCAT14(bStack_112c,
                                                   CONCAT13(bStack_112d,
                                                            CONCAT12(bStack_112e,
                                                                     CONCAT11(bStack_112f,
                                                                              bStack_1130)))))));
  local_ad8._0_1_ = (byte)uVar100;
  local_ad8._1_1_ = (byte)(uVar100 >> 8);
  local_ad8._2_1_ = (byte)(uVar100 >> 0x10);
  local_ad8._3_1_ = (byte)(uVar100 >> 0x18);
  local_ad8._4_1_ = (byte)(uVar100 >> 0x20);
  local_ad8._5_1_ = (byte)(uVar100 >> 0x28);
  local_ad8._6_1_ = (byte)(uVar100 >> 0x30);
  local_ad8._7_1_ = (byte)(uVar100 >> 0x38);
  uStack_ad0._0_1_ = (byte)uVar104;
  uStack_ad0._1_1_ = (byte)(uVar104 >> 8);
  uStack_ad0._2_1_ = (byte)(uVar104 >> 0x10);
  uStack_ad0._3_1_ = (byte)(uVar104 >> 0x18);
  uStack_ad0._4_1_ = (byte)(uVar104 >> 0x20);
  uStack_ad0._5_1_ = (byte)(uVar104 >> 0x28);
  uStack_ad0._6_1_ = (byte)(uVar104 >> 0x30);
  uStack_ad0._7_1_ = (byte)(uVar104 >> 0x38);
  local_1028._1_1_ =
       (bStack_1137 < local_ad8._1_1_) * local_ad8._1_1_ |
       (bStack_1137 >= local_ad8._1_1_) * bStack_1137;
  local_1028._0_1_ =
       (local_1138 < (byte)local_ad8) * (byte)local_ad8 |
       (local_1138 >= (byte)local_ad8) * local_1138;
  local_1028._2_1_ =
       (bStack_1136 < local_ad8._2_1_) * local_ad8._2_1_ |
       (bStack_1136 >= local_ad8._2_1_) * bStack_1136;
  local_1028._3_1_ =
       (bStack_1135 < local_ad8._3_1_) * local_ad8._3_1_ |
       (bStack_1135 >= local_ad8._3_1_) * bStack_1135;
  local_1028._4_1_ =
       (bStack_1134 < local_ad8._4_1_) * local_ad8._4_1_ |
       (bStack_1134 >= local_ad8._4_1_) * bStack_1134;
  local_1028._5_1_ =
       (bStack_1133 < local_ad8._5_1_) * local_ad8._5_1_ |
       (bStack_1133 >= local_ad8._5_1_) * bStack_1133;
  local_1028._6_1_ =
       (bStack_1132 < local_ad8._6_1_) * local_ad8._6_1_ |
       (bStack_1132 >= local_ad8._6_1_) * bStack_1132;
  local_1028._7_1_ =
       (bStack_1131 < local_ad8._7_1_) * local_ad8._7_1_ |
       (bStack_1131 >= local_ad8._7_1_) * bStack_1131;
  uStack_1020._0_1_ =
       (bStack_1130 < (byte)uStack_ad0) * (byte)uStack_ad0 |
       (bStack_1130 >= (byte)uStack_ad0) * bStack_1130;
  uStack_1020._1_1_ =
       (bStack_112f < uStack_ad0._1_1_) * uStack_ad0._1_1_ |
       (bStack_112f >= uStack_ad0._1_1_) * bStack_112f;
  uStack_1020._2_1_ =
       (bStack_112e < uStack_ad0._2_1_) * uStack_ad0._2_1_ |
       (bStack_112e >= uStack_ad0._2_1_) * bStack_112e;
  uStack_1020._3_1_ =
       (bStack_112d < uStack_ad0._3_1_) * uStack_ad0._3_1_ |
       (bStack_112d >= uStack_ad0._3_1_) * bStack_112d;
  uStack_1020._4_1_ =
       (bStack_112c < uStack_ad0._4_1_) * uStack_ad0._4_1_ |
       (bStack_112c >= uStack_ad0._4_1_) * bStack_112c;
  uStack_1020._5_1_ =
       (bStack_112b < uStack_ad0._5_1_) * uStack_ad0._5_1_ |
       (bStack_112b >= uStack_ad0._5_1_) * bStack_112b;
  uStack_1020._6_1_ =
       (bStack_112a < uStack_ad0._6_1_) * uStack_ad0._6_1_ |
       (bStack_112a >= uStack_ad0._6_1_) * bStack_112a;
  uStack_1020._7_1_ =
       (bStack_1129 < uStack_ad0._7_1_) * uStack_ad0._7_1_ |
       (bStack_1129 >= uStack_ad0._7_1_) * bStack_1129;
  b_01[1] = alVar106[1];
  a_03[1] = in_RSI;
  a_03[0] = (longlong)in_RDI;
  local_c18 = uVar75;
  uStack_c10 = uVar76;
  local_c08 = uVar77;
  uStack_c00 = uVar78;
  local_ad8 = uVar100;
  uStack_ad0 = uVar104;
  local_ab8 = uVar83;
  uStack_ab0 = uVar84;
  local_aa8 = uVar85;
  uStack_aa0 = uVar86;
  local_9e8 = uVar99;
  uStack_9e0 = uVar103;
  alVar105 = abs_diff(a_03,b_01);
  b_02[0] = alVar105[1];
  b_02[1] = alVar106[1];
  a_04[1] = in_RSI;
  a_04[0] = (longlong)in_RDI;
  alVar105 = abs_diff(a_04,b_02);
  b_03[0] = alVar105[1];
  local_ae8 = (byte)extraout_XMM0_Qa_03;
  bStack_ae7 = (byte)((ulong)extraout_XMM0_Qa_03 >> 8);
  bStack_ae6 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x10);
  bStack_ae5 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x18);
  bStack_ae4 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x20);
  bStack_ae3 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x28);
  bStack_ae2 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x30);
  bStack_ae1 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x38);
  bStack_ae0 = (byte)extraout_XMM0_Qb_03;
  bStack_adf = (byte)((ulong)extraout_XMM0_Qb_03 >> 8);
  bStack_ade = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x10);
  bStack_add = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x18);
  bStack_adc = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x20);
  bStack_adb = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x28);
  bStack_ada = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x30);
  bStack_ad9 = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x38);
  local_af8 = (byte)extraout_XMM0_Qa_04;
  bStack_af7 = (byte)((ulong)extraout_XMM0_Qa_04 >> 8);
  bStack_af6 = (byte)((ulong)extraout_XMM0_Qa_04 >> 0x10);
  bStack_af5 = (byte)((ulong)extraout_XMM0_Qa_04 >> 0x18);
  bStack_af4 = (byte)((ulong)extraout_XMM0_Qa_04 >> 0x20);
  bStack_af3 = (byte)((ulong)extraout_XMM0_Qa_04 >> 0x28);
  bStack_af2 = (byte)((ulong)extraout_XMM0_Qa_04 >> 0x30);
  bStack_af1 = (byte)((ulong)extraout_XMM0_Qa_04 >> 0x38);
  bStack_af0 = (byte)extraout_XMM0_Qb_04;
  bStack_aef = (byte)((ulong)extraout_XMM0_Qb_04 >> 8);
  bStack_aee = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x10);
  bStack_aed = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x18);
  bStack_aec = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x20);
  bStack_aeb = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x28);
  bStack_aea = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x30);
  bStack_ae9 = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x38);
  local_11a8 = (local_ae8 < local_af8) * local_af8 | (local_ae8 >= local_af8) * local_ae8;
  bStack_11a7 = (bStack_ae7 < bStack_af7) * bStack_af7 | (bStack_ae7 >= bStack_af7) * bStack_ae7;
  bStack_11a6 = (bStack_ae6 < bStack_af6) * bStack_af6 | (bStack_ae6 >= bStack_af6) * bStack_ae6;
  bStack_11a5 = (bStack_ae5 < bStack_af5) * bStack_af5 | (bStack_ae5 >= bStack_af5) * bStack_ae5;
  bStack_11a4 = (bStack_ae4 < bStack_af4) * bStack_af4 | (bStack_ae4 >= bStack_af4) * bStack_ae4;
  bStack_11a3 = (bStack_ae3 < bStack_af3) * bStack_af3 | (bStack_ae3 >= bStack_af3) * bStack_ae3;
  bStack_11a2 = (bStack_ae2 < bStack_af2) * bStack_af2 | (bStack_ae2 >= bStack_af2) * bStack_ae2;
  bStack_11a1 = (bStack_ae1 < bStack_af1) * bStack_af1 | (bStack_ae1 >= bStack_af1) * bStack_ae1;
  bStack_11a0 = (bStack_ae0 < bStack_af0) * bStack_af0 | (bStack_ae0 >= bStack_af0) * bStack_ae0;
  bStack_119f = (bStack_adf < bStack_aef) * bStack_aef | (bStack_adf >= bStack_aef) * bStack_adf;
  bStack_119e = (bStack_ade < bStack_aee) * bStack_aee | (bStack_ade >= bStack_aee) * bStack_ade;
  bStack_119d = (bStack_add < bStack_aed) * bStack_aed | (bStack_add >= bStack_aed) * bStack_add;
  bStack_119c = (bStack_adc < bStack_aec) * bStack_aec | (bStack_adc >= bStack_aec) * bStack_adc;
  bStack_119b = (bStack_adb < bStack_aeb) * bStack_aeb | (bStack_adb >= bStack_aeb) * bStack_adb;
  bStack_119a = (bStack_ada < bStack_aea) * bStack_aea | (bStack_ada >= bStack_aea) * bStack_ada;
  bStack_1199 = (bStack_ad9 < bStack_ae9) * bStack_ae9 | (bStack_ad9 >= bStack_ae9) * bStack_ad9;
  local_b08 = CONCAT17(bStack_11a1,
                       CONCAT16(bStack_11a2,
                                CONCAT15(bStack_11a3,
                                         CONCAT14(bStack_11a4,
                                                  CONCAT13(bStack_11a5,
                                                           CONCAT12(bStack_11a6,
                                                                    CONCAT11(bStack_11a7,local_11a8)
                                                                   ))))));
  uStack_b00 = CONCAT17(bStack_1199,
                        CONCAT16(bStack_119a,
                                 CONCAT15(bStack_119b,
                                          CONCAT14(bStack_119c,
                                                   CONCAT13(bStack_119d,
                                                            CONCAT12(bStack_119e,
                                                                     CONCAT11(bStack_119f,
                                                                              bStack_11a0)))))));
  local_b18 = local_1028;
  uVar75 = local_b18;
  uStack_b10 = uStack_1020;
  uVar76 = uStack_b10;
  local_b18._0_1_ = (byte)local_1028;
  local_b18._1_1_ = local_1028._1_1_;
  local_b18._2_1_ = local_1028._2_1_;
  local_b18._3_1_ = local_1028._3_1_;
  local_b18._4_1_ = local_1028._4_1_;
  local_b18._5_1_ = local_1028._5_1_;
  local_b18._6_1_ = local_1028._6_1_;
  local_b18._7_1_ = local_1028._7_1_;
  uStack_b10._0_1_ = local_1028._8_1_;
  uStack_b10._1_1_ = local_1028._9_1_;
  uStack_b10._2_1_ = local_1028._10_1_;
  uStack_b10._3_1_ = local_1028._11_1_;
  uStack_b10._4_1_ = local_1028._12_1_;
  uStack_b10._5_1_ = local_1028._13_1_;
  uStack_b10._6_1_ = local_1028._14_1_;
  uStack_b10._7_1_ = local_1028._15_1_;
  local_1028._1_1_ =
       (bStack_11a7 < local_b18._1_1_) * local_b18._1_1_ |
       (bStack_11a7 >= local_b18._1_1_) * bStack_11a7;
  local_1028._0_1_ =
       (local_11a8 < (byte)local_b18) * (byte)local_b18 |
       (local_11a8 >= (byte)local_b18) * local_11a8;
  local_1028._2_1_ =
       (bStack_11a6 < local_b18._2_1_) * local_b18._2_1_ |
       (bStack_11a6 >= local_b18._2_1_) * bStack_11a6;
  local_1028._3_1_ =
       (bStack_11a5 < local_b18._3_1_) * local_b18._3_1_ |
       (bStack_11a5 >= local_b18._3_1_) * bStack_11a5;
  local_1028._4_1_ =
       (bStack_11a4 < local_b18._4_1_) * local_b18._4_1_ |
       (bStack_11a4 >= local_b18._4_1_) * bStack_11a4;
  local_1028._5_1_ =
       (bStack_11a3 < local_b18._5_1_) * local_b18._5_1_ |
       (bStack_11a3 >= local_b18._5_1_) * bStack_11a3;
  local_1028._6_1_ =
       (bStack_11a2 < local_b18._6_1_) * local_b18._6_1_ |
       (bStack_11a2 >= local_b18._6_1_) * bStack_11a2;
  local_1028._7_1_ =
       (bStack_11a1 < local_b18._7_1_) * local_b18._7_1_ |
       (bStack_11a1 >= local_b18._7_1_) * bStack_11a1;
  uStack_1020._0_1_ =
       (bStack_11a0 < (byte)uStack_b10) * (byte)uStack_b10 |
       (bStack_11a0 >= (byte)uStack_b10) * bStack_11a0;
  uStack_1020._1_1_ =
       (bStack_119f < uStack_b10._1_1_) * uStack_b10._1_1_ |
       (bStack_119f >= uStack_b10._1_1_) * bStack_119f;
  uStack_1020._2_1_ =
       (bStack_119e < uStack_b10._2_1_) * uStack_b10._2_1_ |
       (bStack_119e >= uStack_b10._2_1_) * bStack_119e;
  uStack_1020._3_1_ =
       (bStack_119d < uStack_b10._3_1_) * uStack_b10._3_1_ |
       (bStack_119d >= uStack_b10._3_1_) * bStack_119d;
  uStack_1020._4_1_ =
       (bStack_119c < uStack_b10._4_1_) * uStack_b10._4_1_ |
       (bStack_119c >= uStack_b10._4_1_) * bStack_119c;
  uStack_1020._5_1_ =
       (bStack_119b < uStack_b10._5_1_) * uStack_b10._5_1_ |
       (bStack_119b >= uStack_b10._5_1_) * bStack_119b;
  uStack_1020._6_1_ =
       (bStack_119a < uStack_b10._6_1_) * uStack_b10._6_1_ |
       (bStack_119a >= uStack_b10._6_1_) * bStack_119a;
  uStack_1020._7_1_ =
       (bStack_1199 < uStack_b10._7_1_) * uStack_b10._7_1_ |
       (bStack_1199 >= uStack_b10._7_1_) * bStack_1199;
  b_03[1] = alVar106[1];
  a_05[1] = in_RSI;
  a_05[0] = (longlong)in_RDI;
  local_b18 = uVar75;
  uStack_b10 = uVar76;
  alVar105 = abs_diff(a_05,b_03);
  b_04[0] = alVar105[1];
  b_04[1] = alVar106[1];
  a_06[1] = in_RSI;
  a_06[0] = (longlong)in_RDI;
  alVar106 = abs_diff(a_06,b_04);
  b_05[0] = alVar106[1];
  local_b28 = (byte)extraout_XMM0_Qa_05;
  bStack_b27 = (byte)((ulong)extraout_XMM0_Qa_05 >> 8);
  bStack_b26 = (byte)((ulong)extraout_XMM0_Qa_05 >> 0x10);
  bStack_b25 = (byte)((ulong)extraout_XMM0_Qa_05 >> 0x18);
  bStack_b24 = (byte)((ulong)extraout_XMM0_Qa_05 >> 0x20);
  bStack_b23 = (byte)((ulong)extraout_XMM0_Qa_05 >> 0x28);
  bStack_b22 = (byte)((ulong)extraout_XMM0_Qa_05 >> 0x30);
  bStack_b21 = (byte)((ulong)extraout_XMM0_Qa_05 >> 0x38);
  bStack_b20 = (byte)extraout_XMM0_Qb_05;
  bStack_b1f = (byte)((ulong)extraout_XMM0_Qb_05 >> 8);
  bStack_b1e = (byte)((ulong)extraout_XMM0_Qb_05 >> 0x10);
  bStack_b1d = (byte)((ulong)extraout_XMM0_Qb_05 >> 0x18);
  bStack_b1c = (byte)((ulong)extraout_XMM0_Qb_05 >> 0x20);
  bStack_b1b = (byte)((ulong)extraout_XMM0_Qb_05 >> 0x28);
  bStack_b1a = (byte)((ulong)extraout_XMM0_Qb_05 >> 0x30);
  bStack_b19 = (byte)((ulong)extraout_XMM0_Qb_05 >> 0x38);
  local_b38 = (byte)extraout_XMM0_Qa_06;
  bStack_b37 = (byte)((ulong)extraout_XMM0_Qa_06 >> 8);
  bStack_b36 = (byte)((ulong)extraout_XMM0_Qa_06 >> 0x10);
  bStack_b35 = (byte)((ulong)extraout_XMM0_Qa_06 >> 0x18);
  bStack_b34 = (byte)((ulong)extraout_XMM0_Qa_06 >> 0x20);
  bStack_b33 = (byte)((ulong)extraout_XMM0_Qa_06 >> 0x28);
  bStack_b32 = (byte)((ulong)extraout_XMM0_Qa_06 >> 0x30);
  bStack_b31 = (byte)((ulong)extraout_XMM0_Qa_06 >> 0x38);
  bStack_b30 = (byte)extraout_XMM0_Qb_06;
  bStack_b2f = (byte)((ulong)extraout_XMM0_Qb_06 >> 8);
  bStack_b2e = (byte)((ulong)extraout_XMM0_Qb_06 >> 0x10);
  bStack_b2d = (byte)((ulong)extraout_XMM0_Qb_06 >> 0x18);
  bStack_b2c = (byte)((ulong)extraout_XMM0_Qb_06 >> 0x20);
  bStack_b2b = (byte)((ulong)extraout_XMM0_Qb_06 >> 0x28);
  bStack_b2a = (byte)((ulong)extraout_XMM0_Qb_06 >> 0x30);
  bStack_b29 = (byte)((ulong)extraout_XMM0_Qb_06 >> 0x38);
  local_11a8 = (local_b28 < local_b38) * local_b38 | (local_b28 >= local_b38) * local_b28;
  bStack_11a7 = (bStack_b27 < bStack_b37) * bStack_b37 | (bStack_b27 >= bStack_b37) * bStack_b27;
  bStack_11a6 = (bStack_b26 < bStack_b36) * bStack_b36 | (bStack_b26 >= bStack_b36) * bStack_b26;
  bStack_11a5 = (bStack_b25 < bStack_b35) * bStack_b35 | (bStack_b25 >= bStack_b35) * bStack_b25;
  bStack_11a4 = (bStack_b24 < bStack_b34) * bStack_b34 | (bStack_b24 >= bStack_b34) * bStack_b24;
  bStack_11a3 = (bStack_b23 < bStack_b33) * bStack_b33 | (bStack_b23 >= bStack_b33) * bStack_b23;
  bStack_11a2 = (bStack_b22 < bStack_b32) * bStack_b32 | (bStack_b22 >= bStack_b32) * bStack_b22;
  bStack_11a1 = (bStack_b21 < bStack_b31) * bStack_b31 | (bStack_b21 >= bStack_b31) * bStack_b21;
  bStack_11a0 = (bStack_b20 < bStack_b30) * bStack_b30 | (bStack_b20 >= bStack_b30) * bStack_b20;
  bStack_119f = (bStack_b1f < bStack_b2f) * bStack_b2f | (bStack_b1f >= bStack_b2f) * bStack_b1f;
  bStack_119e = (bStack_b1e < bStack_b2e) * bStack_b2e | (bStack_b1e >= bStack_b2e) * bStack_b1e;
  bStack_119d = (bStack_b1d < bStack_b2d) * bStack_b2d | (bStack_b1d >= bStack_b2d) * bStack_b1d;
  bStack_119c = (bStack_b1c < bStack_b2c) * bStack_b2c | (bStack_b1c >= bStack_b2c) * bStack_b1c;
  bStack_119b = (bStack_b1b < bStack_b2b) * bStack_b2b | (bStack_b1b >= bStack_b2b) * bStack_b1b;
  bStack_119a = (bStack_b1a < bStack_b2a) * bStack_b2a | (bStack_b1a >= bStack_b2a) * bStack_b1a;
  bStack_1199 = (bStack_b19 < bStack_b29) * bStack_b29 | (bStack_b19 >= bStack_b29) * bStack_b19;
  local_b48 = CONCAT17(bStack_11a1,
                       CONCAT16(bStack_11a2,
                                CONCAT15(bStack_11a3,
                                         CONCAT14(bStack_11a4,
                                                  CONCAT13(bStack_11a5,
                                                           CONCAT12(bStack_11a6,
                                                                    CONCAT11(bStack_11a7,local_11a8)
                                                                   ))))));
  uStack_b40 = CONCAT17(bStack_1199,
                        CONCAT16(bStack_119a,
                                 CONCAT15(bStack_119b,
                                          CONCAT14(bStack_119c,
                                                   CONCAT13(bStack_119d,
                                                            CONCAT12(bStack_119e,
                                                                     CONCAT11(bStack_119f,
                                                                              bStack_11a0)))))));
  local_b58 = local_1028;
  uVar83 = local_b58;
  uStack_b50 = uStack_1020;
  uVar84 = uStack_b50;
  local_b58._0_1_ = (byte)local_1028;
  local_b58._1_1_ = local_1028._1_1_;
  local_b58._2_1_ = local_1028._2_1_;
  local_b58._3_1_ = local_1028._3_1_;
  local_b58._4_1_ = local_1028._4_1_;
  local_b58._5_1_ = local_1028._5_1_;
  local_b58._6_1_ = local_1028._6_1_;
  local_b58._7_1_ = local_1028._7_1_;
  uStack_b50._0_1_ = local_1028._8_1_;
  uStack_b50._1_1_ = local_1028._9_1_;
  uStack_b50._2_1_ = local_1028._10_1_;
  uStack_b50._3_1_ = local_1028._11_1_;
  uStack_b50._4_1_ = local_1028._12_1_;
  uStack_b50._5_1_ = local_1028._13_1_;
  uStack_b50._6_1_ = local_1028._14_1_;
  uStack_b50._7_1_ = local_1028._15_1_;
  local_1028._0_2_ =
       CONCAT11((bStack_11a7 < local_b58._1_1_) * local_b58._1_1_ |
                (bStack_11a7 >= local_b58._1_1_) * bStack_11a7,
                (local_11a8 < (byte)local_b58) * (byte)local_b58 |
                (local_11a8 >= (byte)local_b58) * local_11a8);
  local_1028._0_3_ =
       CONCAT12((bStack_11a6 < local_b58._2_1_) * local_b58._2_1_ |
                (bStack_11a6 >= local_b58._2_1_) * bStack_11a6,(undefined2)local_1028);
  local_1028._0_4_ =
       CONCAT13((bStack_11a5 < local_b58._3_1_) * local_b58._3_1_ |
                (bStack_11a5 >= local_b58._3_1_) * bStack_11a5,(undefined3)local_1028);
  local_1028._0_5_ =
       CONCAT14((bStack_11a4 < local_b58._4_1_) * local_b58._4_1_ |
                (bStack_11a4 >= local_b58._4_1_) * bStack_11a4,(undefined4)local_1028);
  local_1028._0_6_ =
       CONCAT15((bStack_11a3 < local_b58._5_1_) * local_b58._5_1_ |
                (bStack_11a3 >= local_b58._5_1_) * bStack_11a3,(undefined5)local_1028);
  local_1028._0_7_ =
       CONCAT16((bStack_11a2 < local_b58._6_1_) * local_b58._6_1_ |
                (bStack_11a2 >= local_b58._6_1_) * bStack_11a2,(undefined6)local_1028);
  local_1028 = CONCAT17((bStack_11a1 < local_b58._7_1_) * local_b58._7_1_ |
                        (bStack_11a1 >= local_b58._7_1_) * bStack_11a1,(undefined7)local_1028);
  uStack_1020._0_1_ =
       (bStack_11a0 < (byte)uStack_b50) * (byte)uStack_b50 |
       (bStack_11a0 >= (byte)uStack_b50) * bStack_11a0;
  uStack_1020._1_1_ =
       (bStack_119f < uStack_b50._1_1_) * uStack_b50._1_1_ |
       (bStack_119f >= uStack_b50._1_1_) * bStack_119f;
  uStack_1020._2_1_ =
       (bStack_119e < uStack_b50._2_1_) * uStack_b50._2_1_ |
       (bStack_119e >= uStack_b50._2_1_) * bStack_119e;
  uStack_1020._3_1_ =
       (bStack_119d < uStack_b50._3_1_) * uStack_b50._3_1_ |
       (bStack_119d >= uStack_b50._3_1_) * bStack_119d;
  uStack_1020._4_1_ =
       (bStack_119c < uStack_b50._4_1_) * uStack_b50._4_1_ |
       (bStack_119c >= uStack_b50._4_1_) * bStack_119c;
  uStack_1020._5_1_ =
       (bStack_119b < uStack_b50._5_1_) * uStack_b50._5_1_ |
       (bStack_119b >= uStack_b50._5_1_) * bStack_119b;
  uStack_1020._6_1_ =
       (bStack_119a < uStack_b50._6_1_) * uStack_b50._6_1_ |
       (bStack_119a >= uStack_b50._6_1_) * bStack_119a;
  uStack_1020._7_1_ =
       (bStack_1199 < uStack_b50._7_1_) * uStack_b50._7_1_ |
       (bStack_1199 >= uStack_b50._7_1_) * bStack_1199;
  local_848 = local_1028;
  uStack_840 = uStack_1020;
  local_858 = local_1008;
  uStack_850 = uStack_1000;
  auVar48._8_8_ = uStack_1020;
  auVar48._0_8_ = local_1028;
  auVar47._8_8_ = uStack_1000;
  auVar47._0_8_ = local_1008;
  auVar101 = psubusb(auVar48,auVar47);
  local_1028 = auVar101._0_8_;
  uStack_1020 = auVar101._8_8_;
  local_c28 = local_1028;
  uVar77 = local_c28;
  uStack_c20 = uStack_1020;
  uVar78 = uStack_c20;
  local_c38 = local_fd8;
  uVar75 = local_c38;
  uStack_c30 = uStack_fd0;
  uVar76 = uStack_c30;
  local_c28._0_1_ = auVar101[0];
  local_c28._1_1_ = auVar101[1];
  local_c28._2_1_ = auVar101[2];
  local_c28._3_1_ = auVar101[3];
  local_c28._4_1_ = auVar101[4];
  local_c28._5_1_ = auVar101[5];
  local_c28._6_1_ = auVar101[6];
  local_c28._7_1_ = auVar101[7];
  uStack_c20._0_1_ = auVar101[8];
  uStack_c20._1_1_ = auVar101[9];
  uStack_c20._2_1_ = auVar101[10];
  uStack_c20._3_1_ = auVar101[0xb];
  uStack_c20._4_1_ = auVar101[0xc];
  uStack_c20._5_1_ = auVar101[0xd];
  uStack_c20._6_1_ = auVar101[0xe];
  uStack_c20._7_1_ = auVar101[0xf];
  local_c38._0_1_ = (char)local_fd8;
  local_c38._1_1_ = (char)((ulong)local_fd8 >> 8);
  local_c38._2_1_ = (char)((ulong)local_fd8 >> 0x10);
  local_c38._3_1_ = (char)((ulong)local_fd8 >> 0x18);
  local_c38._4_1_ = (char)((ulong)local_fd8 >> 0x20);
  local_c38._5_1_ = (char)((ulong)local_fd8 >> 0x28);
  local_c38._6_1_ = (char)((ulong)local_fd8 >> 0x30);
  local_c38._7_1_ = (char)((ulong)local_fd8 >> 0x38);
  uStack_c30._0_1_ = (char)uStack_fd0;
  uStack_c30._1_1_ = (char)((ulong)uStack_fd0 >> 8);
  uStack_c30._2_1_ = (char)((ulong)uStack_fd0 >> 0x10);
  uStack_c30._3_1_ = (char)((ulong)uStack_fd0 >> 0x18);
  uStack_c30._4_1_ = (char)((ulong)uStack_fd0 >> 0x20);
  uStack_c30._5_1_ = (char)((ulong)uStack_fd0 >> 0x28);
  uStack_c30._6_1_ = (char)((ulong)uStack_fd0 >> 0x30);
  uStack_c30._7_1_ = (char)((ulong)uStack_fd0 >> 0x38);
  local_1028._0_2_ =
       CONCAT11(-(local_c28._1_1_ == local_c38._1_1_),-((char)local_c28 == (char)local_c38));
  local_1028._0_3_ = CONCAT12(-(local_c28._2_1_ == local_c38._2_1_),(undefined2)local_1028);
  local_1028._0_4_ = CONCAT13(-(local_c28._3_1_ == local_c38._3_1_),(undefined3)local_1028);
  local_1028._0_5_ = CONCAT14(-(local_c28._4_1_ == local_c38._4_1_),(undefined4)local_1028);
  local_1028._0_6_ = CONCAT15(-(local_c28._5_1_ == local_c38._5_1_),(undefined5)local_1028);
  local_1028._0_7_ = CONCAT16(-(local_c28._6_1_ == local_c38._6_1_),(undefined6)local_1028);
  local_1028 = CONCAT17(-(local_c28._7_1_ == local_c38._7_1_),(undefined7)local_1028);
  uStack_1020._0_1_ = -((char)uStack_c20 == (char)uStack_c30);
  uStack_1020._1_1_ = -(uStack_c20._1_1_ == uStack_c30._1_1_);
  uStack_1020._2_1_ = -(uStack_c20._2_1_ == uStack_c30._2_1_);
  uStack_1020._3_1_ = -(uStack_c20._3_1_ == uStack_c30._3_1_);
  uStack_1020._4_1_ = -(uStack_c20._4_1_ == uStack_c30._4_1_);
  uStack_1020._5_1_ = -(uStack_c20._5_1_ == uStack_c30._5_1_);
  uStack_1020._6_1_ = -(uStack_c20._6_1_ == uStack_c30._6_1_);
  uStack_1020._7_1_ = -(uStack_c20._7_1_ == uStack_c30._7_1_);
  local_c48 = local_1028;
  uStack_c40 = uStack_1020;
  local_c58 = local_fd8;
  uStack_c50 = uStack_fd0;
  local_6c8 = -(-((char)local_c28 == (char)local_c38) == (char)local_c38);
  cStack_6c7 = -(-(local_c28._1_1_ == local_c38._1_1_) == local_c38._1_1_);
  cStack_6c6 = -(-(local_c28._2_1_ == local_c38._2_1_) == local_c38._2_1_);
  cStack_6c5 = -(-(local_c28._3_1_ == local_c38._3_1_) == local_c38._3_1_);
  cStack_6c4 = -(-(local_c28._4_1_ == local_c38._4_1_) == local_c38._4_1_);
  cStack_6c3 = -(-(local_c28._5_1_ == local_c38._5_1_) == local_c38._5_1_);
  cStack_6c2 = -(-(local_c28._6_1_ == local_c38._6_1_) == local_c38._6_1_);
  cStack_6c1 = -(-(local_c28._7_1_ == local_c38._7_1_) == local_c38._7_1_);
  cStack_6c0 = -(-((char)uStack_c20 == (char)uStack_c30) == (char)uStack_c30);
  cStack_6bf = -(-(uStack_c20._1_1_ == uStack_c30._1_1_) == uStack_c30._1_1_);
  cStack_6be = -(-(uStack_c20._2_1_ == uStack_c30._2_1_) == uStack_c30._2_1_);
  cStack_6bd = -(-(uStack_c20._3_1_ == uStack_c30._3_1_) == uStack_c30._3_1_);
  cStack_6bc = -(-(uStack_c20._4_1_ == uStack_c30._4_1_) == uStack_c30._4_1_);
  cStack_6bb = -(-(uStack_c20._5_1_ == uStack_c30._5_1_) == uStack_c30._5_1_);
  cStack_6ba = -(-(uStack_c20._6_1_ == uStack_c30._6_1_) == uStack_c30._6_1_);
  bStack_6b9 = -(-(uStack_c20._7_1_ == uStack_c30._7_1_) == uStack_c30._7_1_);
  auVar51[1] = cStack_6c7;
  auVar51[0] = local_6c8;
  auVar51[2] = cStack_6c6;
  auVar51[3] = cStack_6c5;
  auVar51[4] = cStack_6c4;
  auVar51[5] = cStack_6c3;
  auVar51[6] = cStack_6c2;
  auVar51[7] = cStack_6c1;
  auVar51[8] = cStack_6c0;
  auVar51[9] = cStack_6bf;
  auVar51[10] = cStack_6be;
  auVar51[0xb] = cStack_6bd;
  auVar51[0xc] = cStack_6bc;
  auVar51[0xd] = cStack_6bb;
  auVar51[0xe] = cStack_6ba;
  auVar51[0xf] = bStack_6b9;
  uVar1 = (ushort)(SUB161(auVar51 >> 7,0) & 1) | (ushort)(SUB161(auVar51 >> 0xf,0) & 1) << 1 |
          (ushort)(SUB161(auVar51 >> 0x17,0) & 1) << 2 |
          (ushort)(SUB161(auVar51 >> 0x1f,0) & 1) << 3 |
          (ushort)(SUB161(auVar51 >> 0x27,0) & 1) << 4 |
          (ushort)(SUB161(auVar51 >> 0x2f,0) & 1) << 5 |
          (ushort)(SUB161(auVar51 >> 0x37,0) & 1) << 6 |
          (ushort)(SUB161(auVar51 >> 0x3f,0) & 1) << 7 |
          (ushort)(SUB161(auVar51 >> 0x47,0) & 1) << 8 |
          (ushort)(SUB161(auVar51 >> 0x4f,0) & 1) << 9 |
          (ushort)(SUB161(auVar51 >> 0x57,0) & 1) << 10 |
          (ushort)(SUB161(auVar51 >> 0x5f,0) & 1) << 0xb |
          (ushort)(SUB161(auVar51 >> 0x67,0) & 1) << 0xc |
          (ushort)(SUB161(auVar51 >> 0x6f,0) & 1) << 0xd |
          (ushort)(SUB161(auVar51 >> 0x77,0) & 1) << 0xe | (ushort)(bStack_6b9 >> 7) << 0xf;
  if (uVar1 != 0xffff) {
    b_05[1]._0_2_ = uVar1;
    b_05[1]._2_6_ = 0;
    uVar99 = (ulong)uVar1;
    a_07[1] = in_RSI;
    a_07[0] = (longlong)in_RDI;
    local_c38 = uVar75;
    uStack_c30 = uVar76;
    local_c28 = uVar77;
    uStack_c20 = uVar78;
    local_b58 = uVar83;
    uStack_b50 = uVar84;
    alVar106 = abs_diff(a_07,b_05);
    b_06[0] = alVar106[1];
    b_06[1] = uVar99;
    a_08[1] = in_RSI;
    a_08[0] = (longlong)in_RDI;
    alVar106 = abs_diff(a_08,b_06);
    b_07[0] = alVar106[1];
    local_b68 = (byte)extraout_XMM0_Qa_07;
    bStack_b67 = (byte)((ulong)extraout_XMM0_Qa_07 >> 8);
    bStack_b66 = (byte)((ulong)extraout_XMM0_Qa_07 >> 0x10);
    bStack_b65 = (byte)((ulong)extraout_XMM0_Qa_07 >> 0x18);
    bStack_b64 = (byte)((ulong)extraout_XMM0_Qa_07 >> 0x20);
    bStack_b63 = (byte)((ulong)extraout_XMM0_Qa_07 >> 0x28);
    bStack_b62 = (byte)((ulong)extraout_XMM0_Qa_07 >> 0x30);
    bStack_b61 = (byte)((ulong)extraout_XMM0_Qa_07 >> 0x38);
    bStack_b60 = (byte)extraout_XMM0_Qb_07;
    bStack_b5f = (byte)((ulong)extraout_XMM0_Qb_07 >> 8);
    bStack_b5e = (byte)((ulong)extraout_XMM0_Qb_07 >> 0x10);
    bStack_b5d = (byte)((ulong)extraout_XMM0_Qb_07 >> 0x18);
    bStack_b5c = (byte)((ulong)extraout_XMM0_Qb_07 >> 0x20);
    bStack_b5b = (byte)((ulong)extraout_XMM0_Qb_07 >> 0x28);
    bStack_b5a = (byte)((ulong)extraout_XMM0_Qb_07 >> 0x30);
    bStack_b59 = (byte)((ulong)extraout_XMM0_Qb_07 >> 0x38);
    local_b78 = (byte)extraout_XMM0_Qa_08;
    bStack_b77 = (byte)((ulong)extraout_XMM0_Qa_08 >> 8);
    bStack_b76 = (byte)((ulong)extraout_XMM0_Qa_08 >> 0x10);
    bStack_b75 = (byte)((ulong)extraout_XMM0_Qa_08 >> 0x18);
    bStack_b74 = (byte)((ulong)extraout_XMM0_Qa_08 >> 0x20);
    bStack_b73 = (byte)((ulong)extraout_XMM0_Qa_08 >> 0x28);
    bStack_b72 = (byte)((ulong)extraout_XMM0_Qa_08 >> 0x30);
    bStack_b71 = (byte)((ulong)extraout_XMM0_Qa_08 >> 0x38);
    bStack_b70 = (byte)extraout_XMM0_Qb_08;
    bStack_b6f = (byte)((ulong)extraout_XMM0_Qb_08 >> 8);
    bStack_b6e = (byte)((ulong)extraout_XMM0_Qb_08 >> 0x10);
    bStack_b6d = (byte)((ulong)extraout_XMM0_Qb_08 >> 0x18);
    bStack_b6c = (byte)((ulong)extraout_XMM0_Qb_08 >> 0x20);
    bStack_b6b = (byte)((ulong)extraout_XMM0_Qb_08 >> 0x28);
    bStack_b6a = (byte)((ulong)extraout_XMM0_Qb_08 >> 0x30);
    bStack_b69 = (byte)((ulong)extraout_XMM0_Qb_08 >> 0x38);
    local_11b8 = (local_b68 < local_b78) * local_b78 | (local_b68 >= local_b78) * local_b68;
    bStack_11b7 = (bStack_b67 < bStack_b77) * bStack_b77 | (bStack_b67 >= bStack_b77) * bStack_b67;
    bStack_11b6 = (bStack_b66 < bStack_b76) * bStack_b76 | (bStack_b66 >= bStack_b76) * bStack_b66;
    bStack_11b5 = (bStack_b65 < bStack_b75) * bStack_b75 | (bStack_b65 >= bStack_b75) * bStack_b65;
    bStack_11b4 = (bStack_b64 < bStack_b74) * bStack_b74 | (bStack_b64 >= bStack_b74) * bStack_b64;
    bStack_11b3 = (bStack_b63 < bStack_b73) * bStack_b73 | (bStack_b63 >= bStack_b73) * bStack_b63;
    bStack_11b2 = (bStack_b62 < bStack_b72) * bStack_b72 | (bStack_b62 >= bStack_b72) * bStack_b62;
    bStack_11b1 = (bStack_b61 < bStack_b71) * bStack_b71 | (bStack_b61 >= bStack_b71) * bStack_b61;
    bStack_11b0 = (bStack_b60 < bStack_b70) * bStack_b70 | (bStack_b60 >= bStack_b70) * bStack_b60;
    bStack_11af = (bStack_b5f < bStack_b6f) * bStack_b6f | (bStack_b5f >= bStack_b6f) * bStack_b5f;
    bStack_11ae = (bStack_b5e < bStack_b6e) * bStack_b6e | (bStack_b5e >= bStack_b6e) * bStack_b5e;
    bStack_11ad = (bStack_b5d < bStack_b6d) * bStack_b6d | (bStack_b5d >= bStack_b6d) * bStack_b5d;
    bStack_11ac = (bStack_b5c < bStack_b6c) * bStack_b6c | (bStack_b5c >= bStack_b6c) * bStack_b5c;
    bStack_11ab = (bStack_b5b < bStack_b6b) * bStack_b6b | (bStack_b5b >= bStack_b6b) * bStack_b5b;
    bStack_11aa = (bStack_b5a < bStack_b6a) * bStack_b6a | (bStack_b5a >= bStack_b6a) * bStack_b5a;
    bStack_11a9 = (bStack_b59 < bStack_b69) * bStack_b69 | (bStack_b59 >= bStack_b69) * bStack_b59;
    local_b88 = CONCAT17(bStack_11b1,
                         CONCAT16(bStack_11b2,
                                  CONCAT15(bStack_11b3,
                                           CONCAT14(bStack_11b4,
                                                    CONCAT13(bStack_11b5,
                                                             CONCAT12(bStack_11b6,
                                                                      CONCAT11(bStack_11b7,
                                                                               local_11b8)))))));
    uStack_b80 = CONCAT17(bStack_11a9,
                          CONCAT16(bStack_11aa,
                                   CONCAT15(bStack_11ab,
                                            CONCAT14(bStack_11ac,
                                                     CONCAT13(bStack_11ad,
                                                              CONCAT12(bStack_11ae,
                                                                       CONCAT11(bStack_11af,
                                                                                bStack_11b0)))))));
    local_b98 = CONCAT17(bStack_1131,
                         CONCAT16(bStack_1132,
                                  CONCAT15(bStack_1133,
                                           CONCAT14(bStack_1134,
                                                    CONCAT13(bStack_1135,
                                                             CONCAT12(bStack_1136,
                                                                      CONCAT11(bStack_1137,
                                                                               local_1138)))))));
    uStack_b90 = CONCAT17(bStack_1129,
                          CONCAT16(bStack_112a,
                                   CONCAT15(bStack_112b,
                                            CONCAT14(bStack_112c,
                                                     CONCAT13(bStack_112d,
                                                              CONCAT12(bStack_112e,
                                                                       CONCAT11(bStack_112f,
                                                                                bStack_1130)))))));
    local_1048._1_1_ =
         (bStack_11b7 < bStack_1137) * bStack_1137 | (bStack_11b7 >= bStack_1137) * bStack_11b7;
    local_1048._0_1_ =
         (local_11b8 < local_1138) * local_1138 | (local_11b8 >= local_1138) * local_11b8;
    local_1048._2_1_ =
         (bStack_11b6 < bStack_1136) * bStack_1136 | (bStack_11b6 >= bStack_1136) * bStack_11b6;
    local_1048._3_1_ =
         (bStack_11b5 < bStack_1135) * bStack_1135 | (bStack_11b5 >= bStack_1135) * bStack_11b5;
    local_1048._4_1_ =
         (bStack_11b4 < bStack_1134) * bStack_1134 | (bStack_11b4 >= bStack_1134) * bStack_11b4;
    local_1048._5_1_ =
         (bStack_11b3 < bStack_1133) * bStack_1133 | (bStack_11b3 >= bStack_1133) * bStack_11b3;
    local_1048._6_1_ =
         (bStack_11b2 < bStack_1132) * bStack_1132 | (bStack_11b2 >= bStack_1132) * bStack_11b2;
    local_1048._7_1_ =
         (bStack_11b1 < bStack_1131) * bStack_1131 | (bStack_11b1 >= bStack_1131) * bStack_11b1;
    uStack_1040._0_1_ =
         (bStack_11b0 < bStack_1130) * bStack_1130 | (bStack_11b0 >= bStack_1130) * bStack_11b0;
    uStack_1040._1_1_ =
         (bStack_11af < bStack_112f) * bStack_112f | (bStack_11af >= bStack_112f) * bStack_11af;
    uStack_1040._2_1_ =
         (bStack_11ae < bStack_112e) * bStack_112e | (bStack_11ae >= bStack_112e) * bStack_11ae;
    uStack_1040._3_1_ =
         (bStack_11ad < bStack_112d) * bStack_112d | (bStack_11ad >= bStack_112d) * bStack_11ad;
    uStack_1040._4_1_ =
         (bStack_11ac < bStack_112c) * bStack_112c | (bStack_11ac >= bStack_112c) * bStack_11ac;
    uStack_1040._5_1_ =
         (bStack_11ab < bStack_112b) * bStack_112b | (bStack_11ab >= bStack_112b) * bStack_11ab;
    uStack_1040._6_1_ =
         (bStack_11aa < bStack_112a) * bStack_112a | (bStack_11aa >= bStack_112a) * bStack_11aa;
    uStack_1040._7_1_ =
         (bStack_11a9 < bStack_1129) * bStack_1129 | (bStack_11a9 >= bStack_1129) * bStack_11a9;
    b_07[1] = uVar99;
    a_09[1] = in_RSI;
    a_09[0] = (longlong)in_RDI;
    alVar106 = abs_diff(a_09,b_07);
    b_08[0] = alVar106[1];
    b_08[1] = uVar99;
    a_10[1] = in_RSI;
    a_10[0] = (longlong)in_RDI;
    abs_diff(a_10,b_08);
    local_ba8 = (byte)extraout_XMM0_Qa_09;
    bStack_ba7 = (byte)((ulong)extraout_XMM0_Qa_09 >> 8);
    bStack_ba6 = (byte)((ulong)extraout_XMM0_Qa_09 >> 0x10);
    bStack_ba5 = (byte)((ulong)extraout_XMM0_Qa_09 >> 0x18);
    bStack_ba4 = (byte)((ulong)extraout_XMM0_Qa_09 >> 0x20);
    bStack_ba3 = (byte)((ulong)extraout_XMM0_Qa_09 >> 0x28);
    bStack_ba2 = (byte)((ulong)extraout_XMM0_Qa_09 >> 0x30);
    bStack_ba1 = (byte)((ulong)extraout_XMM0_Qa_09 >> 0x38);
    bStack_ba0 = (byte)extraout_XMM0_Qb_09;
    bStack_b9f = (byte)((ulong)extraout_XMM0_Qb_09 >> 8);
    bStack_b9e = (byte)((ulong)extraout_XMM0_Qb_09 >> 0x10);
    bStack_b9d = (byte)((ulong)extraout_XMM0_Qb_09 >> 0x18);
    bStack_b9c = (byte)((ulong)extraout_XMM0_Qb_09 >> 0x20);
    bStack_b9b = (byte)((ulong)extraout_XMM0_Qb_09 >> 0x28);
    bStack_b9a = (byte)((ulong)extraout_XMM0_Qb_09 >> 0x30);
    bStack_b99 = (byte)((ulong)extraout_XMM0_Qb_09 >> 0x38);
    local_bb8 = (byte)extraout_XMM0_Qa_10;
    bStack_bb7 = (byte)((ulong)extraout_XMM0_Qa_10 >> 8);
    bStack_bb6 = (byte)((ulong)extraout_XMM0_Qa_10 >> 0x10);
    bStack_bb5 = (byte)((ulong)extraout_XMM0_Qa_10 >> 0x18);
    bStack_bb4 = (byte)((ulong)extraout_XMM0_Qa_10 >> 0x20);
    bStack_bb3 = (byte)((ulong)extraout_XMM0_Qa_10 >> 0x28);
    bStack_bb2 = (byte)((ulong)extraout_XMM0_Qa_10 >> 0x30);
    bStack_bb1 = (byte)((ulong)extraout_XMM0_Qa_10 >> 0x38);
    bStack_bb0 = (byte)extraout_XMM0_Qb_10;
    bStack_baf = (byte)((ulong)extraout_XMM0_Qb_10 >> 8);
    bStack_bae = (byte)((ulong)extraout_XMM0_Qb_10 >> 0x10);
    bStack_bad = (byte)((ulong)extraout_XMM0_Qb_10 >> 0x18);
    bStack_bac = (byte)((ulong)extraout_XMM0_Qb_10 >> 0x20);
    bStack_bab = (byte)((ulong)extraout_XMM0_Qb_10 >> 0x28);
    bStack_baa = (byte)((ulong)extraout_XMM0_Qb_10 >> 0x30);
    bStack_ba9 = (byte)((ulong)extraout_XMM0_Qb_10 >> 0x38);
    local_11b8 = (local_ba8 < local_bb8) * local_bb8 | (local_ba8 >= local_bb8) * local_ba8;
    bStack_11b7 = (bStack_ba7 < bStack_bb7) * bStack_bb7 | (bStack_ba7 >= bStack_bb7) * bStack_ba7;
    bStack_11b6 = (bStack_ba6 < bStack_bb6) * bStack_bb6 | (bStack_ba6 >= bStack_bb6) * bStack_ba6;
    bStack_11b5 = (bStack_ba5 < bStack_bb5) * bStack_bb5 | (bStack_ba5 >= bStack_bb5) * bStack_ba5;
    bStack_11b4 = (bStack_ba4 < bStack_bb4) * bStack_bb4 | (bStack_ba4 >= bStack_bb4) * bStack_ba4;
    bStack_11b3 = (bStack_ba3 < bStack_bb3) * bStack_bb3 | (bStack_ba3 >= bStack_bb3) * bStack_ba3;
    bStack_11b2 = (bStack_ba2 < bStack_bb2) * bStack_bb2 | (bStack_ba2 >= bStack_bb2) * bStack_ba2;
    bStack_11b1 = (bStack_ba1 < bStack_bb1) * bStack_bb1 | (bStack_ba1 >= bStack_bb1) * bStack_ba1;
    bStack_11b0 = (bStack_ba0 < bStack_bb0) * bStack_bb0 | (bStack_ba0 >= bStack_bb0) * bStack_ba0;
    bStack_11af = (bStack_b9f < bStack_baf) * bStack_baf | (bStack_b9f >= bStack_baf) * bStack_b9f;
    bStack_11ae = (bStack_b9e < bStack_bae) * bStack_bae | (bStack_b9e >= bStack_bae) * bStack_b9e;
    bStack_11ad = (bStack_b9d < bStack_bad) * bStack_bad | (bStack_b9d >= bStack_bad) * bStack_b9d;
    bStack_11ac = (bStack_b9c < bStack_bac) * bStack_bac | (bStack_b9c >= bStack_bac) * bStack_b9c;
    bStack_11ab = (bStack_b9b < bStack_bab) * bStack_bab | (bStack_b9b >= bStack_bab) * bStack_b9b;
    bStack_11aa = (bStack_b9a < bStack_baa) * bStack_baa | (bStack_b9a >= bStack_baa) * bStack_b9a;
    bStack_11a9 = (bStack_b99 < bStack_ba9) * bStack_ba9 | (bStack_b99 >= bStack_ba9) * bStack_b99;
    local_bc8 = CONCAT17(bStack_11b1,
                         CONCAT16(bStack_11b2,
                                  CONCAT15(bStack_11b3,
                                           CONCAT14(bStack_11b4,
                                                    CONCAT13(bStack_11b5,
                                                             CONCAT12(bStack_11b6,
                                                                      CONCAT11(bStack_11b7,
                                                                               local_11b8)))))));
    uStack_bc0 = CONCAT17(bStack_11a9,
                          CONCAT16(bStack_11aa,
                                   CONCAT15(bStack_11ab,
                                            CONCAT14(bStack_11ac,
                                                     CONCAT13(bStack_11ad,
                                                              CONCAT12(bStack_11ae,
                                                                       CONCAT11(bStack_11af,
                                                                                bStack_11b0)))))));
    local_bd8 = local_1048;
    lVar81 = local_bd8;
    uStack_bd0 = uStack_1040;
    lVar82 = uStack_bd0;
    local_bd8._0_1_ = (byte)local_1048;
    local_bd8._1_1_ = local_1048._1_1_;
    local_bd8._2_1_ = local_1048._2_1_;
    local_bd8._3_1_ = local_1048._3_1_;
    local_bd8._4_1_ = local_1048._4_1_;
    local_bd8._5_1_ = local_1048._5_1_;
    local_bd8._6_1_ = local_1048._6_1_;
    local_bd8._7_1_ = local_1048._7_1_;
    uStack_bd0._0_1_ = local_1048._8_1_;
    uStack_bd0._1_1_ = local_1048._9_1_;
    uStack_bd0._2_1_ = local_1048._10_1_;
    uStack_bd0._3_1_ = local_1048._11_1_;
    uStack_bd0._4_1_ = local_1048._12_1_;
    uStack_bd0._5_1_ = local_1048._13_1_;
    uStack_bd0._6_1_ = local_1048._14_1_;
    uStack_bd0._7_1_ = local_1048._15_1_;
    local_1048._0_2_ =
         CONCAT11((bStack_11b7 < local_bd8._1_1_) * local_bd8._1_1_ |
                  (bStack_11b7 >= local_bd8._1_1_) * bStack_11b7,
                  (local_11b8 < (byte)local_bd8) * (byte)local_bd8 |
                  (local_11b8 >= (byte)local_bd8) * local_11b8);
    local_1048._0_3_ =
         CONCAT12((bStack_11b6 < local_bd8._2_1_) * local_bd8._2_1_ |
                  (bStack_11b6 >= local_bd8._2_1_) * bStack_11b6,(undefined2)local_1048);
    local_1048._0_4_ =
         CONCAT13((bStack_11b5 < local_bd8._3_1_) * local_bd8._3_1_ |
                  (bStack_11b5 >= local_bd8._3_1_) * bStack_11b5,(undefined3)local_1048);
    local_1048._0_5_ =
         CONCAT14((bStack_11b4 < local_bd8._4_1_) * local_bd8._4_1_ |
                  (bStack_11b4 >= local_bd8._4_1_) * bStack_11b4,(undefined4)local_1048);
    local_1048._0_6_ =
         CONCAT15((bStack_11b3 < local_bd8._5_1_) * local_bd8._5_1_ |
                  (bStack_11b3 >= local_bd8._5_1_) * bStack_11b3,(undefined5)local_1048);
    local_1048._0_7_ =
         CONCAT16((bStack_11b2 < local_bd8._6_1_) * local_bd8._6_1_ |
                  (bStack_11b2 >= local_bd8._6_1_) * bStack_11b2,(undefined6)local_1048);
    local_1048 = CONCAT17((bStack_11b1 < local_bd8._7_1_) * local_bd8._7_1_ |
                          (bStack_11b1 >= local_bd8._7_1_) * bStack_11b1,(undefined7)local_1048);
    uStack_1040._0_1_ =
         (bStack_11b0 < (byte)uStack_bd0) * (byte)uStack_bd0 |
         (bStack_11b0 >= (byte)uStack_bd0) * bStack_11b0;
    uStack_1040._1_1_ =
         (bStack_11af < uStack_bd0._1_1_) * uStack_bd0._1_1_ |
         (bStack_11af >= uStack_bd0._1_1_) * bStack_11af;
    uStack_1040._2_1_ =
         (bStack_11ae < uStack_bd0._2_1_) * uStack_bd0._2_1_ |
         (bStack_11ae >= uStack_bd0._2_1_) * bStack_11ae;
    uStack_1040._3_1_ =
         (bStack_11ad < uStack_bd0._3_1_) * uStack_bd0._3_1_ |
         (bStack_11ad >= uStack_bd0._3_1_) * bStack_11ad;
    uStack_1040._4_1_ =
         (bStack_11ac < uStack_bd0._4_1_) * uStack_bd0._4_1_ |
         (bStack_11ac >= uStack_bd0._4_1_) * bStack_11ac;
    uStack_1040._5_1_ =
         (bStack_11ab < uStack_bd0._5_1_) * uStack_bd0._5_1_ |
         (bStack_11ab >= uStack_bd0._5_1_) * bStack_11ab;
    uStack_1040._6_1_ =
         (bStack_11aa < uStack_bd0._6_1_) * uStack_bd0._6_1_ |
         (bStack_11aa >= uStack_bd0._6_1_) * bStack_11aa;
    uStack_1040._7_1_ =
         (bStack_11a9 < uStack_bd0._7_1_) * uStack_bd0._7_1_ |
         (bStack_11a9 >= uStack_bd0._7_1_) * bStack_11a9;
    local_868 = local_1048;
    lStack_860 = uStack_1040;
    local_878 = local_fe8;
    uStack_870 = uStack_fe0;
    auVar46._8_8_ = uStack_1040;
    auVar46._0_8_ = local_1048;
    auVar45._8_8_ = uStack_fe0;
    auVar45._0_8_ = local_fe8;
    auVar101 = psubusb(auVar46,auVar45);
    local_1048 = auVar101._0_8_;
    uStack_1040 = auVar101._8_8_;
    local_c68 = local_1048;
    lVar79 = local_c68;
    uStack_c60 = uStack_1040;
    lVar80 = uStack_c60;
    local_c78 = local_fd8;
    uVar77 = local_c78;
    uStack_c70 = uStack_fd0;
    uVar78 = uStack_c70;
    local_c68._0_1_ = auVar101[0];
    local_c68._1_1_ = auVar101[1];
    local_c68._2_1_ = auVar101[2];
    local_c68._3_1_ = auVar101[3];
    local_c68._4_1_ = auVar101[4];
    local_c68._5_1_ = auVar101[5];
    local_c68._6_1_ = auVar101[6];
    local_c68._7_1_ = auVar101[7];
    uStack_c60._0_1_ = auVar101[8];
    uStack_c60._1_1_ = auVar101[9];
    uStack_c60._2_1_ = auVar101[10];
    uStack_c60._3_1_ = auVar101[0xb];
    uStack_c60._4_1_ = auVar101[0xc];
    uStack_c60._5_1_ = auVar101[0xd];
    uStack_c60._6_1_ = auVar101[0xe];
    uStack_c60._7_1_ = auVar101[0xf];
    local_c78._0_1_ = (char)local_fd8;
    local_c78._1_1_ = (char)((ulong)local_fd8 >> 8);
    local_c78._2_1_ = (char)((ulong)local_fd8 >> 0x10);
    local_c78._3_1_ = (char)((ulong)local_fd8 >> 0x18);
    local_c78._4_1_ = (char)((ulong)local_fd8 >> 0x20);
    local_c78._5_1_ = (char)((ulong)local_fd8 >> 0x28);
    local_c78._6_1_ = (char)((ulong)local_fd8 >> 0x30);
    local_c78._7_1_ = (char)((ulong)local_fd8 >> 0x38);
    uStack_c70._0_1_ = (char)uStack_fd0;
    uStack_c70._1_1_ = (char)((ulong)uStack_fd0 >> 8);
    uStack_c70._2_1_ = (char)((ulong)uStack_fd0 >> 0x10);
    uStack_c70._3_1_ = (char)((ulong)uStack_fd0 >> 0x18);
    uStack_c70._4_1_ = (char)((ulong)uStack_fd0 >> 0x20);
    uStack_c70._5_1_ = (char)((ulong)uStack_fd0 >> 0x28);
    uStack_c70._6_1_ = (char)((ulong)uStack_fd0 >> 0x30);
    uStack_c70._7_1_ = (char)((ulong)uStack_fd0 >> 0x38);
    local_1048._0_2_ =
         CONCAT11(-(local_c68._1_1_ == local_c78._1_1_),-((char)local_c68 == (char)local_c78));
    local_1048._0_3_ = CONCAT12(-(local_c68._2_1_ == local_c78._2_1_),(undefined2)local_1048);
    local_1048._0_4_ = CONCAT13(-(local_c68._3_1_ == local_c78._3_1_),(undefined3)local_1048);
    local_1048._0_5_ = CONCAT14(-(local_c68._4_1_ == local_c78._4_1_),(undefined4)local_1048);
    local_1048._0_6_ = CONCAT15(-(local_c68._5_1_ == local_c78._5_1_),(undefined5)local_1048);
    local_1048._0_7_ = CONCAT16(-(local_c68._6_1_ == local_c78._6_1_),(undefined6)local_1048);
    local_1048 = CONCAT17(-(local_c68._7_1_ == local_c78._7_1_),(undefined7)local_1048);
    uStack_1040._0_1_ = -((char)uStack_c60 == (char)uStack_c70);
    uStack_1040._1_1_ = -(uStack_c60._1_1_ == uStack_c70._1_1_);
    uStack_1040._2_1_ = -(uStack_c60._2_1_ == uStack_c70._2_1_);
    uStack_1040._3_1_ = -(uStack_c60._3_1_ == uStack_c70._3_1_);
    uStack_1040._4_1_ = -(uStack_c60._4_1_ == uStack_c70._4_1_);
    uStack_1040._5_1_ = -(uStack_c60._5_1_ == uStack_c70._5_1_);
    uStack_1040._6_1_ = -(uStack_c60._6_1_ == uStack_c70._6_1_);
    uStack_1040._7_1_ = -(uStack_c60._7_1_ == uStack_c70._7_1_);
    local_8c8 = local_1048;
    uStack_8c0 = uStack_1040;
    local_8d8 = local_1028;
    uStack_8d0 = uStack_1020;
    local_1048 = local_1048 & local_1028;
    uStack_1040 = uStack_1040 & uStack_1020;
    local_cdb = 4;
    local_e9 = 4;
    local_ea = 4;
    local_eb = 4;
    local_ec = 4;
    local_ed = 4;
    local_ee = 4;
    local_ef = 4;
    local_f0 = 4;
    local_f1 = 4;
    local_f2 = 4;
    local_f3 = 4;
    local_f4 = 4;
    local_f5 = 4;
    local_f6 = 4;
    local_f7 = 4;
    local_f8 = 4;
    local_11c8 = 0x404040404040404;
    uStack_11c0 = 0x404040404040404;
    local_cdc = 3;
    local_c9 = 3;
    local_ca = 3;
    local_cb = 3;
    local_cc = 3;
    local_cd = 3;
    local_ce = 3;
    local_cf = 3;
    local_d0 = 3;
    local_d1 = 3;
    local_d2 = 3;
    local_d3 = 3;
    local_d4 = 3;
    local_d5 = 3;
    local_d6 = 3;
    local_d7 = 3;
    local_d8 = 3;
    local_11d8 = 0x303030303030303;
    uStack_11d0 = 0x303030303030303;
    local_cdd = 0x80;
    local_a9 = 0x80;
    local_aa = 0x80;
    local_ab = 0x80;
    local_ac = 0x80;
    local_ad = 0x80;
    local_ae = 0x80;
    local_af = 0x80;
    local_b0 = 0x80;
    local_b1 = 0x80;
    local_b2 = 0x80;
    local_b3 = 0x80;
    local_b4 = 0x80;
    local_b5 = 0x80;
    local_b6 = 0x80;
    local_b7 = 0x80;
    local_b8 = 0x80;
    local_11e8 = 0x8080808080808080;
    uStack_11e0 = 0x8080808080808080;
    local_cde = 0xe0;
    local_89 = 0xe0;
    local_8a = 0xe0;
    local_8b = 0xe0;
    local_8c = 0xe0;
    local_8d = 0xe0;
    local_8e = 0xe0;
    local_8f = 0xe0;
    local_90 = 0xe0;
    local_91 = 0xe0;
    local_92 = 0xe0;
    local_93 = 0xe0;
    local_94 = 0xe0;
    local_95 = 0xe0;
    local_96 = 0xe0;
    local_97 = 0xe0;
    local_98 = 0xe0;
    local_11f8 = 0xe0e0e0e0e0e0e0e0;
    uStack_11f0 = 0xe0e0e0e0e0e0e0e0;
    local_cdf = 0x1f;
    local_69 = 0x1f;
    local_6a = 0x1f;
    local_6b = 0x1f;
    local_6c = 0x1f;
    local_6d = 0x1f;
    local_6e = 0x1f;
    local_6f = 0x1f;
    local_70 = 0x1f;
    local_71 = 0x1f;
    local_72 = 0x1f;
    local_73 = 0x1f;
    local_74 = 0x1f;
    local_75 = 0x1f;
    local_76 = 0x1f;
    local_77 = 0x1f;
    local_78 = 0x1f;
    local_1208 = 0x1f1f1f1f1f1f1f1f;
    uStack_1200 = 0x1f1f1f1f1f1f1f1f;
    local_ce0 = 1;
    local_49 = 1;
    local_4a = 1;
    local_4b = 1;
    local_4c = 1;
    local_4d = 1;
    local_4e = 1;
    local_4f = 1;
    local_50 = 1;
    local_51 = 1;
    local_52 = 1;
    local_53 = 1;
    local_54 = 1;
    local_55 = 1;
    local_56 = 1;
    local_57 = 1;
    local_58 = 1;
    local_1218 = 0x101010101010101;
    uStack_1210 = 0x101010101010101;
    local_ce1 = 0x7f;
    local_29 = 0x7f;
    local_2a = 0x7f;
    local_2b = 0x7f;
    local_2c = 0x7f;
    local_2d = 0x7f;
    local_2e = 0x7f;
    local_2f = 0x7f;
    local_30 = 0x7f;
    local_31 = 0x7f;
    local_32 = 0x7f;
    local_33 = 0x7f;
    local_34 = 0x7f;
    local_35 = 0x7f;
    local_36 = 0x7f;
    local_37 = 0x7f;
    local_38 = 0x7f;
    local_1228 = 0x7f7f7f7f7f7f7f7f;
    uStack_1220 = 0x7f7f7f7f7f7f7f7f;
    local_1238 = 0xff;
    uStack_1237 = 0xff;
    uStack_1236 = 0xff;
    uStack_1235 = 0xff;
    uStack_1234 = 0xff;
    uStack_1233 = 0xff;
    uStack_1232 = 0xff;
    uStack_1231 = 0xff;
    uStack_1230 = 0xff;
    uStack_122f = 0xff;
    uStack_122e = 0xff;
    uStack_122d = 0xff;
    uStack_122c = 0xff;
    uStack_122b = 0xff;
    uStack_122a = 0xff;
    uStack_1229 = 0xff;
    local_708 = local_1078;
    uStack_700 = uStack_1070;
    local_648 = local_1078 ^ 0x8080808080808080;
    uStack_640 = uStack_1070 ^ 0x8080808080808080;
    local_728 = local_1088;
    uStack_720 = uStack_1080;
    local_678 = local_1088 ^ 0x8080808080808080;
    uStack_670 = uStack_1080 ^ 0x8080808080808080;
    local_748 = local_1098;
    uStack_740 = uStack_1090;
    local_688 = local_1098 ^ 0x8080808080808080;
    uStack_680 = uStack_1090 ^ 0x8080808080808080;
    local_768 = local_10a8;
    uStack_760 = uStack_10a0;
    local_6a8 = local_10a8 ^ 0x8080808080808080;
    uStack_6a0 = uStack_10a0 ^ 0x8080808080808080;
    local_888 = CONCAT17(bStack_1131,
                         CONCAT16(bStack_1132,
                                  CONCAT15(bStack_1133,
                                           CONCAT14(bStack_1134,
                                                    CONCAT13(bStack_1135,
                                                             CONCAT12(bStack_1136,
                                                                      CONCAT11(bStack_1137,
                                                                               local_1138)))))));
    uStack_880 = CONCAT17(bStack_1129,
                          CONCAT16(bStack_112a,
                                   CONCAT15(bStack_112b,
                                            CONCAT14(bStack_112c,
                                                     CONCAT13(bStack_112d,
                                                              CONCAT12(bStack_112e,
                                                                       CONCAT11(bStack_112f,
                                                                                bStack_1130)))))));
    local_898 = local_1018;
    uStack_890 = uStack_1010;
    auVar44._8_8_ = uStack_880;
    auVar44._0_8_ = local_888;
    auVar43._8_8_ = uStack_1010;
    auVar43._0_8_ = local_1018;
    auVar101 = psubusb(auVar44,auVar43);
    local_1038 = auVar101._0_8_;
    uStack_1030 = auVar101._8_8_;
    local_ca8 = local_1038;
    uVar75 = local_ca8;
    uStack_ca0 = uStack_1030;
    uVar76 = uStack_ca0;
    local_cb8 = local_fd8;
    uStack_cb0 = uStack_fd0;
    local_ca8._0_1_ = auVar101[0];
    local_ca8._1_1_ = auVar101[1];
    local_ca8._2_1_ = auVar101[2];
    local_ca8._3_1_ = auVar101[3];
    local_ca8._4_1_ = auVar101[4];
    local_ca8._5_1_ = auVar101[5];
    local_ca8._6_1_ = auVar101[6];
    local_ca8._7_1_ = auVar101[7];
    uStack_ca0._0_1_ = auVar101[8];
    uStack_ca0._1_1_ = auVar101[9];
    uStack_ca0._2_1_ = auVar101[10];
    uStack_ca0._3_1_ = auVar101[0xb];
    uStack_ca0._4_1_ = auVar101[0xc];
    uStack_ca0._5_1_ = auVar101[0xd];
    uStack_ca0._6_1_ = auVar101[0xe];
    uStack_ca0._7_1_ = auVar101[0xf];
    local_788 = -((char)local_ca8 == (char)local_c78);
    cStack_787 = -(local_ca8._1_1_ == local_c78._1_1_);
    cStack_786 = -(local_ca8._2_1_ == local_c78._2_1_);
    cStack_785 = -(local_ca8._3_1_ == local_c78._3_1_);
    cStack_784 = -(local_ca8._4_1_ == local_c78._4_1_);
    cStack_783 = -(local_ca8._5_1_ == local_c78._5_1_);
    cStack_782 = -(local_ca8._6_1_ == local_c78._6_1_);
    cStack_781 = -(local_ca8._7_1_ == local_c78._7_1_);
    cStack_780 = -((char)uStack_ca0 == (char)uStack_c70);
    cStack_77f = -(uStack_ca0._1_1_ == uStack_c70._1_1_);
    cStack_77e = -(uStack_ca0._2_1_ == uStack_c70._2_1_);
    cStack_77d = -(uStack_ca0._3_1_ == uStack_c70._3_1_);
    cStack_77c = -(uStack_ca0._4_1_ == uStack_c70._4_1_);
    cStack_77b = -(uStack_ca0._5_1_ == uStack_c70._5_1_);
    cStack_77a = -(uStack_ca0._6_1_ == uStack_c70._6_1_);
    cStack_779 = -(uStack_ca0._7_1_ == uStack_c70._7_1_);
    local_798 = 0xffffffffffffffff;
    uStack_790 = 0xffffffffffffffff;
    local_8f8 = CONCAT17(cStack_781,
                         CONCAT16(cStack_782,
                                  CONCAT15(cStack_783,
                                           CONCAT14(cStack_784,
                                                    CONCAT13(cStack_785,
                                                             CONCAT12(cStack_786,
                                                                      CONCAT11(cStack_787,local_788)
                                                                     )))))) ^ 0xffffffffffffffff;
    uStack_8f0 = CONCAT17(cStack_779,
                          CONCAT16(cStack_77a,
                                   CONCAT15(cStack_77b,
                                            CONCAT14(cStack_77c,
                                                     CONCAT13(cStack_77d,
                                                              CONCAT12(cStack_77e,
                                                                       CONCAT11(cStack_77f,
                                                                                cStack_780))))))) ^
                 0xffffffffffffffff;
    uStack_1030 = uStack_8f0;
    local_1038 = local_8f8;
    auVar59._8_8_ = uStack_640;
    auVar59._0_8_ = local_648;
    auVar58._8_8_ = uStack_6a0;
    auVar58._0_8_ = local_6a8;
    local_8e8 = psubsb(auVar59,auVar58);
    local_548 = local_8e8._0_8_ & local_8f8;
    uStack_540 = local_8e8._8_8_ & uStack_8f0;
    auVar57._8_8_ = uStack_680;
    auVar57._0_8_ = local_688;
    auVar56._8_8_ = uStack_670;
    auVar56._0_8_ = local_678;
    auVar101 = psubsb(auVar57,auVar56);
    local_1258 = auVar101._0_8_;
    uStack_1250 = auVar101._8_8_;
    local_558 = local_1258;
    uStack_550 = uStack_1250;
    auVar70._8_8_ = uStack_540;
    auVar70._0_8_ = local_548;
    auVar102 = paddsb(auVar70,auVar101);
    local_1248 = auVar102._0_8_;
    uStack_1240 = auVar102._8_8_;
    local_568 = local_1248;
    uStack_560 = uStack_1240;
    local_578 = local_1258;
    uStack_570 = uStack_1250;
    auVar102 = paddsb(auVar102,auVar101);
    local_1248 = auVar102._0_8_;
    uStack_1240 = auVar102._8_8_;
    local_588 = local_1248;
    uStack_580 = uStack_1240;
    local_598 = local_1258;
    uStack_590 = uStack_1250;
    auVar101 = paddsb(auVar102,auVar101);
    local_1248 = auVar101._0_8_;
    uStack_1240 = auVar101._8_8_;
    local_908 = local_1248;
    uStack_900 = uStack_1240;
    local_918 = local_1028;
    uStack_910 = uStack_1020;
    local_5c8 = local_1248 & local_1028;
    uStack_5c0 = uStack_1240 & uStack_1020;
    auVar69._8_8_ = uStack_5c0;
    auVar69._0_8_ = local_5c8;
    auVar68._8_8_ = 0x404040404040404;
    auVar68._0_8_ = 0x404040404040404;
    auVar101 = paddsb(auVar69,auVar68);
    auVar67._8_8_ = uStack_5c0;
    auVar67._0_8_ = local_5c8;
    auVar66._8_8_ = 0x303030303030303;
    auVar66._0_8_ = 0x303030303030303;
    auVar102 = paddsb(auVar67,auVar66);
    local_1268 = auVar101._0_8_;
    uStack_1260 = auVar101._8_8_;
    local_4e8 = local_fd8;
    uStack_4e0 = uStack_fd0;
    local_4f8 = local_1268;
    uVar87 = local_4f8;
    uStack_4f0 = uStack_1260;
    uVar88 = uStack_4f0;
    local_4f8._0_1_ = auVar101[0];
    local_4f8._1_1_ = auVar101[1];
    local_4f8._2_1_ = auVar101[2];
    local_4f8._3_1_ = auVar101[3];
    local_4f8._4_1_ = auVar101[4];
    local_4f8._5_1_ = auVar101[5];
    local_4f8._6_1_ = auVar101[6];
    local_4f8._7_1_ = auVar101[7];
    uStack_4f0._0_1_ = auVar101[8];
    uStack_4f0._1_1_ = auVar101[9];
    uStack_4f0._2_1_ = auVar101[10];
    uStack_4f0._3_1_ = auVar101[0xb];
    uStack_4f0._4_1_ = auVar101[0xc];
    uStack_4f0._5_1_ = auVar101[0xd];
    uStack_4f0._6_1_ = auVar101[0xe];
    uStack_4f0._7_1_ = auVar101[0xf];
    local_1258._0_2_ =
         CONCAT11(-(local_4f8._1_1_ < local_c78._1_1_),-((char)local_4f8 < (char)local_c78));
    local_1258._0_3_ = CONCAT12(-(local_4f8._2_1_ < local_c78._2_1_),(undefined2)local_1258);
    local_1258._0_4_ = CONCAT13(-(local_4f8._3_1_ < local_c78._3_1_),(undefined3)local_1258);
    local_1258._0_5_ = CONCAT14(-(local_4f8._4_1_ < local_c78._4_1_),(undefined4)local_1258);
    local_1258._0_6_ = CONCAT15(-(local_4f8._5_1_ < local_c78._5_1_),(undefined5)local_1258);
    local_1258._0_7_ = CONCAT16(-(local_4f8._6_1_ < local_c78._6_1_),(undefined6)local_1258);
    local_1258 = CONCAT17(-(local_4f8._7_1_ < local_c78._7_1_),(undefined7)local_1258);
    uStack_1250._0_1_ = -((char)uStack_4f0 < (char)uStack_c70);
    uStack_1250._1_1_ = -(uStack_4f0._1_1_ < uStack_c70._1_1_);
    uStack_1250._2_1_ = -(uStack_4f0._2_1_ < uStack_c70._2_1_);
    uStack_1250._3_1_ = -(uStack_4f0._3_1_ < uStack_c70._3_1_);
    uStack_1250._4_1_ = -(uStack_4f0._4_1_ < uStack_c70._4_1_);
    uStack_1250._5_1_ = -(uStack_4f0._5_1_ < uStack_c70._5_1_);
    uStack_1250._6_1_ = -(uStack_4f0._6_1_ < uStack_c70._6_1_);
    uStack_1250._7_1_ = -(uStack_4f0._7_1_ < uStack_c70._7_1_);
    local_a08 = local_1268;
    uStack_a00 = uStack_1260;
    local_a0c = 3;
    local_a08._0_2_ = auVar101._0_2_;
    local_a08._2_2_ = auVar101._2_2_;
    local_a08._4_2_ = auVar101._4_2_;
    local_a08._6_2_ = auVar101._6_2_;
    uStack_a00._0_2_ = auVar101._8_2_;
    uStack_a00._2_2_ = auVar101._10_2_;
    uStack_a00._4_2_ = auVar101._12_2_;
    uStack_a00._6_2_ = auVar101._14_2_;
    local_1268._0_4_ = CONCAT22(local_a08._2_2_ >> 3,(ushort)local_a08 >> 3);
    local_1268._0_6_ = CONCAT24(local_a08._4_2_ >> 3,(undefined4)local_1268);
    local_1268 = CONCAT26(local_a08._6_2_ >> 3,(undefined6)local_1268);
    uStack_1260._0_2_ = (ushort)uStack_a00 >> 3;
    uStack_1260._2_2_ = uStack_a00._2_2_ >> 3;
    uStack_1260._4_2_ = uStack_a00._4_2_ >> 3;
    uStack_1260._6_2_ = uStack_a00._6_2_ >> 3;
    local_928 = local_1258;
    uStack_920 = uStack_1250;
    local_498 = local_1258 & 0xe0e0e0e0e0e0e0e0;
    uStack_490 = uStack_1250 & 0xe0e0e0e0e0e0e0e0;
    local_948 = local_1268;
    uStack_940 = uStack_1260;
    local_488 = local_1268 & 0x1f1f1f1f1f1f1f1f;
    uStack_480 = uStack_1260 & 0x1f1f1f1f1f1f1f1f;
    local_698 = local_488 | local_498;
    uStack_690 = uStack_480 | uStack_490;
    uStack_1260 = uStack_690;
    local_1268 = local_698;
    auVar55._8_8_ = uStack_680;
    auVar55._0_8_ = local_688;
    auVar54._8_8_ = uStack_690;
    auVar54._0_8_ = local_698;
    local_7a8 = psubsb(auVar55,auVar54);
    local_1108 = local_7a8._0_8_ ^ 0x8080808080808080;
    uStack_1100 = local_7a8._8_8_ ^ 0x8080808080808080;
    local_1278 = auVar102._0_8_;
    uStack_1270 = auVar102._8_8_;
    local_508 = local_fd8;
    uStack_500 = uStack_fd0;
    local_518 = local_1278;
    uVar85 = local_518;
    uStack_510 = uStack_1270;
    uVar86 = uStack_510;
    local_518._0_1_ = auVar102[0];
    local_518._1_1_ = auVar102[1];
    local_518._2_1_ = auVar102[2];
    local_518._3_1_ = auVar102[3];
    local_518._4_1_ = auVar102[4];
    local_518._5_1_ = auVar102[5];
    local_518._6_1_ = auVar102[6];
    local_518._7_1_ = auVar102[7];
    uStack_510._0_1_ = auVar102[8];
    uStack_510._1_1_ = auVar102[9];
    uStack_510._2_1_ = auVar102[10];
    uStack_510._3_1_ = auVar102[0xb];
    uStack_510._4_1_ = auVar102[0xc];
    uStack_510._5_1_ = auVar102[0xd];
    uStack_510._6_1_ = auVar102[0xe];
    uStack_510._7_1_ = auVar102[0xf];
    local_1258._0_2_ =
         CONCAT11(-(local_518._1_1_ < local_c78._1_1_),-((char)local_518 < (char)local_c78));
    local_1258._0_3_ = CONCAT12(-(local_518._2_1_ < local_c78._2_1_),(undefined2)local_1258);
    local_1258._0_4_ = CONCAT13(-(local_518._3_1_ < local_c78._3_1_),(undefined3)local_1258);
    local_1258._0_5_ = CONCAT14(-(local_518._4_1_ < local_c78._4_1_),(undefined4)local_1258);
    local_1258._0_6_ = CONCAT15(-(local_518._5_1_ < local_c78._5_1_),(undefined5)local_1258);
    local_1258._0_7_ = CONCAT16(-(local_518._6_1_ < local_c78._6_1_),(undefined6)local_1258);
    local_1258 = CONCAT17(-(local_518._7_1_ < local_c78._7_1_),(undefined7)local_1258);
    uStack_1250._0_1_ = -((char)uStack_510 < (char)uStack_c70);
    uStack_1250._1_1_ = -(uStack_510._1_1_ < uStack_c70._1_1_);
    uStack_1250._2_1_ = -(uStack_510._2_1_ < uStack_c70._2_1_);
    uStack_1250._3_1_ = -(uStack_510._3_1_ < uStack_c70._3_1_);
    uStack_1250._4_1_ = -(uStack_510._4_1_ < uStack_c70._4_1_);
    uStack_1250._5_1_ = -(uStack_510._5_1_ < uStack_c70._5_1_);
    uStack_1250._6_1_ = -(uStack_510._6_1_ < uStack_c70._6_1_);
    uStack_1250._7_1_ = -(uStack_510._7_1_ < uStack_c70._7_1_);
    local_a28 = local_1278;
    uStack_a20 = uStack_1270;
    local_a2c = 3;
    local_a28._0_2_ = auVar102._0_2_;
    local_a28._2_2_ = auVar102._2_2_;
    local_a28._4_2_ = auVar102._4_2_;
    local_a28._6_2_ = auVar102._6_2_;
    uStack_a20._0_2_ = auVar102._8_2_;
    uStack_a20._2_2_ = auVar102._10_2_;
    uStack_a20._4_2_ = auVar102._12_2_;
    uStack_a20._6_2_ = auVar102._14_2_;
    local_1278._0_4_ = CONCAT22(local_a28._2_2_ >> 3,(ushort)local_a28 >> 3);
    local_1278._0_6_ = CONCAT24(local_a28._4_2_ >> 3,(undefined4)local_1278);
    local_1278 = CONCAT26(local_a28._6_2_ >> 3,(undefined6)local_1278);
    uStack_1270._0_2_ = (ushort)uStack_a20 >> 3;
    uStack_1270._2_2_ = uStack_a20._2_2_ >> 3;
    uStack_1270._4_2_ = uStack_a20._4_2_ >> 3;
    uStack_1270._6_2_ = uStack_a20._6_2_ >> 3;
    local_968 = local_1258;
    uStack_960 = uStack_1250;
    local_4b8 = local_1258 & 0xe0e0e0e0e0e0e0e0;
    uStack_4b0 = uStack_1250 & 0xe0e0e0e0e0e0e0e0;
    local_988 = local_1278;
    uStack_980 = uStack_1270;
    local_4a8 = local_1278 & 0x1f1f1f1f1f1f1f1f;
    uStack_4a0 = uStack_1270 & 0x1f1f1f1f1f1f1f1f;
    local_5f8 = local_4a8 | local_4b8;
    uStack_5f0 = uStack_4a0 | uStack_4b0;
    uStack_1270 = uStack_5f0;
    local_1278 = local_5f8;
    auVar65._8_8_ = uStack_670;
    auVar65._0_8_ = local_678;
    auVar64._8_8_ = uStack_5f0;
    auVar64._0_8_ = local_5f8;
    local_7c8 = paddsb(auVar65,auVar64);
    local_10f8 = local_7c8._0_8_ ^ 0x8080808080808080;
    uStack_10f0 = local_7c8._8_8_ ^ 0x8080808080808080;
    auVar63._8_8_ = uStack_690;
    auVar63._0_8_ = local_698;
    auVar62._8_8_ = 0x101010101010101;
    auVar62._0_8_ = 0x101010101010101;
    auVar101 = paddsb(auVar63,auVar62);
    local_1248 = auVar101._0_8_;
    uStack_1240 = auVar101._8_8_;
    local_528 = local_fd8;
    uStack_520 = uStack_fd0;
    local_538 = local_1248;
    uVar83 = local_538;
    uStack_530 = uStack_1240;
    uVar84 = uStack_530;
    local_538._0_1_ = auVar101[0];
    local_538._1_1_ = auVar101[1];
    local_538._2_1_ = auVar101[2];
    local_538._3_1_ = auVar101[3];
    local_538._4_1_ = auVar101[4];
    local_538._5_1_ = auVar101[5];
    local_538._6_1_ = auVar101[6];
    local_538._7_1_ = auVar101[7];
    uStack_530._0_1_ = auVar101[8];
    uStack_530._1_1_ = auVar101[9];
    uStack_530._2_1_ = auVar101[10];
    uStack_530._3_1_ = auVar101[0xb];
    uStack_530._4_1_ = auVar101[0xc];
    uStack_530._5_1_ = auVar101[0xd];
    uStack_530._6_1_ = auVar101[0xe];
    uStack_530._7_1_ = auVar101[0xf];
    local_1258._0_2_ =
         CONCAT11(-(local_538._1_1_ < local_c78._1_1_),-((char)local_538 < (char)local_c78));
    local_1258._0_3_ = CONCAT12(-(local_538._2_1_ < local_c78._2_1_),(undefined2)local_1258);
    local_1258._0_4_ = CONCAT13(-(local_538._3_1_ < local_c78._3_1_),(undefined3)local_1258);
    local_1258._0_5_ = CONCAT14(-(local_538._4_1_ < local_c78._4_1_),(undefined4)local_1258);
    local_1258._0_6_ = CONCAT15(-(local_538._5_1_ < local_c78._5_1_),(undefined5)local_1258);
    local_1258._0_7_ = CONCAT16(-(local_538._6_1_ < local_c78._6_1_),(undefined6)local_1258);
    local_1258 = CONCAT17(-(local_538._7_1_ < local_c78._7_1_),(undefined7)local_1258);
    uStack_1250._0_1_ = -((char)uStack_530 < (char)uStack_c70);
    uStack_1250._1_1_ = -(uStack_530._1_1_ < uStack_c70._1_1_);
    uStack_1250._2_1_ = -(uStack_530._2_1_ < uStack_c70._2_1_);
    uStack_1250._3_1_ = -(uStack_530._3_1_ < uStack_c70._3_1_);
    uStack_1250._4_1_ = -(uStack_530._4_1_ < uStack_c70._4_1_);
    uStack_1250._5_1_ = -(uStack_530._5_1_ < uStack_c70._5_1_);
    uStack_1250._6_1_ = -(uStack_530._6_1_ < uStack_c70._6_1_);
    uStack_1250._7_1_ = -(uStack_530._7_1_ < uStack_c70._7_1_);
    local_a48 = local_1248;
    uStack_a40 = uStack_1240;
    local_a4c = 1;
    local_a48._0_2_ = auVar101._0_2_;
    local_a48._2_2_ = auVar101._2_2_;
    local_a48._4_2_ = auVar101._4_2_;
    local_a48._6_2_ = auVar101._6_2_;
    uStack_a40._0_2_ = auVar101._8_2_;
    uStack_a40._2_2_ = auVar101._10_2_;
    uStack_a40._4_2_ = auVar101._12_2_;
    uStack_a40._6_2_ = auVar101._14_2_;
    local_1248._0_4_ = CONCAT22(local_a48._2_2_ >> 1,(ushort)local_a48 >> 1);
    local_1248._0_6_ = CONCAT24(local_a48._4_2_ >> 1,(undefined4)local_1248);
    local_1248 = CONCAT26(local_a48._6_2_ >> 1,(undefined6)local_1248);
    uStack_1240._0_2_ = (ushort)uStack_a40 >> 1;
    uStack_1240._2_2_ = uStack_a40._2_2_ >> 1;
    uStack_1240._4_2_ = uStack_a40._4_2_ >> 1;
    uStack_1240._6_2_ = uStack_a40._6_2_ >> 1;
    local_9a8 = local_1258;
    uStack_9a0 = uStack_1250;
    local_4d8 = local_1258 & 0x8080808080808080;
    uStack_4d0 = uStack_1250 & 0x8080808080808080;
    uStack_1250 = uStack_4d0;
    local_1258 = local_4d8;
    local_9c8 = local_1248;
    uStack_9c0 = uStack_1240;
    local_4c8 = local_1248 & 0x7f7f7f7f7f7f7f7f;
    uStack_4c0 = uStack_1240 & 0x7f7f7f7f7f7f7f7f;
    local_478 = local_4c8 | local_4d8;
    uStack_470 = uStack_4c0 | uStack_4d0;
    local_6b8 = ~local_8f8 & local_478;
    uStack_6b0 = ~uStack_8f0 & uStack_470;
    uStack_1240 = uStack_6b0;
    local_1248 = local_6b8;
    auVar61._8_8_ = uStack_640;
    auVar61._0_8_ = local_648;
    auVar60._8_8_ = uStack_6b0;
    auVar60._0_8_ = local_6b8;
    local_7e8 = paddsb(auVar61,auVar60);
    local_10e8 = local_7e8._0_8_ ^ 0x8080808080808080;
    uStack_10e0 = local_7e8._8_8_ ^ 0x8080808080808080;
    auVar53._8_8_ = uStack_6a0;
    auVar53._0_8_ = local_6a8;
    auVar52._8_8_ = uStack_6b0;
    auVar52._0_8_ = local_6b8;
    local_808 = psubsb(auVar53,auVar52);
    local_1118 = local_808._0_8_ ^ 0x8080808080808080;
    uStack_1110 = local_808._8_8_ ^ 0x8080808080808080;
    local_cd8 = local_fd8;
    uStack_cd0 = uStack_fd0;
    local_cc8._0_1_ = (char)local_1048;
    local_cc8._1_1_ = (char)(local_1048 >> 8);
    local_cc8._2_1_ = (char)(local_1048 >> 0x10);
    local_cc8._3_1_ = (char)(local_1048 >> 0x18);
    local_cc8._4_1_ = (char)(local_1048 >> 0x20);
    local_cc8._5_1_ = (char)(local_1048 >> 0x28);
    local_cc8._6_1_ = (char)(local_1048 >> 0x30);
    local_cc8._7_1_ = (char)(local_1048 >> 0x38);
    uStack_cc0._0_1_ = (char)uStack_1040;
    uStack_cc0._1_1_ = (char)(uStack_1040 >> 8);
    uStack_cc0._2_1_ = (char)(uStack_1040 >> 0x10);
    uStack_cc0._3_1_ = (char)(uStack_1040 >> 0x18);
    uStack_cc0._4_1_ = (char)(uStack_1040 >> 0x20);
    uStack_cc0._5_1_ = (char)(uStack_1040 >> 0x28);
    uStack_cc0._6_1_ = (char)(uStack_1040 >> 0x30);
    uStack_cc0._7_1_ = (char)(uStack_1040 >> 0x38);
    local_6d8 = -((char)local_cc8 == (char)local_c78);
    cStack_6d7 = -(local_cc8._1_1_ == local_c78._1_1_);
    cStack_6d6 = -(local_cc8._2_1_ == local_c78._2_1_);
    cStack_6d5 = -(local_cc8._3_1_ == local_c78._3_1_);
    cStack_6d4 = -(local_cc8._4_1_ == local_c78._4_1_);
    cStack_6d3 = -(local_cc8._5_1_ == local_c78._5_1_);
    cStack_6d2 = -(local_cc8._6_1_ == local_c78._6_1_);
    cStack_6d1 = -(local_cc8._7_1_ == local_c78._7_1_);
    cStack_6d0 = -((char)uStack_cc0 == (char)uStack_c70);
    cStack_6cf = -(uStack_cc0._1_1_ == uStack_c70._1_1_);
    cStack_6ce = -(uStack_cc0._2_1_ == uStack_c70._2_1_);
    cStack_6cd = -(uStack_cc0._3_1_ == uStack_c70._3_1_);
    cStack_6cc = -(uStack_cc0._4_1_ == uStack_c70._4_1_);
    cStack_6cb = -(uStack_cc0._5_1_ == uStack_c70._5_1_);
    cStack_6ca = -(uStack_cc0._6_1_ == uStack_c70._6_1_);
    bStack_6c9 = -(uStack_cc0._7_1_ == uStack_c70._7_1_);
    auVar50[1] = cStack_6d7;
    auVar50[0] = local_6d8;
    auVar50[2] = cStack_6d6;
    auVar50[3] = cStack_6d5;
    auVar50[4] = cStack_6d4;
    auVar50[5] = cStack_6d3;
    auVar50[6] = cStack_6d2;
    auVar50[7] = cStack_6d1;
    auVar50[8] = cStack_6d0;
    auVar50[9] = cStack_6cf;
    auVar50[10] = cStack_6ce;
    auVar50[0xb] = cStack_6cd;
    auVar50[0xc] = cStack_6cc;
    auVar50[0xd] = cStack_6cb;
    auVar50[0xe] = cStack_6ca;
    auVar50[0xf] = bStack_6c9;
    if ((ushort)((ushort)(SUB161(auVar50 >> 7,0) & 1) | (ushort)(SUB161(auVar50 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar50 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar50 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar50 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar50 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar50 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar50 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar50 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar50 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar50 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar50 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar50 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar50 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar50 >> 0x77,0) & 1) << 0xe | (ushort)(bStack_6c9 >> 7) << 0xf)
        == 0xffff) {
      puVar98 = (ulong *)((long)local_fa0 - (long)(local_fa4 << 1));
      *puVar98 = local_10e8;
      puVar98[1] = uStack_10e0;
      *(ulong *)((long)local_fa0 - (long)local_fa4) = local_10f8;
      ((ulong *)((long)local_fa0 - (long)local_fa4))[1] = uStack_10f0;
      *local_fa0 = local_1108;
      local_fa0[1] = uStack_1100;
      *(ulong *)((long)local_fa0 + (long)local_fa4) = local_1118;
      ((ulong *)((long)local_fa0 + (long)local_fa4))[1] = uStack_1110;
    }
    else {
      local_44a = 4;
      local_2 = 4;
      local_4 = 4;
      local_6 = 4;
      local_8 = 4;
      local_a = 4;
      local_c = 4;
      local_e = 4;
      local_10 = 4;
      local_1288 = 0x4000400040004;
      uStack_1280 = 0x4000400040004;
      local_e98 = local_1058;
      uVar74 = local_e98;
      uStack_e90 = uStack_1050;
      local_ea8 = local_fd8;
      uStack_ea0 = uStack_fd0;
      local_e98._0_1_ = (undefined1)local_1058;
      local_e98._1_1_ = (undefined1)((ulong)local_1058 >> 8);
      local_e98._2_1_ = (undefined1)((ulong)local_1058 >> 0x10);
      local_e98._3_1_ = (undefined1)((ulong)local_1058 >> 0x18);
      local_e98._4_1_ = (undefined1)((ulong)local_1058 >> 0x20);
      local_e98._5_1_ = (undefined1)((ulong)local_1058 >> 0x28);
      local_e98._6_1_ = (undefined1)((ulong)local_1058 >> 0x30);
      local_e98._7_1_ = (undefined1)((ulong)local_1058 >> 0x38);
      local_1298 = (undefined1)local_e98;
      cStack_1297 = (char)local_c78;
      uStack_1296 = local_e98._1_1_;
      cStack_1295 = local_c78._1_1_;
      uStack_1294 = local_e98._2_1_;
      cStack_1293 = local_c78._2_1_;
      uStack_1292 = local_e98._3_1_;
      cStack_1291 = local_c78._3_1_;
      uStack_1290 = local_e98._4_1_;
      cStack_128f = local_c78._4_1_;
      uStack_128e = local_e98._5_1_;
      cStack_128d = local_c78._5_1_;
      uStack_128c = local_e98._6_1_;
      cStack_128b = local_c78._6_1_;
      uStack_128a = local_e98._7_1_;
      cStack_1289 = local_c78._7_1_;
      local_eb8 = local_1068;
      lVar73 = local_eb8;
      lStack_eb0 = lStack_1060;
      local_ec8 = local_fd8;
      uStack_ec0 = uStack_fd0;
      local_eb8._0_1_ = (undefined1)local_1068;
      local_eb8._1_1_ = (undefined1)((ulong)local_1068 >> 8);
      local_eb8._2_1_ = (undefined1)((ulong)local_1068 >> 0x10);
      local_eb8._3_1_ = (undefined1)((ulong)local_1068 >> 0x18);
      local_eb8._4_1_ = (undefined1)((ulong)local_1068 >> 0x20);
      local_eb8._5_1_ = (undefined1)((ulong)local_1068 >> 0x28);
      local_eb8._6_1_ = (undefined1)((ulong)local_1068 >> 0x30);
      local_eb8._7_1_ = (undefined1)((ulong)local_1068 >> 0x38);
      local_12a8 = (undefined1)local_eb8;
      cStack_12a7 = (char)local_c78;
      uStack_12a6 = local_eb8._1_1_;
      cStack_12a5 = local_c78._1_1_;
      uStack_12a4 = local_eb8._2_1_;
      cStack_12a3 = local_c78._2_1_;
      uStack_12a2 = local_eb8._3_1_;
      cStack_12a1 = local_c78._3_1_;
      uStack_12a0 = local_eb8._4_1_;
      cStack_129f = local_c78._4_1_;
      uStack_129e = local_eb8._5_1_;
      cStack_129d = local_c78._5_1_;
      uStack_129c = local_eb8._6_1_;
      cStack_129b = local_c78._6_1_;
      uStack_129a = local_eb8._7_1_;
      cStack_1299 = local_c78._7_1_;
      local_ed8 = local_1078;
      uVar104 = local_ed8;
      uStack_ed0 = uStack_1070;
      local_ee8 = local_fd8;
      uStack_ee0 = uStack_fd0;
      local_ed8._0_1_ = (undefined1)local_1078;
      local_ed8._1_1_ = (undefined1)(local_1078 >> 8);
      local_ed8._2_1_ = (undefined1)(local_1078 >> 0x10);
      local_ed8._3_1_ = (undefined1)(local_1078 >> 0x18);
      local_ed8._4_1_ = (undefined1)(local_1078 >> 0x20);
      local_ed8._5_1_ = (undefined1)(local_1078 >> 0x28);
      local_ed8._6_1_ = (undefined1)(local_1078 >> 0x30);
      local_ed8._7_1_ = (undefined1)(local_1078 >> 0x38);
      local_12b8 = (undefined1)local_ed8;
      cStack_12b7 = (char)local_c78;
      uStack_12b6 = local_ed8._1_1_;
      cStack_12b5 = local_c78._1_1_;
      uStack_12b4 = local_ed8._2_1_;
      cStack_12b3 = local_c78._2_1_;
      uStack_12b2 = local_ed8._3_1_;
      cStack_12b1 = local_c78._3_1_;
      uStack_12b0 = local_ed8._4_1_;
      cStack_12af = local_c78._4_1_;
      uStack_12ae = local_ed8._5_1_;
      cStack_12ad = local_c78._5_1_;
      uStack_12ac = local_ed8._6_1_;
      cStack_12ab = local_c78._6_1_;
      uStack_12aa = local_ed8._7_1_;
      cStack_12a9 = local_c78._7_1_;
      local_ef8 = local_1088;
      uVar103 = local_ef8;
      uStack_ef0 = uStack_1080;
      local_f08 = local_fd8;
      uStack_f00 = uStack_fd0;
      local_ef8._0_1_ = (undefined1)local_1088;
      local_ef8._1_1_ = (undefined1)(local_1088 >> 8);
      local_ef8._2_1_ = (undefined1)(local_1088 >> 0x10);
      local_ef8._3_1_ = (undefined1)(local_1088 >> 0x18);
      local_ef8._4_1_ = (undefined1)(local_1088 >> 0x20);
      local_ef8._5_1_ = (undefined1)(local_1088 >> 0x28);
      local_ef8._6_1_ = (undefined1)(local_1088 >> 0x30);
      local_ef8._7_1_ = (undefined1)(local_1088 >> 0x38);
      local_12c8 = (undefined1)local_ef8;
      cStack_12c7 = (char)local_c78;
      uStack_12c6 = local_ef8._1_1_;
      cStack_12c5 = local_c78._1_1_;
      uStack_12c4 = local_ef8._2_1_;
      cStack_12c3 = local_c78._2_1_;
      uStack_12c2 = local_ef8._3_1_;
      cStack_12c1 = local_c78._3_1_;
      uStack_12c0 = local_ef8._4_1_;
      cStack_12bf = local_c78._4_1_;
      uStack_12be = local_ef8._5_1_;
      cStack_12bd = local_c78._5_1_;
      uStack_12bc = local_ef8._6_1_;
      cStack_12bb = local_c78._6_1_;
      uStack_12ba = local_ef8._7_1_;
      cStack_12b9 = local_c78._7_1_;
      local_f18 = local_1098;
      uVar100 = local_f18;
      uStack_f10 = uStack_1090;
      local_f28 = local_fd8;
      uStack_f20 = uStack_fd0;
      local_f18._0_1_ = (undefined1)local_1098;
      local_f18._1_1_ = (undefined1)(local_1098 >> 8);
      local_f18._2_1_ = (undefined1)(local_1098 >> 0x10);
      local_f18._3_1_ = (undefined1)(local_1098 >> 0x18);
      local_f18._4_1_ = (undefined1)(local_1098 >> 0x20);
      local_f18._5_1_ = (undefined1)(local_1098 >> 0x28);
      local_f18._6_1_ = (undefined1)(local_1098 >> 0x30);
      local_f18._7_1_ = (undefined1)(local_1098 >> 0x38);
      local_12d8 = (undefined1)local_f18;
      cStack_12d7 = (char)local_c78;
      uStack_12d6 = local_f18._1_1_;
      cStack_12d5 = local_c78._1_1_;
      uStack_12d4 = local_f18._2_1_;
      cStack_12d3 = local_c78._2_1_;
      uStack_12d2 = local_f18._3_1_;
      cStack_12d1 = local_c78._3_1_;
      uStack_12d0 = local_f18._4_1_;
      cStack_12cf = local_c78._4_1_;
      uStack_12ce = local_f18._5_1_;
      cStack_12cd = local_c78._5_1_;
      uStack_12cc = local_f18._6_1_;
      cStack_12cb = local_c78._6_1_;
      uStack_12ca = local_f18._7_1_;
      cStack_12c9 = local_c78._7_1_;
      local_f38 = local_10a8;
      uVar99 = local_f38;
      uStack_f30 = uStack_10a0;
      local_f48 = local_fd8;
      uStack_f40 = uStack_fd0;
      local_f38._0_1_ = (undefined1)local_10a8;
      local_f38._1_1_ = (undefined1)(local_10a8 >> 8);
      local_f38._2_1_ = (undefined1)(local_10a8 >> 0x10);
      local_f38._3_1_ = (undefined1)(local_10a8 >> 0x18);
      local_f38._4_1_ = (undefined1)(local_10a8 >> 0x20);
      local_f38._5_1_ = (undefined1)(local_10a8 >> 0x28);
      local_f38._6_1_ = (undefined1)(local_10a8 >> 0x30);
      local_f38._7_1_ = (undefined1)(local_10a8 >> 0x38);
      local_12e8 = (undefined1)local_f38;
      cStack_12e7 = (char)local_c78;
      uStack_12e6 = local_f38._1_1_;
      cStack_12e5 = local_c78._1_1_;
      uStack_12e4 = local_f38._2_1_;
      cStack_12e3 = local_c78._2_1_;
      uStack_12e2 = local_f38._3_1_;
      cStack_12e1 = local_c78._3_1_;
      uStack_12e0 = local_f38._4_1_;
      cStack_12df = local_c78._4_1_;
      uStack_12de = local_f38._5_1_;
      cStack_12dd = local_c78._5_1_;
      uStack_12dc = local_f38._6_1_;
      cStack_12db = local_c78._6_1_;
      uStack_12da = local_f38._7_1_;
      cStack_12d9 = local_c78._7_1_;
      local_f58 = local_10b8;
      lVar72 = local_f58;
      lStack_f50 = lStack_10b0;
      local_f68 = local_fd8;
      uStack_f60 = uStack_fd0;
      local_f58._0_1_ = (undefined1)local_10b8;
      local_f58._1_1_ = (undefined1)((ulong)local_10b8 >> 8);
      local_f58._2_1_ = (undefined1)((ulong)local_10b8 >> 0x10);
      local_f58._3_1_ = (undefined1)((ulong)local_10b8 >> 0x18);
      local_f58._4_1_ = (undefined1)((ulong)local_10b8 >> 0x20);
      local_f58._5_1_ = (undefined1)((ulong)local_10b8 >> 0x28);
      local_f58._6_1_ = (undefined1)((ulong)local_10b8 >> 0x30);
      local_f58._7_1_ = (undefined1)((ulong)local_10b8 >> 0x38);
      local_12f8 = (undefined1)local_f58;
      cStack_12f7 = (char)local_c78;
      uStack_12f6 = local_f58._1_1_;
      cStack_12f5 = local_c78._1_1_;
      uStack_12f4 = local_f58._2_1_;
      cStack_12f3 = local_c78._2_1_;
      uStack_12f2 = local_f58._3_1_;
      cStack_12f1 = local_c78._3_1_;
      uStack_12f0 = local_f58._4_1_;
      cStack_12ef = local_c78._4_1_;
      uStack_12ee = local_f58._5_1_;
      cStack_12ed = local_c78._5_1_;
      uStack_12ec = local_f58._6_1_;
      cStack_12eb = local_c78._6_1_;
      uStack_12ea = local_f58._7_1_;
      cStack_12e9 = local_c78._7_1_;
      local_f78 = local_10c8;
      uVar71 = local_f78;
      uStack_f70 = uStack_10c0;
      local_f88 = local_fd8;
      uStack_f80 = uStack_fd0;
      local_f78._0_1_ = (undefined1)local_10c8;
      local_f78._1_1_ = (undefined1)((ulong)local_10c8 >> 8);
      local_f78._2_1_ = (undefined1)((ulong)local_10c8 >> 0x10);
      local_f78._3_1_ = (undefined1)((ulong)local_10c8 >> 0x18);
      local_f78._4_1_ = (undefined1)((ulong)local_10c8 >> 0x20);
      local_f78._5_1_ = (undefined1)((ulong)local_10c8 >> 0x28);
      local_f78._6_1_ = (undefined1)((ulong)local_10c8 >> 0x30);
      local_f78._7_1_ = (undefined1)((ulong)local_10c8 >> 0x38);
      local_1308 = (undefined1)local_f78;
      cStack_1307 = (char)local_c78;
      uStack_1306 = local_f78._1_1_;
      cStack_1305 = local_c78._1_1_;
      uStack_1304 = local_f78._2_1_;
      cStack_1303 = local_c78._2_1_;
      uStack_1302 = local_f78._3_1_;
      cStack_1301 = local_c78._3_1_;
      uStack_1300 = local_f78._4_1_;
      cStack_12ff = local_c78._4_1_;
      uStack_12fe = local_f78._5_1_;
      cStack_12fd = local_c78._5_1_;
      uStack_12fc = local_f78._6_1_;
      cStack_12fb = local_c78._6_1_;
      uStack_12fa = local_f78._7_1_;
      cStack_12f9 = local_c78._7_1_;
      local_358 = local_1058;
      uStack_350 = uStack_1050;
      uVar96 = uStack_350;
      local_368 = local_fd8;
      uStack_360 = uStack_fd0;
      uStack_350._0_1_ = (undefined1)uStack_1050;
      uStack_350._1_1_ = (undefined1)((ulong)uStack_1050 >> 8);
      uStack_350._2_1_ = (undefined1)((ulong)uStack_1050 >> 0x10);
      uStack_350._3_1_ = (undefined1)((ulong)uStack_1050 >> 0x18);
      uStack_350._4_1_ = (undefined1)((ulong)uStack_1050 >> 0x20);
      uStack_350._5_1_ = (undefined1)((ulong)uStack_1050 >> 0x28);
      uStack_350._6_1_ = (undefined1)((ulong)uStack_1050 >> 0x30);
      uStack_350._7_1_ = (undefined1)((ulong)uStack_1050 >> 0x38);
      local_1318 = (undefined1)uStack_350;
      cStack_1317 = (char)uStack_c70;
      uStack_1316 = uStack_350._1_1_;
      cStack_1315 = uStack_c70._1_1_;
      uStack_1314 = uStack_350._2_1_;
      cStack_1313 = uStack_c70._2_1_;
      uStack_1312 = uStack_350._3_1_;
      cStack_1311 = uStack_c70._3_1_;
      uStack_1310 = uStack_350._4_1_;
      cStack_130f = uStack_c70._4_1_;
      uStack_130e = uStack_350._5_1_;
      cStack_130d = uStack_c70._5_1_;
      uStack_130c = uStack_350._6_1_;
      cStack_130b = uStack_c70._6_1_;
      uStack_130a = uStack_350._7_1_;
      cStack_1309 = uStack_c70._7_1_;
      local_378 = local_1068;
      uStack_370 = lStack_1060;
      lVar95 = uStack_370;
      local_388 = local_fd8;
      uStack_380 = uStack_fd0;
      uStack_370._0_1_ = (undefined1)lStack_1060;
      uStack_370._1_1_ = (undefined1)((ulong)lStack_1060 >> 8);
      uStack_370._2_1_ = (undefined1)((ulong)lStack_1060 >> 0x10);
      uStack_370._3_1_ = (undefined1)((ulong)lStack_1060 >> 0x18);
      uStack_370._4_1_ = (undefined1)((ulong)lStack_1060 >> 0x20);
      uStack_370._5_1_ = (undefined1)((ulong)lStack_1060 >> 0x28);
      uStack_370._6_1_ = (undefined1)((ulong)lStack_1060 >> 0x30);
      uStack_370._7_1_ = (undefined1)((ulong)lStack_1060 >> 0x38);
      local_1328 = (undefined1)uStack_370;
      cStack_1327 = (char)uStack_c70;
      uStack_1326 = uStack_370._1_1_;
      cStack_1325 = uStack_c70._1_1_;
      uStack_1324 = uStack_370._2_1_;
      cStack_1323 = uStack_c70._2_1_;
      uStack_1322 = uStack_370._3_1_;
      cStack_1321 = uStack_c70._3_1_;
      uStack_1320 = uStack_370._4_1_;
      cStack_131f = uStack_c70._4_1_;
      uStack_131e = uStack_370._5_1_;
      cStack_131d = uStack_c70._5_1_;
      uStack_131c = uStack_370._6_1_;
      cStack_131b = uStack_c70._6_1_;
      uStack_131a = uStack_370._7_1_;
      cStack_1319 = uStack_c70._7_1_;
      local_398 = local_1078;
      uStack_390 = uStack_1070;
      uVar94 = uStack_390;
      local_3a8 = local_fd8;
      uStack_3a0 = uStack_fd0;
      uStack_390._0_1_ = (undefined1)uStack_1070;
      uStack_390._1_1_ = (undefined1)(uStack_1070 >> 8);
      uStack_390._2_1_ = (undefined1)(uStack_1070 >> 0x10);
      uStack_390._3_1_ = (undefined1)(uStack_1070 >> 0x18);
      uStack_390._4_1_ = (undefined1)(uStack_1070 >> 0x20);
      uStack_390._5_1_ = (undefined1)(uStack_1070 >> 0x28);
      uStack_390._6_1_ = (undefined1)(uStack_1070 >> 0x30);
      uStack_390._7_1_ = (undefined1)(uStack_1070 >> 0x38);
      local_1338 = (undefined1)uStack_390;
      cStack_1337 = (char)uStack_c70;
      uStack_1336 = uStack_390._1_1_;
      cStack_1335 = uStack_c70._1_1_;
      uStack_1334 = uStack_390._2_1_;
      cStack_1333 = uStack_c70._2_1_;
      uStack_1332 = uStack_390._3_1_;
      cStack_1331 = uStack_c70._3_1_;
      uStack_1330 = uStack_390._4_1_;
      cStack_132f = uStack_c70._4_1_;
      uStack_132e = uStack_390._5_1_;
      cStack_132d = uStack_c70._5_1_;
      uStack_132c = uStack_390._6_1_;
      cStack_132b = uStack_c70._6_1_;
      uStack_132a = uStack_390._7_1_;
      cStack_1329 = uStack_c70._7_1_;
      local_3b8 = local_1088;
      uStack_3b0 = uStack_1080;
      uVar93 = uStack_3b0;
      local_3c8 = local_fd8;
      uStack_3c0 = uStack_fd0;
      uStack_3b0._0_1_ = (undefined1)uStack_1080;
      uStack_3b0._1_1_ = (undefined1)(uStack_1080 >> 8);
      uStack_3b0._2_1_ = (undefined1)(uStack_1080 >> 0x10);
      uStack_3b0._3_1_ = (undefined1)(uStack_1080 >> 0x18);
      uStack_3b0._4_1_ = (undefined1)(uStack_1080 >> 0x20);
      uStack_3b0._5_1_ = (undefined1)(uStack_1080 >> 0x28);
      uStack_3b0._6_1_ = (undefined1)(uStack_1080 >> 0x30);
      uStack_3b0._7_1_ = (undefined1)(uStack_1080 >> 0x38);
      local_1348 = (undefined1)uStack_3b0;
      cStack_1347 = (char)uStack_c70;
      uStack_1346 = uStack_3b0._1_1_;
      cStack_1345 = uStack_c70._1_1_;
      uStack_1344 = uStack_3b0._2_1_;
      cStack_1343 = uStack_c70._2_1_;
      uStack_1342 = uStack_3b0._3_1_;
      cStack_1341 = uStack_c70._3_1_;
      uStack_1340 = uStack_3b0._4_1_;
      cStack_133f = uStack_c70._4_1_;
      uStack_133e = uStack_3b0._5_1_;
      cStack_133d = uStack_c70._5_1_;
      uStack_133c = uStack_3b0._6_1_;
      cStack_133b = uStack_c70._6_1_;
      uStack_133a = uStack_3b0._7_1_;
      cStack_1339 = uStack_c70._7_1_;
      local_3d8 = local_1098;
      uStack_3d0 = uStack_1090;
      uVar92 = uStack_3d0;
      local_3e8 = local_fd8;
      uStack_3e0 = uStack_fd0;
      uStack_3d0._0_1_ = (undefined1)uStack_1090;
      uStack_3d0._1_1_ = (undefined1)(uStack_1090 >> 8);
      uStack_3d0._2_1_ = (undefined1)(uStack_1090 >> 0x10);
      uStack_3d0._3_1_ = (undefined1)(uStack_1090 >> 0x18);
      uStack_3d0._4_1_ = (undefined1)(uStack_1090 >> 0x20);
      uStack_3d0._5_1_ = (undefined1)(uStack_1090 >> 0x28);
      uStack_3d0._6_1_ = (undefined1)(uStack_1090 >> 0x30);
      uStack_3d0._7_1_ = (undefined1)(uStack_1090 >> 0x38);
      local_1358 = (undefined1)uStack_3d0;
      cStack_1357 = (char)uStack_c70;
      uStack_1356 = uStack_3d0._1_1_;
      cStack_1355 = uStack_c70._1_1_;
      uStack_1354 = uStack_3d0._2_1_;
      cStack_1353 = uStack_c70._2_1_;
      uStack_1352 = uStack_3d0._3_1_;
      cStack_1351 = uStack_c70._3_1_;
      uStack_1350 = uStack_3d0._4_1_;
      cStack_134f = uStack_c70._4_1_;
      uStack_134e = uStack_3d0._5_1_;
      cStack_134d = uStack_c70._5_1_;
      uStack_134c = uStack_3d0._6_1_;
      cStack_134b = uStack_c70._6_1_;
      uStack_134a = uStack_3d0._7_1_;
      cStack_1349 = uStack_c70._7_1_;
      local_3f8 = local_10a8;
      uStack_3f0 = uStack_10a0;
      uVar91 = uStack_3f0;
      local_408 = local_fd8;
      uStack_400 = uStack_fd0;
      uStack_3f0._0_1_ = (undefined1)uStack_10a0;
      uStack_3f0._1_1_ = (undefined1)(uStack_10a0 >> 8);
      uStack_3f0._2_1_ = (undefined1)(uStack_10a0 >> 0x10);
      uStack_3f0._3_1_ = (undefined1)(uStack_10a0 >> 0x18);
      uStack_3f0._4_1_ = (undefined1)(uStack_10a0 >> 0x20);
      uStack_3f0._5_1_ = (undefined1)(uStack_10a0 >> 0x28);
      uStack_3f0._6_1_ = (undefined1)(uStack_10a0 >> 0x30);
      uStack_3f0._7_1_ = (undefined1)(uStack_10a0 >> 0x38);
      local_1368 = (undefined1)uStack_3f0;
      cStack_1367 = (char)uStack_c70;
      uStack_1366 = uStack_3f0._1_1_;
      cStack_1365 = uStack_c70._1_1_;
      uStack_1364 = uStack_3f0._2_1_;
      cStack_1363 = uStack_c70._2_1_;
      uStack_1362 = uStack_3f0._3_1_;
      cStack_1361 = uStack_c70._3_1_;
      uStack_1360 = uStack_3f0._4_1_;
      cStack_135f = uStack_c70._4_1_;
      uStack_135e = uStack_3f0._5_1_;
      cStack_135d = uStack_c70._5_1_;
      uStack_135c = uStack_3f0._6_1_;
      cStack_135b = uStack_c70._6_1_;
      uStack_135a = uStack_3f0._7_1_;
      cStack_1359 = uStack_c70._7_1_;
      local_418 = local_10b8;
      uStack_410 = lStack_10b0;
      lVar90 = uStack_410;
      local_428 = local_fd8;
      uStack_420 = uStack_fd0;
      uStack_410._0_1_ = (undefined1)lStack_10b0;
      uStack_410._1_1_ = (undefined1)((ulong)lStack_10b0 >> 8);
      uStack_410._2_1_ = (undefined1)((ulong)lStack_10b0 >> 0x10);
      uStack_410._3_1_ = (undefined1)((ulong)lStack_10b0 >> 0x18);
      uStack_410._4_1_ = (undefined1)((ulong)lStack_10b0 >> 0x20);
      uStack_410._5_1_ = (undefined1)((ulong)lStack_10b0 >> 0x28);
      uStack_410._6_1_ = (undefined1)((ulong)lStack_10b0 >> 0x30);
      uStack_410._7_1_ = (undefined1)((ulong)lStack_10b0 >> 0x38);
      local_1378 = (undefined1)uStack_410;
      cStack_1377 = (char)uStack_c70;
      uStack_1376 = uStack_410._1_1_;
      cStack_1375 = uStack_c70._1_1_;
      uStack_1374 = uStack_410._2_1_;
      cStack_1373 = uStack_c70._2_1_;
      uStack_1372 = uStack_410._3_1_;
      cStack_1371 = uStack_c70._3_1_;
      uStack_1370 = uStack_410._4_1_;
      cStack_136f = uStack_c70._4_1_;
      uStack_136e = uStack_410._5_1_;
      cStack_136d = uStack_c70._5_1_;
      uStack_136c = uStack_410._6_1_;
      cStack_136b = uStack_c70._6_1_;
      uStack_136a = uStack_410._7_1_;
      cStack_1369 = uStack_c70._7_1_;
      local_438 = local_10c8;
      uStack_430 = uStack_10c0;
      uVar89 = uStack_430;
      local_448 = local_fd8;
      uStack_440 = uStack_fd0;
      uStack_430._0_1_ = (undefined1)uStack_10c0;
      uStack_430._1_1_ = (undefined1)((ulong)uStack_10c0 >> 8);
      uStack_430._2_1_ = (undefined1)((ulong)uStack_10c0 >> 0x10);
      uStack_430._3_1_ = (undefined1)((ulong)uStack_10c0 >> 0x18);
      uStack_430._4_1_ = (undefined1)((ulong)uStack_10c0 >> 0x20);
      uStack_430._5_1_ = (undefined1)((ulong)uStack_10c0 >> 0x28);
      uStack_430._6_1_ = (undefined1)((ulong)uStack_10c0 >> 0x30);
      uStack_430._7_1_ = (undefined1)((ulong)uStack_10c0 >> 0x38);
      local_1388 = (undefined1)uStack_430;
      cStack_1387 = (char)uStack_c70;
      uStack_1386 = uStack_430._1_1_;
      cStack_1385 = uStack_c70._1_1_;
      uStack_1384 = uStack_430._2_1_;
      cStack_1383 = uStack_c70._2_1_;
      uStack_1382 = uStack_430._3_1_;
      cStack_1381 = uStack_c70._3_1_;
      uStack_1380 = uStack_430._4_1_;
      cStack_137f = uStack_c70._4_1_;
      uStack_137e = uStack_430._5_1_;
      cStack_137d = uStack_c70._5_1_;
      uStack_137c = uStack_430._6_1_;
      cStack_137b = uStack_c70._6_1_;
      uStack_137a = uStack_430._7_1_;
      cStack_1379 = uStack_c70._7_1_;
      uVar3 = CONCAT13(local_c78._1_1_,
                       CONCAT12(local_e98._1_1_,CONCAT11((char)local_c78,(undefined1)local_e98)));
      uVar4 = CONCAT15(local_c78._2_1_,CONCAT14(local_e98._2_1_,uVar3));
      uVar36 = CONCAT17(local_c78._3_1_,CONCAT16(local_e98._3_1_,uVar4));
      uVar6 = CONCAT13(local_c78._5_1_,
                       CONCAT12(local_e98._5_1_,CONCAT11(local_c78._4_1_,local_e98._4_1_)));
      uVar7 = CONCAT15(local_c78._6_1_,CONCAT14(local_e98._6_1_,uVar6));
      uVar39 = CONCAT17(local_c78._7_1_,CONCAT16(local_e98._7_1_,uVar7));
      local_158._2_2_ = (short)((uint)uVar3 >> 0x10);
      local_158._4_2_ = (short)((uint6)uVar4 >> 0x20);
      local_158._6_2_ = (short)((ulong)uVar36 >> 0x30);
      uStack_150._2_2_ = (short)((uint)uVar6 >> 0x10);
      uStack_150._4_2_ = (short)((uint6)uVar7 >> 0x20);
      uStack_150._6_2_ = (short)((ulong)uVar39 >> 0x30);
      local_198 = CONCAT11((char)local_c78,(undefined1)local_e98) + 4;
      sStack_196 = local_158._2_2_ + 4;
      sStack_194 = local_158._4_2_ + 4;
      sStack_192 = local_158._6_2_ + 4;
      sStack_190 = CONCAT11(local_c78._4_1_,local_e98._4_1_) + 4;
      sStack_18e = uStack_150._2_2_ + 4;
      sStack_18c = uStack_150._4_2_ + 4;
      sStack_18a = uStack_150._6_2_ + 4;
      uVar9 = CONCAT13(local_c78._1_1_,
                       CONCAT12(local_e98._1_1_,CONCAT11((char)local_c78,(undefined1)local_e98)));
      uVar10 = CONCAT15(local_c78._2_1_,CONCAT14(local_e98._2_1_,uVar9));
      uVar37 = CONCAT17(local_c78._3_1_,CONCAT16(local_e98._3_1_,uVar10));
      uVar12 = CONCAT13(local_c78._5_1_,
                        CONCAT12(local_e98._5_1_,CONCAT11(local_c78._4_1_,local_e98._4_1_)));
      uVar13 = CONCAT15(local_c78._6_1_,CONCAT14(local_e98._6_1_,uVar12));
      uVar40 = CONCAT17(local_c78._7_1_,CONCAT16(local_e98._7_1_,uVar13));
      uVar3 = CONCAT13(local_c78._1_1_,
                       CONCAT12(local_eb8._1_1_,CONCAT11((char)local_c78,(undefined1)local_eb8)));
      uVar4 = CONCAT15(local_c78._2_1_,CONCAT14(local_eb8._2_1_,uVar3));
      uVar32 = CONCAT17(local_c78._3_1_,CONCAT16(local_eb8._3_1_,uVar4));
      uVar6 = CONCAT13(local_c78._5_1_,
                       CONCAT12(local_eb8._5_1_,CONCAT11(local_c78._4_1_,local_eb8._4_1_)));
      uVar7 = CONCAT15(local_c78._6_1_,CONCAT14(local_eb8._6_1_,uVar6));
      uVar34 = CONCAT17(local_c78._7_1_,CONCAT16(local_eb8._7_1_,uVar7));
      local_178._2_2_ = (short)((uint)uVar9 >> 0x10);
      local_178._4_2_ = (short)((uint6)uVar10 >> 0x20);
      local_178._6_2_ = (short)((ulong)uVar37 >> 0x30);
      uStack_170._2_2_ = (short)((uint)uVar12 >> 0x10);
      uStack_170._4_2_ = (short)((uint6)uVar13 >> 0x20);
      uStack_170._6_2_ = (short)((ulong)uVar40 >> 0x30);
      local_188._2_2_ = (short)((uint)uVar3 >> 0x10);
      local_188._4_2_ = (short)((uint6)uVar4 >> 0x20);
      local_188._6_2_ = (short)((ulong)uVar32 >> 0x30);
      uStack_180._2_2_ = (short)((uint)uVar6 >> 0x10);
      uStack_180._4_2_ = (short)((uint6)uVar7 >> 0x20);
      uStack_180._6_2_ = (short)((ulong)uVar34 >> 0x30);
      local_1a8 = CONCAT11((char)local_c78,(undefined1)local_e98) +
                  CONCAT11((char)local_c78,(undefined1)local_eb8);
      sStack_1a6 = local_178._2_2_ + local_188._2_2_;
      sStack_1a4 = local_178._4_2_ + local_188._4_2_;
      sStack_1a2 = local_178._6_2_ + local_188._6_2_;
      sStack_1a0 = CONCAT11(local_c78._4_1_,local_e98._4_1_) +
                   CONCAT11(local_c78._4_1_,local_eb8._4_1_);
      sStack_19e = uStack_170._2_2_ + uStack_180._2_2_;
      sStack_19c = uStack_170._4_2_ + uStack_180._4_2_;
      sStack_19a = uStack_170._6_2_ + uStack_180._6_2_;
      local_1398._0_4_ = CONCAT22(sStack_196 + sStack_1a6,local_198 + local_1a8);
      local_1398._0_6_ = CONCAT24(sStack_194 + sStack_1a4,(undefined4)local_1398);
      local_1398 = CONCAT26(sStack_192 + sStack_1a2,(undefined6)local_1398);
      uStack_1390._0_4_ = CONCAT22(sStack_18e + sStack_19e,sStack_190 + sStack_1a0);
      uStack_1390._0_6_ = CONCAT24(sStack_18c + sStack_19c,(undefined4)uStack_1390);
      uStack_1390 = CONCAT26(sStack_18a + sStack_19a,(undefined6)uStack_1390);
      uVar3 = CONCAT13(local_c78._1_1_,
                       CONCAT12(local_e98._1_1_,CONCAT11((char)local_c78,(undefined1)local_e98)));
      uVar4 = CONCAT15(local_c78._2_1_,CONCAT14(local_e98._2_1_,uVar3));
      uVar38 = CONCAT17(local_c78._3_1_,CONCAT16(local_e98._3_1_,uVar4));
      uVar6 = CONCAT13(local_c78._5_1_,
                       CONCAT12(local_e98._5_1_,CONCAT11(local_c78._4_1_,local_e98._4_1_)));
      uVar7 = CONCAT15(local_c78._6_1_,CONCAT14(local_e98._6_1_,uVar6));
      uVar41 = CONCAT17(local_c78._7_1_,CONCAT16(local_e98._7_1_,uVar7));
      local_1c8 = local_1398;
      lStack_1c0 = uStack_1390;
      local_1b8._2_2_ = (short)((uint)uVar3 >> 0x10);
      local_1b8._4_2_ = (short)((uint6)uVar4 >> 0x20);
      local_1b8._6_2_ = (short)((ulong)uVar38 >> 0x30);
      uStack_1b0._2_2_ = (short)((uint)uVar6 >> 0x10);
      uStack_1b0._4_2_ = (short)((uint6)uVar7 >> 0x20);
      uStack_1b0._6_2_ = (short)((ulong)uVar41 >> 0x30);
      local_1f8 = CONCAT11((char)local_c78,(undefined1)local_e98) + local_198 + local_1a8;
      sStack_1f6 = local_1b8._2_2_ + sStack_196 + sStack_1a6;
      sStack_1f4 = local_1b8._4_2_ + sStack_194 + sStack_1a4;
      sStack_1f2 = local_1b8._6_2_ + sStack_192 + sStack_1a2;
      sStack_1f0 = CONCAT11(local_c78._4_1_,local_e98._4_1_) + sStack_190 + sStack_1a0;
      sStack_1ee = uStack_1b0._2_2_ + sStack_18e + sStack_19e;
      sStack_1ec = uStack_1b0._4_2_ + sStack_18c + sStack_19c;
      sStack_1ea = uStack_1b0._6_2_ + sStack_18a + sStack_19a;
      uVar9 = CONCAT13(local_c78._1_1_,
                       CONCAT12(local_eb8._1_1_,CONCAT11((char)local_c78,(undefined1)local_eb8)));
      uVar10 = CONCAT15(local_c78._2_1_,CONCAT14(local_eb8._2_1_,uVar9));
      uVar33 = CONCAT17(local_c78._3_1_,CONCAT16(local_eb8._3_1_,uVar10));
      uVar12 = CONCAT13(local_c78._5_1_,
                        CONCAT12(local_eb8._5_1_,CONCAT11(local_c78._4_1_,local_eb8._4_1_)));
      uVar13 = CONCAT15(local_c78._6_1_,CONCAT14(local_eb8._6_1_,uVar12));
      uVar35 = CONCAT17(local_c78._7_1_,CONCAT16(local_eb8._7_1_,uVar13));
      uVar3 = CONCAT13(local_c78._1_1_,
                       CONCAT12(local_ed8._1_1_,CONCAT11((char)local_c78,(undefined1)local_ed8)));
      uVar4 = CONCAT15(local_c78._2_1_,CONCAT14(local_ed8._2_1_,uVar3));
      uVar30 = CONCAT17(local_c78._3_1_,CONCAT16(local_ed8._3_1_,uVar4));
      uVar6 = CONCAT13(local_c78._5_1_,
                       CONCAT12(local_ed8._5_1_,CONCAT11(local_c78._4_1_,local_ed8._4_1_)));
      uVar7 = CONCAT15(local_c78._6_1_,CONCAT14(local_ed8._6_1_,uVar6));
      uVar31 = CONCAT17(local_c78._7_1_,CONCAT16(local_ed8._7_1_,uVar7));
      local_1d8._2_2_ = (short)((uint)uVar9 >> 0x10);
      local_1d8._4_2_ = (short)((uint6)uVar10 >> 0x20);
      local_1d8._6_2_ = (short)((ulong)uVar33 >> 0x30);
      uStack_1d0._2_2_ = (short)((uint)uVar12 >> 0x10);
      uStack_1d0._4_2_ = (short)((uint6)uVar13 >> 0x20);
      uStack_1d0._6_2_ = (short)((ulong)uVar35 >> 0x30);
      local_1e8._2_2_ = (short)((uint)uVar3 >> 0x10);
      local_1e8._4_2_ = (short)((uint6)uVar4 >> 0x20);
      local_1e8._6_2_ = (short)((ulong)uVar30 >> 0x30);
      uStack_1e0._2_2_ = (short)((uint)uVar6 >> 0x10);
      uStack_1e0._4_2_ = (short)((uint6)uVar7 >> 0x20);
      uStack_1e0._6_2_ = (short)((ulong)uVar31 >> 0x30);
      local_208 = CONCAT11((char)local_c78,(undefined1)local_eb8) +
                  CONCAT11((char)local_c78,(undefined1)local_ed8);
      sStack_206 = local_1d8._2_2_ + local_1e8._2_2_;
      sStack_204 = local_1d8._4_2_ + local_1e8._4_2_;
      sStack_202 = local_1d8._6_2_ + local_1e8._6_2_;
      sStack_200 = CONCAT11(local_c78._4_1_,local_eb8._4_1_) +
                   CONCAT11(local_c78._4_1_,local_ed8._4_1_);
      sStack_1fe = uStack_1d0._2_2_ + uStack_1e0._2_2_;
      sStack_1fc = uStack_1d0._4_2_ + uStack_1e0._4_2_;
      sStack_1fa = uStack_1d0._6_2_ + uStack_1e0._6_2_;
      local_1398._0_4_ = CONCAT22(sStack_1f6 + sStack_206,local_1f8 + local_208);
      local_1398._0_6_ = CONCAT24(sStack_1f4 + sStack_204,(undefined4)local_1398);
      local_1398 = CONCAT26(sStack_1f2 + sStack_202,(undefined6)local_1398);
      uStack_1390._0_4_ = CONCAT22(sStack_1ee + sStack_1fe,sStack_1f0 + sStack_200);
      uStack_1390._0_6_ = CONCAT24(sStack_1ec + sStack_1fc,(undefined4)uStack_1390);
      uStack_1390 = CONCAT26(sStack_1ea + sStack_1fa,(undefined6)uStack_1390);
      uVar9 = CONCAT13(local_c78._1_1_,
                       CONCAT12(local_ef8._1_1_,CONCAT11((char)local_c78,(undefined1)local_ef8)));
      uVar10 = CONCAT15(local_c78._2_1_,CONCAT14(local_ef8._2_1_,uVar9));
      uVar28 = CONCAT17(local_c78._3_1_,CONCAT16(local_ef8._3_1_,uVar10));
      uVar12 = CONCAT13(local_c78._5_1_,
                        CONCAT12(local_ef8._5_1_,CONCAT11(local_c78._4_1_,local_ef8._4_1_)));
      uVar13 = CONCAT15(local_c78._6_1_,CONCAT14(local_ef8._6_1_,uVar12));
      uVar29 = CONCAT17(local_c78._7_1_,CONCAT16(local_ef8._7_1_,uVar13));
      uVar3 = CONCAT13(local_c78._1_1_,
                       CONCAT12(local_f18._1_1_,CONCAT11((char)local_c78,(undefined1)local_f18)));
      uVar4 = CONCAT15(local_c78._2_1_,CONCAT14(local_f18._2_1_,uVar3));
      uVar26 = CONCAT17(local_c78._3_1_,CONCAT16(local_f18._3_1_,uVar4));
      uVar6 = CONCAT13(local_c78._5_1_,
                       CONCAT12(local_f18._5_1_,CONCAT11(local_c78._4_1_,local_f18._4_1_)));
      uVar7 = CONCAT15(local_c78._6_1_,CONCAT14(local_f18._6_1_,uVar6));
      uVar27 = CONCAT17(local_c78._7_1_,CONCAT16(local_f18._7_1_,uVar7));
      local_218._2_2_ = (short)((uint)uVar9 >> 0x10);
      local_218._4_2_ = (short)((uint6)uVar10 >> 0x20);
      local_218._6_2_ = (short)((ulong)uVar28 >> 0x30);
      uStack_210._2_2_ = (short)((uint)uVar12 >> 0x10);
      uStack_210._4_2_ = (short)((uint6)uVar13 >> 0x20);
      uStack_210._6_2_ = (short)((ulong)uVar29 >> 0x30);
      local_228._2_2_ = (short)((uint)uVar3 >> 0x10);
      local_228._4_2_ = (short)((uint6)uVar4 >> 0x20);
      local_228._6_2_ = (short)((ulong)uVar26 >> 0x30);
      uStack_220._2_2_ = (short)((uint)uVar6 >> 0x10);
      uStack_220._4_2_ = (short)((uint6)uVar7 >> 0x20);
      uStack_220._6_2_ = (short)((ulong)uVar27 >> 0x30);
      local_238 = CONCAT11((char)local_c78,(undefined1)local_ef8) +
                  CONCAT11((char)local_c78,(undefined1)local_f18);
      sStack_236 = local_218._2_2_ + local_228._2_2_;
      sStack_234 = local_218._4_2_ + local_228._4_2_;
      sStack_232 = local_218._6_2_ + local_228._6_2_;
      sStack_230 = CONCAT11(local_c78._4_1_,local_ef8._4_1_) +
                   CONCAT11(local_c78._4_1_,local_f18._4_1_);
      sStack_22e = uStack_210._2_2_ + uStack_220._2_2_;
      sStack_22c = uStack_210._4_2_ + uStack_220._4_2_;
      sStack_22a = uStack_210._6_2_ + uStack_220._6_2_;
      local_248 = local_1398;
      lStack_240 = uStack_1390;
      local_1398._0_4_ =
           CONCAT22(sStack_236 + sStack_1f6 + sStack_206,local_238 + local_1f8 + local_208);
      local_1398._0_6_ = CONCAT24(sStack_234 + sStack_1f4 + sStack_204,(undefined4)local_1398);
      local_1398 = CONCAT26(sStack_232 + sStack_1f2 + sStack_202,(undefined6)local_1398);
      uStack_1390._0_4_ =
           CONCAT22(sStack_22e + sStack_1ee + sStack_1fe,sStack_230 + sStack_1f0 + sStack_200);
      uStack_1390._0_6_ = CONCAT24(sStack_22c + sStack_1ec + sStack_1fc,(undefined4)uStack_1390);
      uStack_1390 = CONCAT26(sStack_22a + sStack_1ea + sStack_1fa,(undefined6)uStack_1390);
      uVar3 = CONCAT13(uStack_c70._1_1_,
                       CONCAT12(uStack_350._1_1_,CONCAT11((char)uStack_c70,(undefined1)uStack_350)))
      ;
      uVar4 = CONCAT15(uStack_c70._2_1_,CONCAT14(uStack_350._2_1_,uVar3));
      uVar20 = CONCAT17(uStack_c70._3_1_,CONCAT16(uStack_350._3_1_,uVar4));
      uVar6 = CONCAT13(uStack_c70._5_1_,
                       CONCAT12(uStack_350._5_1_,CONCAT11(uStack_c70._4_1_,uStack_350._4_1_)));
      uVar7 = CONCAT15(uStack_c70._6_1_,CONCAT14(uStack_350._6_1_,uVar6));
      uVar23 = CONCAT17(uStack_c70._7_1_,CONCAT16(uStack_350._7_1_,uVar7));
      local_258._2_2_ = (short)((uint)uVar3 >> 0x10);
      local_258._4_2_ = (short)((uint6)uVar4 >> 0x20);
      local_258._6_2_ = (short)((ulong)uVar20 >> 0x30);
      uStack_250._2_2_ = (short)((uint)uVar6 >> 0x10);
      uStack_250._4_2_ = (short)((uint6)uVar7 >> 0x20);
      uStack_250._6_2_ = (short)((ulong)uVar23 >> 0x30);
      local_298 = CONCAT11((char)uStack_c70,(undefined1)uStack_350) + 4;
      sStack_296 = local_258._2_2_ + 4;
      sStack_294 = local_258._4_2_ + 4;
      sStack_292 = local_258._6_2_ + 4;
      sStack_290 = CONCAT11(uStack_c70._4_1_,uStack_350._4_1_) + 4;
      sStack_28e = uStack_250._2_2_ + 4;
      sStack_28c = uStack_250._4_2_ + 4;
      sStack_28a = uStack_250._6_2_ + 4;
      uVar9 = CONCAT13(uStack_c70._1_1_,
                       CONCAT12(uStack_350._1_1_,CONCAT11((char)uStack_c70,(undefined1)uStack_350)))
      ;
      uVar10 = CONCAT15(uStack_c70._2_1_,CONCAT14(uStack_350._2_1_,uVar9));
      uVar21 = CONCAT17(uStack_c70._3_1_,CONCAT16(uStack_350._3_1_,uVar10));
      uVar12 = CONCAT13(uStack_c70._5_1_,
                        CONCAT12(uStack_350._5_1_,CONCAT11(uStack_c70._4_1_,uStack_350._4_1_)));
      uVar13 = CONCAT15(uStack_c70._6_1_,CONCAT14(uStack_350._6_1_,uVar12));
      uVar24 = CONCAT17(uStack_c70._7_1_,CONCAT16(uStack_350._7_1_,uVar13));
      uVar3 = CONCAT13(uStack_c70._1_1_,
                       CONCAT12(uStack_370._1_1_,CONCAT11((char)uStack_c70,(undefined1)uStack_370)))
      ;
      uVar4 = CONCAT15(uStack_c70._2_1_,CONCAT14(uStack_370._2_1_,uVar3));
      uVar16 = CONCAT17(uStack_c70._3_1_,CONCAT16(uStack_370._3_1_,uVar4));
      uVar6 = CONCAT13(uStack_c70._5_1_,
                       CONCAT12(uStack_370._5_1_,CONCAT11(uStack_c70._4_1_,uStack_370._4_1_)));
      uVar7 = CONCAT15(uStack_c70._6_1_,CONCAT14(uStack_370._6_1_,uVar6));
      uVar18 = CONCAT17(uStack_c70._7_1_,CONCAT16(uStack_370._7_1_,uVar7));
      local_278._2_2_ = (short)((uint)uVar9 >> 0x10);
      local_278._4_2_ = (short)((uint6)uVar10 >> 0x20);
      local_278._6_2_ = (short)((ulong)uVar21 >> 0x30);
      uStack_270._2_2_ = (short)((uint)uVar12 >> 0x10);
      uStack_270._4_2_ = (short)((uint6)uVar13 >> 0x20);
      uStack_270._6_2_ = (short)((ulong)uVar24 >> 0x30);
      local_288._2_2_ = (short)((uint)uVar3 >> 0x10);
      local_288._4_2_ = (short)((uint6)uVar4 >> 0x20);
      local_288._6_2_ = (short)((ulong)uVar16 >> 0x30);
      uStack_280._2_2_ = (short)((uint)uVar6 >> 0x10);
      uStack_280._4_2_ = (short)((uint6)uVar7 >> 0x20);
      uStack_280._6_2_ = (short)((ulong)uVar18 >> 0x30);
      local_2a8 = CONCAT11((char)uStack_c70,(undefined1)uStack_350) +
                  CONCAT11((char)uStack_c70,(undefined1)uStack_370);
      sStack_2a6 = local_278._2_2_ + local_288._2_2_;
      sStack_2a4 = local_278._4_2_ + local_288._4_2_;
      sStack_2a2 = local_278._6_2_ + local_288._6_2_;
      sStack_2a0 = CONCAT11(uStack_c70._4_1_,uStack_350._4_1_) +
                   CONCAT11(uStack_c70._4_1_,uStack_370._4_1_);
      sStack_29e = uStack_270._2_2_ + uStack_280._2_2_;
      sStack_29c = uStack_270._4_2_ + uStack_280._4_2_;
      sStack_29a = uStack_270._6_2_ + uStack_280._6_2_;
      local_13a8._0_4_ = CONCAT22(sStack_296 + sStack_2a6,local_298 + local_2a8);
      local_13a8._0_6_ = CONCAT24(sStack_294 + sStack_2a4,(undefined4)local_13a8);
      local_13a8 = CONCAT26(sStack_292 + sStack_2a2,(undefined6)local_13a8);
      uStack_13a0._0_4_ = CONCAT22(sStack_28e + sStack_29e,sStack_290 + sStack_2a0);
      uStack_13a0._0_6_ = CONCAT24(sStack_28c + sStack_29c,(undefined4)uStack_13a0);
      uStack_13a0 = CONCAT26(sStack_28a + sStack_29a,(undefined6)uStack_13a0);
      uVar3 = CONCAT13(uStack_c70._1_1_,
                       CONCAT12(uStack_350._1_1_,CONCAT11((char)uStack_c70,(undefined1)uStack_350)))
      ;
      uVar4 = CONCAT15(uStack_c70._2_1_,CONCAT14(uStack_350._2_1_,uVar3));
      uVar22 = CONCAT17(uStack_c70._3_1_,CONCAT16(uStack_350._3_1_,uVar4));
      uVar6 = CONCAT13(uStack_c70._5_1_,
                       CONCAT12(uStack_350._5_1_,CONCAT11(uStack_c70._4_1_,uStack_350._4_1_)));
      uVar7 = CONCAT15(uStack_c70._6_1_,CONCAT14(uStack_350._6_1_,uVar6));
      uVar25 = CONCAT17(uStack_c70._7_1_,CONCAT16(uStack_350._7_1_,uVar7));
      local_2c8 = local_13a8;
      lStack_2c0 = uStack_13a0;
      local_2b8._2_2_ = (short)((uint)uVar3 >> 0x10);
      local_2b8._4_2_ = (short)((uint6)uVar4 >> 0x20);
      local_2b8._6_2_ = (short)((ulong)uVar22 >> 0x30);
      uStack_2b0._2_2_ = (short)((uint)uVar6 >> 0x10);
      uStack_2b0._4_2_ = (short)((uint6)uVar7 >> 0x20);
      uStack_2b0._6_2_ = (short)((ulong)uVar25 >> 0x30);
      local_2f8 = CONCAT11((char)uStack_c70,(undefined1)uStack_350) + local_298 + local_2a8;
      sStack_2f6 = local_2b8._2_2_ + sStack_296 + sStack_2a6;
      sStack_2f4 = local_2b8._4_2_ + sStack_294 + sStack_2a4;
      sStack_2f2 = local_2b8._6_2_ + sStack_292 + sStack_2a2;
      sStack_2f0 = CONCAT11(uStack_c70._4_1_,uStack_350._4_1_) + sStack_290 + sStack_2a0;
      sStack_2ee = uStack_2b0._2_2_ + sStack_28e + sStack_29e;
      sStack_2ec = uStack_2b0._4_2_ + sStack_28c + sStack_29c;
      sStack_2ea = uStack_2b0._6_2_ + sStack_28a + sStack_29a;
      uVar9 = CONCAT13(uStack_c70._1_1_,
                       CONCAT12(uStack_370._1_1_,CONCAT11((char)uStack_c70,(undefined1)uStack_370)))
      ;
      uVar10 = CONCAT15(uStack_c70._2_1_,CONCAT14(uStack_370._2_1_,uVar9));
      uVar17 = CONCAT17(uStack_c70._3_1_,CONCAT16(uStack_370._3_1_,uVar10));
      uVar12 = CONCAT13(uStack_c70._5_1_,
                        CONCAT12(uStack_370._5_1_,CONCAT11(uStack_c70._4_1_,uStack_370._4_1_)));
      uVar13 = CONCAT15(uStack_c70._6_1_,CONCAT14(uStack_370._6_1_,uVar12));
      uVar19 = CONCAT17(uStack_c70._7_1_,CONCAT16(uStack_370._7_1_,uVar13));
      uVar3 = CONCAT13(uStack_c70._1_1_,
                       CONCAT12(uStack_390._1_1_,CONCAT11((char)uStack_c70,(undefined1)uStack_390)))
      ;
      uVar4 = CONCAT15(uStack_c70._2_1_,CONCAT14(uStack_390._2_1_,uVar3));
      uVar14 = CONCAT17(uStack_c70._3_1_,CONCAT16(uStack_390._3_1_,uVar4));
      uVar6 = CONCAT13(uStack_c70._5_1_,
                       CONCAT12(uStack_390._5_1_,CONCAT11(uStack_c70._4_1_,uStack_390._4_1_)));
      uVar7 = CONCAT15(uStack_c70._6_1_,CONCAT14(uStack_390._6_1_,uVar6));
      uVar15 = CONCAT17(uStack_c70._7_1_,CONCAT16(uStack_390._7_1_,uVar7));
      local_2d8._2_2_ = (short)((uint)uVar9 >> 0x10);
      local_2d8._4_2_ = (short)((uint6)uVar10 >> 0x20);
      local_2d8._6_2_ = (short)((ulong)uVar17 >> 0x30);
      uStack_2d0._2_2_ = (short)((uint)uVar12 >> 0x10);
      uStack_2d0._4_2_ = (short)((uint6)uVar13 >> 0x20);
      uStack_2d0._6_2_ = (short)((ulong)uVar19 >> 0x30);
      local_2e8._2_2_ = (short)((uint)uVar3 >> 0x10);
      local_2e8._4_2_ = (short)((uint6)uVar4 >> 0x20);
      local_2e8._6_2_ = (short)((ulong)uVar14 >> 0x30);
      uStack_2e0._2_2_ = (short)((uint)uVar6 >> 0x10);
      uStack_2e0._4_2_ = (short)((uint6)uVar7 >> 0x20);
      uStack_2e0._6_2_ = (short)((ulong)uVar15 >> 0x30);
      local_308 = CONCAT11((char)uStack_c70,(undefined1)uStack_370) +
                  CONCAT11((char)uStack_c70,(undefined1)uStack_390);
      sStack_306 = local_2d8._2_2_ + local_2e8._2_2_;
      sStack_304 = local_2d8._4_2_ + local_2e8._4_2_;
      sStack_302 = local_2d8._6_2_ + local_2e8._6_2_;
      sStack_300 = CONCAT11(uStack_c70._4_1_,uStack_370._4_1_) +
                   CONCAT11(uStack_c70._4_1_,uStack_390._4_1_);
      sStack_2fe = uStack_2d0._2_2_ + uStack_2e0._2_2_;
      sStack_2fc = uStack_2d0._4_2_ + uStack_2e0._4_2_;
      sStack_2fa = uStack_2d0._6_2_ + uStack_2e0._6_2_;
      local_13a8._0_4_ = CONCAT22(sStack_2f6 + sStack_306,local_2f8 + local_308);
      local_13a8._0_6_ = CONCAT24(sStack_2f4 + sStack_304,(undefined4)local_13a8);
      local_13a8 = CONCAT26(sStack_2f2 + sStack_302,(undefined6)local_13a8);
      uStack_13a0._0_4_ = CONCAT22(sStack_2ee + sStack_2fe,sStack_2f0 + sStack_300);
      uStack_13a0._0_6_ = CONCAT24(sStack_2ec + sStack_2fc,(undefined4)uStack_13a0);
      uStack_13a0 = CONCAT26(sStack_2ea + sStack_2fa,(undefined6)uStack_13a0);
      uVar9 = CONCAT13(uStack_c70._1_1_,
                       CONCAT12(uStack_3b0._1_1_,CONCAT11((char)uStack_c70,(undefined1)uStack_3b0)))
      ;
      uVar10 = CONCAT15(uStack_c70._2_1_,CONCAT14(uStack_3b0._2_1_,uVar9));
      uVar8 = CONCAT17(uStack_c70._3_1_,CONCAT16(uStack_3b0._3_1_,uVar10));
      uVar12 = CONCAT13(uStack_c70._5_1_,
                        CONCAT12(uStack_3b0._5_1_,CONCAT11(uStack_c70._4_1_,uStack_3b0._4_1_)));
      uVar13 = CONCAT15(uStack_c70._6_1_,CONCAT14(uStack_3b0._6_1_,uVar12));
      uVar11 = CONCAT17(uStack_c70._7_1_,CONCAT16(uStack_3b0._7_1_,uVar13));
      uVar3 = CONCAT13(uStack_c70._1_1_,
                       CONCAT12(uStack_3d0._1_1_,CONCAT11((char)uStack_c70,(undefined1)uStack_3d0)))
      ;
      uVar4 = CONCAT15(uStack_c70._2_1_,CONCAT14(uStack_3d0._2_1_,uVar3));
      uVar2 = CONCAT17(uStack_c70._3_1_,CONCAT16(uStack_3d0._3_1_,uVar4));
      uVar6 = CONCAT13(uStack_c70._5_1_,
                       CONCAT12(uStack_3d0._5_1_,CONCAT11(uStack_c70._4_1_,uStack_3d0._4_1_)));
      uVar7 = CONCAT15(uStack_c70._6_1_,CONCAT14(uStack_3d0._6_1_,uVar6));
      uVar5 = CONCAT17(uStack_c70._7_1_,CONCAT16(uStack_3d0._7_1_,uVar7));
      local_318._2_2_ = (short)((uint)uVar9 >> 0x10);
      local_318._4_2_ = (short)((uint6)uVar10 >> 0x20);
      local_318._6_2_ = (short)((ulong)uVar8 >> 0x30);
      uStack_310._2_2_ = (short)((uint)uVar12 >> 0x10);
      uStack_310._4_2_ = (short)((uint6)uVar13 >> 0x20);
      uStack_310._6_2_ = (short)((ulong)uVar11 >> 0x30);
      local_328._2_2_ = (short)((uint)uVar3 >> 0x10);
      local_328._4_2_ = (short)((uint6)uVar4 >> 0x20);
      local_328._6_2_ = (short)((ulong)uVar2 >> 0x30);
      uStack_320._2_2_ = (short)((uint)uVar6 >> 0x10);
      uStack_320._4_2_ = (short)((uint6)uVar7 >> 0x20);
      uStack_320._6_2_ = (short)((ulong)uVar5 >> 0x30);
      local_338 = CONCAT11((char)uStack_c70,(undefined1)uStack_3b0) +
                  CONCAT11((char)uStack_c70,(undefined1)uStack_3d0);
      sStack_336 = local_318._2_2_ + local_328._2_2_;
      sStack_334 = local_318._4_2_ + local_328._4_2_;
      sStack_332 = local_318._6_2_ + local_328._6_2_;
      sStack_330 = CONCAT11(uStack_c70._4_1_,uStack_3b0._4_1_) +
                   CONCAT11(uStack_c70._4_1_,uStack_3d0._4_1_);
      sStack_32e = uStack_310._2_2_ + uStack_320._2_2_;
      sStack_32c = uStack_310._4_2_ + uStack_320._4_2_;
      sStack_32a = uStack_310._6_2_ + uStack_320._6_2_;
      local_348 = local_13a8;
      lStack_340 = uStack_13a0;
      local_13a8._0_4_ =
           CONCAT22(sStack_336 + sStack_2f6 + sStack_306,local_338 + local_2f8 + local_308);
      local_13a8._0_6_ = CONCAT24(sStack_334 + sStack_2f4 + sStack_304,(undefined4)local_13a8);
      local_13a8 = CONCAT26(sStack_332 + sStack_2f2 + sStack_302,(undefined6)local_13a8);
      uStack_13a0._0_4_ =
           CONCAT22(sStack_32e + sStack_2ee + sStack_2fe,sStack_330 + sStack_2f0 + sStack_300);
      uStack_13a0._0_6_ = CONCAT24(sStack_32c + sStack_2ec + sStack_2fc,(undefined4)uStack_13a0);
      uStack_13a0 = CONCAT26(sStack_32a + sStack_2ea + sStack_2fa,(undefined6)uStack_13a0);
      local_f78 = uVar71;
      local_f58 = lVar72;
      local_f38 = uVar99;
      local_f18 = uVar100;
      local_ef8 = uVar103;
      local_ed8 = uVar104;
      local_eb8 = lVar73;
      local_e98 = uVar74;
      local_cc8 = local_1048;
      uStack_cc0 = uStack_1040;
      local_ca8 = uVar75;
      uStack_ca0 = uVar76;
      local_c98 = local_11c8;
      uStack_c90 = uStack_11c0;
      local_c88 = local_11c8;
      uStack_c80 = uStack_11c0;
      local_c78 = uVar77;
      uStack_c70 = uVar78;
      local_c68 = lVar79;
      uStack_c60 = lVar80;
      local_bd8 = lVar81;
      uStack_bd0 = lVar82;
      local_a48 = uVar83;
      uStack_a40 = uVar84;
      local_a28 = uVar85;
      uStack_a20 = uVar86;
      local_a08 = uVar87;
      uStack_a00 = uVar88;
      local_9d8 = local_1228;
      uStack_9d0 = uStack_1220;
      local_9b8 = local_11e8;
      uStack_9b0 = uStack_11e0;
      local_998 = local_1208;
      uStack_990 = uStack_1200;
      local_978 = local_11f8;
      uStack_970 = uStack_11f0;
      local_958 = local_1208;
      uStack_950 = uStack_1200;
      local_938 = local_11f8;
      uStack_930 = uStack_11f0;
      local_818 = local_11e8;
      uStack_810 = uStack_11e0;
      local_7f8 = local_11e8;
      uStack_7f0 = uStack_11e0;
      local_7d8 = local_11e8;
      uStack_7d0 = uStack_11e0;
      local_7b8 = local_11e8;
      uStack_7b0 = uStack_11e0;
      local_778 = local_11e8;
      uStack_770 = uStack_11e0;
      local_758 = local_11e8;
      uStack_750 = uStack_11e0;
      local_738 = local_11e8;
      uStack_730 = uStack_11e0;
      local_718 = local_11e8;
      uStack_710 = uStack_11e0;
      local_668 = local_688;
      uStack_660 = uStack_680;
      local_658 = local_6a8;
      uStack_650 = uStack_6a0;
      local_638 = local_6b8;
      uStack_630 = uStack_6b0;
      local_628 = local_648;
      uStack_620 = uStack_640;
      local_618 = local_1218;
      uStack_610 = uStack_1210;
      local_608 = local_698;
      uStack_600 = uStack_690;
      local_5e8 = local_678;
      uStack_5e0 = uStack_670;
      local_5d8 = local_11d8;
      uStack_5d0 = uStack_11d0;
      local_5b8 = local_11c8;
      uStack_5b0 = uStack_11c0;
      local_5a8 = local_5c8;
      uStack_5a0 = uStack_5c0;
      local_538 = uVar83;
      uStack_530 = uVar84;
      local_518 = uVar85;
      uStack_510 = uVar86;
      local_4f8 = uVar87;
      uStack_4f0 = uVar88;
      local_468 = local_8f8;
      uStack_460 = uStack_8f0;
      uStack_430 = uVar89;
      uStack_410 = lVar90;
      uStack_3f0 = uVar91;
      uStack_3d0 = uVar92;
      uStack_3b0 = uVar93;
      uStack_390 = uVar94;
      uStack_370 = lVar95;
      uStack_350 = uVar96;
      local_328 = uVar2;
      uStack_320 = uVar5;
      local_318 = uVar8;
      uStack_310 = uVar11;
      local_2e8 = uVar14;
      uStack_2e0 = uVar15;
      local_2d8 = uVar17;
      uStack_2d0 = uVar19;
      local_2b8 = uVar22;
      uStack_2b0 = uVar25;
      local_288 = uVar16;
      uStack_280 = uVar18;
      local_278 = uVar21;
      uStack_270 = uVar24;
      local_268 = local_1288;
      uStack_260 = uStack_1280;
      local_258 = uVar20;
      uStack_250 = uVar23;
      local_228 = uVar26;
      uStack_220 = uVar27;
      local_218 = uVar28;
      uStack_210 = uVar29;
      local_1e8 = uVar30;
      uStack_1e0 = uVar31;
      local_1d8 = uVar33;
      uStack_1d0 = uVar35;
      local_1b8 = uVar38;
      uStack_1b0 = uVar41;
      local_188 = uVar32;
      uStack_180 = uVar34;
      local_178 = uVar37;
      uStack_170 = uVar40;
      local_168 = local_1288;
      uStack_160 = uStack_1280;
      local_158 = uVar36;
      uStack_150 = uVar39;
      local_108 = local_11c8;
      uStack_100 = uStack_11c0;
      local_e8 = local_11d8;
      uStack_e0 = uStack_11d0;
      local_c8 = local_11e8;
      uStack_c0 = uStack_11e0;
      local_a8 = local_11f8;
      uStack_a0 = uStack_11f0;
      local_88 = local_1208;
      uStack_80 = uStack_1200;
      local_68 = local_1218;
      uStack_60 = uStack_1210;
      local_48 = local_1228;
      uStack_40 = uStack_1220;
      local_28 = local_1288;
      uStack_20 = uStack_1280;
      filter8_mask((__m128i *)&local_1048,(__m128i *)&local_1068,(__m128i *)&local_1398,
                   (__m128i *)&local_13a8);
      local_cf0 = (undefined8 *)((long)local_fa0 - (long)(local_fa4 * 3));
      *local_cf0 = extraout_XMM0_Qa_11;
      local_cf0[1] = extraout_XMM0_Qb_11;
      filter_add2_sub2((__m128i *)&local_1398,(__m128i *)&local_12e8,(__m128i *)&local_12b8,
                       (__m128i *)&local_12a8,(__m128i *)&local_1298);
      filter_add2_sub2((__m128i *)&local_13a8,(__m128i *)&local_1368,(__m128i *)&local_1338,
                       (__m128i *)&local_1328,(__m128i *)&local_1318);
      filter8_mask((__m128i *)&local_1048,(__m128i *)&local_10e8,(__m128i *)&local_1398,
                   (__m128i *)&local_13a8);
      local_d10 = (undefined8 *)((long)local_fa0 - (long)(local_fa4 << 1));
      *local_d10 = extraout_XMM0_Qa_12;
      local_d10[1] = extraout_XMM0_Qb_12;
      filter_add2_sub2((__m128i *)&local_1398,(__m128i *)&local_12f8,(__m128i *)&local_12c8,
                       (__m128i *)&local_12b8,(__m128i *)&local_1298);
      filter_add2_sub2((__m128i *)&local_13a8,(__m128i *)&local_1378,(__m128i *)&local_1348,
                       (__m128i *)&local_1338,(__m128i *)&local_1318);
      filter8_mask((__m128i *)&local_1048,(__m128i *)&local_10f8,(__m128i *)&local_1398,
                   (__m128i *)&local_13a8);
      local_d30 = (undefined8 *)((long)local_fa0 - (long)local_fa4);
      *local_d30 = extraout_XMM0_Qa_13;
      local_d30[1] = extraout_XMM0_Qb_13;
      filter_add2_sub2((__m128i *)&local_1398,(__m128i *)&local_1308,(__m128i *)&local_12d8,
                       (__m128i *)&local_12c8,(__m128i *)&local_1298);
      filter_add2_sub2((__m128i *)&local_13a8,(__m128i *)&local_1388,(__m128i *)&local_1358,
                       (__m128i *)&local_1348,(__m128i *)&local_1318);
      filter8_mask((__m128i *)&local_1048,(__m128i *)&local_1108,(__m128i *)&local_1398,
                   (__m128i *)&local_13a8);
      local_d50 = local_fa0;
      *local_fa0 = extraout_XMM0_Qa_14;
      local_fa0[1] = extraout_XMM0_Qb_14;
      filter_add2_sub2((__m128i *)&local_1398,(__m128i *)&local_1308,(__m128i *)&local_12e8,
                       (__m128i *)&local_12d8,(__m128i *)&local_12a8);
      filter_add2_sub2((__m128i *)&local_13a8,(__m128i *)&local_1388,(__m128i *)&local_1368,
                       (__m128i *)&local_1358,(__m128i *)&local_1328);
      filter8_mask((__m128i *)&local_1048,(__m128i *)&local_1118,(__m128i *)&local_1398,
                   (__m128i *)&local_13a8);
      local_d70 = (undefined8 *)((long)local_fa0 + (long)local_fa4);
      *local_d70 = extraout_XMM0_Qa_15;
      local_d70[1] = extraout_XMM0_Qb_15;
      filter_add2_sub2((__m128i *)&local_1398,(__m128i *)&local_1308,(__m128i *)&local_12f8,
                       (__m128i *)&local_12e8,(__m128i *)&local_12b8);
      filter_add2_sub2((__m128i *)&local_13a8,(__m128i *)&local_1388,(__m128i *)&local_1378,
                       (__m128i *)&local_1368,(__m128i *)&local_1338);
      filter8_mask((__m128i *)&local_1048,(__m128i *)&local_10b8,(__m128i *)&local_1398,
                   (__m128i *)&local_13a8);
      puVar97 = (undefined8 *)((long)local_fa0 + (long)(local_fa4 << 1));
      *puVar97 = extraout_XMM0_Qa_16;
      puVar97[1] = extraout_XMM0_Qb_16;
    }
  }
  return;
}

Assistant:

void aom_lpf_horizontal_8_quad_sse2(unsigned char *s, int p,
                                    const unsigned char *_blimit0,
                                    const unsigned char *_limit0,
                                    const unsigned char *_thresh0) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i one = _mm_set1_epi8(1);
  const __m128i blimit_v = _mm_load_si128((const __m128i *)_blimit0);
  const __m128i limit_v = _mm_load_si128((const __m128i *)_limit0);
  const __m128i thresh_v = _mm_load_si128((const __m128i *)_thresh0);
  __m128i mask, hev, flat;
  __m128i p3, p2, p1, p0, q0, q1, q2, q3;

  __m128i op2, op1, op0, oq0, oq1, oq2;

  __m128i max_abs_p1p0q1q0;

  p3 = _mm_loadu_si128((__m128i *)(s - 4 * p));
  p2 = _mm_loadu_si128((__m128i *)(s - 3 * p));
  p1 = _mm_loadu_si128((__m128i *)(s - 2 * p));
  p0 = _mm_loadu_si128((__m128i *)(s - 1 * p));
  q0 = _mm_loadu_si128((__m128i *)(s - 0 * p));
  q1 = _mm_loadu_si128((__m128i *)(s + 1 * p));
  q2 = _mm_loadu_si128((__m128i *)(s + 2 * p));
  q3 = _mm_loadu_si128((__m128i *)(s + 3 * p));

  {
    const __m128i abs_p1p0 = abs_diff(p1, p0);
    const __m128i abs_q1q0 = abs_diff(q1, q0);
    const __m128i fe = _mm_set1_epi8((int8_t)0xfe);
    const __m128i ff = _mm_cmpeq_epi8(zero, zero);
    __m128i abs_p0q0 = abs_diff(p0, q0);
    __m128i abs_p1q1 = abs_diff(p1, q1);
    __m128i work;
    max_abs_p1p0q1q0 = _mm_max_epu8(abs_p1p0, abs_q1q0);

    abs_p0q0 = _mm_adds_epu8(abs_p0q0, abs_p0q0);
    abs_p1q1 = _mm_srli_epi16(_mm_and_si128(abs_p1q1, fe), 1);
    mask = _mm_subs_epu8(_mm_adds_epu8(abs_p0q0, abs_p1q1), blimit_v);
    mask = _mm_xor_si128(_mm_cmpeq_epi8(mask, zero), ff);
    // mask |= (abs(p0 - q0) * 2 + abs(p1 - q1) / 2  > blimit) * -1;
    mask = _mm_max_epu8(max_abs_p1p0q1q0, mask);
    // mask |= (abs(p1 - p0) > limit) * -1;
    // mask |= (abs(q1 - q0) > limit) * -1;
    work = _mm_max_epu8(abs_diff(p2, p1), abs_diff(p3, p2));
    mask = _mm_max_epu8(work, mask);
    work = _mm_max_epu8(abs_diff(q2, q1), abs_diff(q3, q2));
    mask = _mm_max_epu8(work, mask);
    mask = _mm_subs_epu8(mask, limit_v);
    mask = _mm_cmpeq_epi8(mask, zero);
  }

  if (0xffff == _mm_movemask_epi8(_mm_cmpeq_epi8(mask, zero))) return;

  {
    __m128i work;
    work = _mm_max_epu8(abs_diff(p2, p0), abs_diff(q2, q0));
    flat = _mm_max_epu8(work, max_abs_p1p0q1q0);
    work = _mm_max_epu8(abs_diff(p3, p0), abs_diff(q3, q0));
    flat = _mm_max_epu8(work, flat);
    flat = _mm_subs_epu8(flat, one);
    flat = _mm_cmpeq_epi8(flat, zero);
    flat = _mm_and_si128(flat, mask);
  }

  // ~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~
  // filter4
  {
    const __m128i t4 = _mm_set1_epi8(4);
    const __m128i t3 = _mm_set1_epi8(3);
    const __m128i t80 = _mm_set1_epi8((int8_t)0x80);
    const __m128i te0 = _mm_set1_epi8((int8_t)0xe0);
    const __m128i t1f = _mm_set1_epi8(0x1f);
    const __m128i t1 = _mm_set1_epi8(0x1);
    const __m128i t7f = _mm_set1_epi8(0x7f);
    const __m128i ff = _mm_cmpeq_epi8(t4, t4);

    __m128i filt;
    __m128i work_a;
    __m128i filter1, filter2;

    op1 = _mm_xor_si128(p1, t80);
    op0 = _mm_xor_si128(p0, t80);
    oq0 = _mm_xor_si128(q0, t80);
    oq1 = _mm_xor_si128(q1, t80);

    hev = _mm_subs_epu8(max_abs_p1p0q1q0, thresh_v);
    hev = _mm_xor_si128(_mm_cmpeq_epi8(hev, zero), ff);
    filt = _mm_and_si128(_mm_subs_epi8(op1, oq1), hev);

    work_a = _mm_subs_epi8(oq0, op0);
    filt = _mm_adds_epi8(filt, work_a);
    filt = _mm_adds_epi8(filt, work_a);
    filt = _mm_adds_epi8(filt, work_a);
    filt = _mm_and_si128(filt, mask);
    filter1 = _mm_adds_epi8(filt, t4);
    filter2 = _mm_adds_epi8(filt, t3);

    work_a = _mm_cmpgt_epi8(zero, filter1);
    filter1 = _mm_srli_epi16(filter1, 3);
    work_a = _mm_and_si128(work_a, te0);
    filter1 = _mm_and_si128(filter1, t1f);
    filter1 = _mm_or_si128(filter1, work_a);
    oq0 = _mm_xor_si128(_mm_subs_epi8(oq0, filter1), t80);

    work_a = _mm_cmpgt_epi8(zero, filter2);
    filter2 = _mm_srli_epi16(filter2, 3);
    work_a = _mm_and_si128(work_a, te0);
    filter2 = _mm_and_si128(filter2, t1f);
    filter2 = _mm_or_si128(filter2, work_a);
    op0 = _mm_xor_si128(_mm_adds_epi8(op0, filter2), t80);

    filt = _mm_adds_epi8(filter1, t1);
    work_a = _mm_cmpgt_epi8(zero, filt);
    filt = _mm_srli_epi16(filt, 1);
    work_a = _mm_and_si128(work_a, t80);
    filt = _mm_and_si128(filt, t7f);
    filt = _mm_or_si128(filt, work_a);
    filt = _mm_andnot_si128(hev, filt);
    op1 = _mm_xor_si128(_mm_adds_epi8(op1, filt), t80);
    oq1 = _mm_xor_si128(_mm_subs_epi8(oq1, filt), t80);

    // ~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~
    // filter8
    if (0xffff != _mm_movemask_epi8(_mm_cmpeq_epi8(flat, zero))) {
      const __m128i four = _mm_set1_epi16(4);
      const __m128i p3_lo = _mm_unpacklo_epi8(p3, zero);
      const __m128i p2_lo = _mm_unpacklo_epi8(p2, zero);
      const __m128i p1_lo = _mm_unpacklo_epi8(p1, zero);
      const __m128i p0_lo = _mm_unpacklo_epi8(p0, zero);
      const __m128i q0_lo = _mm_unpacklo_epi8(q0, zero);
      const __m128i q1_lo = _mm_unpacklo_epi8(q1, zero);
      const __m128i q2_lo = _mm_unpacklo_epi8(q2, zero);
      const __m128i q3_lo = _mm_unpacklo_epi8(q3, zero);

      const __m128i p3_hi = _mm_unpackhi_epi8(p3, zero);
      const __m128i p2_hi = _mm_unpackhi_epi8(p2, zero);
      const __m128i p1_hi = _mm_unpackhi_epi8(p1, zero);
      const __m128i p0_hi = _mm_unpackhi_epi8(p0, zero);
      const __m128i q0_hi = _mm_unpackhi_epi8(q0, zero);
      const __m128i q1_hi = _mm_unpackhi_epi8(q1, zero);
      const __m128i q2_hi = _mm_unpackhi_epi8(q2, zero);
      const __m128i q3_hi = _mm_unpackhi_epi8(q3, zero);
      __m128i f8_lo, f8_hi;

      f8_lo = _mm_add_epi16(_mm_add_epi16(p3_lo, four),
                            _mm_add_epi16(p3_lo, p2_lo));
      f8_lo = _mm_add_epi16(_mm_add_epi16(p3_lo, f8_lo),
                            _mm_add_epi16(p2_lo, p1_lo));
      f8_lo = _mm_add_epi16(_mm_add_epi16(p0_lo, q0_lo), f8_lo);

      f8_hi = _mm_add_epi16(_mm_add_epi16(p3_hi, four),
                            _mm_add_epi16(p3_hi, p2_hi));
      f8_hi = _mm_add_epi16(_mm_add_epi16(p3_hi, f8_hi),
                            _mm_add_epi16(p2_hi, p1_hi));
      f8_hi = _mm_add_epi16(_mm_add_epi16(p0_hi, q0_hi), f8_hi);

      op2 = filter8_mask(&flat, &p2, &f8_lo, &f8_hi);
      _mm_storeu_si128((__m128i *)(s - 3 * p), op2);

      f8_lo = filter_add2_sub2(&f8_lo, &q1_lo, &p1_lo, &p2_lo, &p3_lo);
      f8_hi = filter_add2_sub2(&f8_hi, &q1_hi, &p1_hi, &p2_hi, &p3_hi);
      op1 = filter8_mask(&flat, &op1, &f8_lo, &f8_hi);
      _mm_storeu_si128((__m128i *)(s - 2 * p), op1);

      f8_lo = filter_add2_sub2(&f8_lo, &q2_lo, &p0_lo, &p1_lo, &p3_lo);
      f8_hi = filter_add2_sub2(&f8_hi, &q2_hi, &p0_hi, &p1_hi, &p3_hi);
      op0 = filter8_mask(&flat, &op0, &f8_lo, &f8_hi);
      _mm_storeu_si128((__m128i *)(s - 1 * p), op0);

      f8_lo = filter_add2_sub2(&f8_lo, &q3_lo, &q0_lo, &p0_lo, &p3_lo);
      f8_hi = filter_add2_sub2(&f8_hi, &q3_hi, &q0_hi, &p0_hi, &p3_hi);
      oq0 = filter8_mask(&flat, &oq0, &f8_lo, &f8_hi);
      _mm_storeu_si128((__m128i *)(s - 0 * p), oq0);

      f8_lo = filter_add2_sub2(&f8_lo, &q3_lo, &q1_lo, &q0_lo, &p2_lo);
      f8_hi = filter_add2_sub2(&f8_hi, &q3_hi, &q1_hi, &q0_hi, &p2_hi);
      oq1 = filter8_mask(&flat, &oq1, &f8_lo, &f8_hi);
      _mm_storeu_si128((__m128i *)(s + 1 * p), oq1);

      f8_lo = filter_add2_sub2(&f8_lo, &q3_lo, &q2_lo, &q1_lo, &p1_lo);
      f8_hi = filter_add2_sub2(&f8_hi, &q3_hi, &q2_hi, &q1_hi, &p1_hi);
      oq2 = filter8_mask(&flat, &q2, &f8_lo, &f8_hi);
      _mm_storeu_si128((__m128i *)(s + 2 * p), oq2);
    } else {
      _mm_storeu_si128((__m128i *)(s - 2 * p), op1);
      _mm_storeu_si128((__m128i *)(s - 1 * p), op0);
      _mm_storeu_si128((__m128i *)(s - 0 * p), oq0);
      _mm_storeu_si128((__m128i *)(s + 1 * p), oq1);
    }
  }
}